

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLABecLaplacian.cpp
# Opt level: O0

void __thiscall
amrex::MLABecLaplacian::Fsmooth
          (MLABecLaplacian *this,int amrlev,int mglev,MultiFab *sol,MultiFab *rhs,int redblack)

{
  undefined8 uVar1;
  int iVar2;
  bool bVar3;
  Geometry *this_00;
  MFItInfo *this_01;
  int in_EDX;
  int in_ESI;
  long *in_RDI;
  int in_R9D;
  IntVect IVar4;
  Box thread_box;
  iterator __end5;
  iterator __begin5;
  range_impl<amrex::Box> *__range5;
  LaunchSafeGuard lsg;
  int i_1;
  int j_1;
  int k_1;
  int n_1;
  Dim3 amrex_i_hi_1;
  Dim3 amrex_i_lo_1;
  int i;
  int j;
  int k;
  int n;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Array4<const_int> *osm;
  Array4<const_double> *f5fab;
  Array4<const_double> *f4fab;
  Array4<const_double> *f3fab;
  Array4<const_double> *f2fab;
  Array4<const_double> *f1fab;
  Array4<const_double> *f0fab;
  Array4<const_double> *bzfab;
  Array4<const_double> *byfab;
  Array4<const_double> *bxfab;
  Array4<const_double> *afab;
  Array4<const_double> *rhsfab;
  Array4<double> *solnfab;
  Box *vbx;
  Box *tbx;
  Array4<const_int> *m5;
  Array4<const_int> *m4;
  Array4<const_int> *m3;
  Array4<const_int> *m2;
  Array4<const_int> *m1;
  Array4<const_int> *m0;
  MFIter mfi;
  MFItInfo mfi_info;
  Real alpha;
  Real dhz;
  Real dhy;
  Real dhx;
  Real *h;
  int nc;
  MultiMask *mm5;
  MultiMask *mm4;
  MultiMask *mm3;
  MultiMask *mm2;
  MultiMask *mm1;
  MultiMask *mm0;
  FabSet *f5;
  FabSet *f4;
  FabSet *f3;
  FabSet *f2;
  FabSet *f1;
  FabSet *f0;
  OrientationIter oitr;
  array<amrex::MultiMask,_6UL> *maskvals;
  BndryRegister *undrrelxr;
  MultiFab *bzcoef;
  MultiFab *bycoef;
  MultiFab *bxcoef;
  MultiFab *acoef;
  bool regular_coarsening;
  Real res;
  Real rho;
  Real g_m_d;
  Real gamma;
  Real cf5;
  Real cf4;
  Real cf3;
  Real cf2;
  Real cf1;
  Real cf0;
  Dim3 vhi;
  Dim3 vlo;
  Real omega;
  Real res_1;
  Real rho_1;
  Real g_m_d_1;
  Real gamma_1;
  Real cf5_1;
  Real cf4_1;
  Real cf3_1;
  Real cf2_1;
  Real cf1_1;
  Real cf0_1;
  Dim3 vhi_1;
  Dim3 vlo_1;
  Real omega_1;
  int i_11;
  Real rho_4;
  Real g_m_d_4;
  Real cf5_4;
  Real cf4_4;
  Real cf3_4;
  Real cf2_4;
  Real cf1_4;
  Real cf0_4;
  Real gamma_4;
  int i_8;
  int k_5;
  int j_5;
  int n_4;
  int j_4;
  Real rho_3;
  Real g_m_d_3;
  Real cf5_3;
  Real cf4_3;
  Real cf3_3;
  Real cf2_3;
  Real cf1_3;
  Real cf0_3;
  Real gamma_3;
  int j_3;
  int k_4;
  int i_5;
  int n_3;
  int k_3;
  Real rho_2;
  Real g_m_d_2;
  Real cf5_2;
  Real cf4_2;
  Real cf3_2;
  Real cf2_2;
  Real cf1_2;
  Real cf0_2;
  Real gamma_2;
  int k_2;
  int i_2;
  int j_2;
  int n_2;
  Array1D<double,_0,_31> gam;
  Array1D<double,_0,_31> u_ls;
  Array1D<double,_0,_31> r_ls;
  Array1D<double,_0,_31> c_ls;
  Array1D<double,_0,_31> b_ls;
  Array1D<double,_0,_31> a_ls;
  int ilen;
  int idir;
  Dim3 vhi_2;
  Dim3 vlo_2;
  Dim3 hi;
  Dim3 lo;
  int i_4;
  int i_3;
  Real bet;
  int i_7;
  int i_6;
  Real bet_1;
  int i_10;
  int i_9;
  Real bet_2;
  BndryRegister *in_stack_ffffffffffffc848;
  MFIter *in_stack_ffffffffffffc850;
  FabArray<amrex::FArrayBox> *in_stack_ffffffffffffc858;
  MFIter *in_stack_ffffffffffffc860;
  double local_3798;
  MFItInfo *in_stack_ffffffffffffc870;
  FabArrayBase *in_stack_ffffffffffffc878;
  MFIter *in_stack_ffffffffffffc880;
  double local_3778;
  double local_3770;
  double local_3768;
  double local_3760;
  double local_3758;
  MFIter *in_stack_ffffffffffffc8b0;
  double local_3748;
  double local_3740;
  double local_3738;
  double local_3730;
  double local_3728;
  double local_36e0;
  double local_36d8;
  double local_36d0;
  double local_36c8;
  double local_36c0;
  double local_36b8;
  double local_3670;
  double local_3668;
  double local_3660;
  double local_3658;
  double local_3650;
  double local_3648;
  bool local_35b1;
  bool local_35a1;
  char *in_stack_ffffffffffffca68;
  int iVar5;
  int local_3590;
  int in_stack_ffffffffffffca74;
  char *in_stack_ffffffffffffca78;
  char *in_stack_ffffffffffffca80;
  iterator local_3578;
  iterator local_3560;
  undefined1 local_3548 [40];
  undefined1 *local_3520;
  LaunchSafeGuard local_3501;
  int local_3500;
  int local_34fc;
  int local_34f8;
  int local_34f4;
  undefined8 local_34f0;
  int local_34e8;
  undefined8 local_34dc;
  int local_34d4;
  undefined8 local_34d0;
  int local_34c8;
  undefined8 local_34c0;
  int local_34b8;
  int local_34b0;
  int local_34ac;
  int local_34a8;
  int local_34a4;
  undefined8 local_34a0;
  int local_3498;
  undefined8 local_348c;
  int local_3484;
  undefined8 local_3480;
  int local_3478;
  undefined8 local_3470;
  int local_3468;
  long local_3460;
  long local_3458;
  long local_3450;
  int local_3440;
  int local_343c;
  int local_3438;
  long *local_3420;
  long local_3418 [8];
  long *local_33d8;
  long local_33d0 [8];
  long *local_3390;
  long local_3388 [8];
  long *local_3348;
  long local_3340 [8];
  long *local_3300;
  long local_32f8 [8];
  long *local_32b8;
  long local_32b0 [8];
  long *local_3270;
  long local_3268 [8];
  long *local_3228;
  long local_3220 [8];
  long *local_31e0;
  long local_31d8 [8];
  long *local_3198;
  long local_3190 [8];
  long *local_3150;
  long local_3148 [8];
  long *local_3108;
  long local_3100 [8];
  long *local_30c0;
  int local_30b4 [7];
  int *local_3098;
  int local_308c [7];
  int *local_3070;
  long local_3068 [8];
  long *local_3028;
  long local_3020 [8];
  long *local_2fe0;
  long local_2fd8 [8];
  long *local_2f98;
  long local_2f90 [8];
  long *local_2f50;
  long local_2f48 [8];
  long *local_2f08;
  long local_2f00 [8];
  long *local_2ec0;
  MFIter local_2eb8;
  MFItInfo local_2e54;
  double local_2e40;
  double local_2e38;
  double local_2e30;
  double local_2e28;
  Real *local_2e20;
  int local_2e14;
  const_reference local_2e10;
  const_reference local_2e08;
  const_reference local_2e00;
  const_reference local_2df8;
  const_reference local_2df0;
  const_reference local_2de8;
  int local_2ddc;
  FabSet *local_2dd8;
  int local_2dcc;
  FabSet *local_2dc8;
  int local_2dbc;
  FabSet *local_2db8;
  int local_2dac;
  FabSet *local_2da8;
  int local_2d9c;
  FabSet *local_2d98;
  int local_2d8c;
  FabSet *local_2d88;
  OrientationIter local_2d7c;
  array<amrex::MultiMask,_6UL> *local_2d78;
  BndryRegister *local_2d70;
  const_reference local_2d68;
  const_reference local_2d60;
  const_reference local_2d58;
  int local_2d50 [3];
  undefined8 local_2d3c;
  int local_2d34;
  FabArrayBase *local_2d30;
  bool local_2d25;
  int local_2d24;
  undefined8 local_2d00;
  undefined4 local_2cf4;
  char *local_2cf0;
  char *local_2ce8;
  undefined8 local_2ce0;
  int local_2cd8;
  int *local_2cd0;
  int local_2cc4;
  int iStack_2cc0;
  int local_2cbc;
  undefined8 local_2cb8;
  int local_2cb0;
  int *local_2ca8;
  int local_2c9c;
  int iStack_2c98;
  int local_2c94;
  undefined8 local_2c90;
  int local_2c88;
  int *local_2c80;
  int local_2c74;
  int iStack_2c70;
  int local_2c6c;
  undefined8 local_2c68;
  int local_2c60;
  int *local_2c58;
  int local_2c50;
  int iStack_2c4c;
  int local_2c48;
  undefined4 local_2c44;
  undefined8 *local_2c40;
  undefined4 local_2c34;
  IntVect *local_2c30;
  double local_2c28;
  double local_2c20;
  double local_2c18;
  double local_2c10;
  double local_2c08;
  double local_2c00;
  double local_2bf8;
  double local_2bf0;
  double local_2be8;
  double local_2be0;
  undefined8 local_2bd8;
  int local_2bd0;
  undefined8 local_2bc4;
  int local_2bbc;
  undefined8 local_2bb8;
  int local_2bb0;
  undefined8 local_2ba8;
  int local_2ba0;
  undefined8 local_2b98;
  int *local_2b88;
  long *local_2b80;
  long *local_2b78;
  long *local_2b70;
  long *local_2b68;
  long *local_2b60;
  long *local_2b58;
  long *local_2b50;
  long *local_2b48;
  long *local_2b40;
  long *local_2b38;
  long *local_2b30;
  long *local_2b28;
  long *local_2b20;
  long *local_2b18;
  long *local_2b10;
  long *local_2b08;
  double local_2b00;
  double local_2af8;
  double local_2af0;
  long *local_2ae8;
  double local_2ae0;
  long *local_2ad8;
  long *local_2ad0;
  int local_2ac8;
  int local_2ac4;
  int local_2ac0;
  int local_2abc;
  undefined8 local_2ab8;
  int local_2ab0;
  int *local_2aa8;
  int local_2a9c;
  int iStack_2a98;
  int local_2a94;
  undefined8 local_2a90;
  int local_2a88;
  int *local_2a80;
  int local_2a74;
  int iStack_2a70;
  int local_2a6c;
  int local_2a68;
  int local_2a64;
  int local_2a60;
  int local_2a5c;
  long *local_2a58;
  int local_2a50;
  int local_2a4c;
  int local_2a48;
  int local_2a44;
  long *local_2a40;
  int local_2a38;
  int local_2a34;
  int local_2a30;
  int local_2a2c;
  long *local_2a28;
  int local_2a20;
  int local_2a1c;
  int local_2a18;
  int local_2a14;
  long *local_2a10;
  int local_2a08;
  int local_2a04;
  int local_2a00;
  int local_29fc;
  long *local_29f8;
  int local_29f0;
  int local_29ec;
  int local_29e8;
  int local_29e4;
  long *local_29e0;
  int local_29d8;
  int local_29d4;
  int local_29d0;
  int local_29cc;
  long *local_29c8;
  int local_29c0;
  int local_29bc;
  int local_29b8;
  int local_29b4;
  long *local_29b0;
  int local_29a8;
  int local_29a4;
  int local_29a0;
  int local_299c;
  long *local_2998;
  int local_2990;
  int local_298c;
  int local_2988;
  int local_2984;
  long *local_2980;
  int local_2978;
  int local_2974;
  int local_2970;
  int local_296c;
  long *local_2968;
  int local_2960;
  int local_295c;
  int local_2958;
  int local_2954;
  long *local_2950;
  int local_2948;
  int local_2944;
  int local_2940;
  int local_293c;
  long *local_2938;
  int local_2930;
  int local_292c;
  int local_2928;
  int local_2924;
  long *local_2920;
  int local_2918;
  int local_2914;
  int local_2910;
  int local_290c;
  long *local_2908;
  int local_2900;
  int local_28fc;
  int local_28f8;
  int local_28f4;
  long *local_28f0;
  int local_28e8;
  int local_28e4;
  int local_28e0;
  int local_28dc;
  long *local_28d8;
  int local_28d0;
  int local_28cc;
  int local_28c8;
  int local_28c4;
  long *local_28c0;
  int local_28b8;
  int local_28b4;
  int local_28b0;
  int local_28ac;
  long *local_28a8;
  int local_28a0;
  int local_289c;
  int local_2898;
  int local_2894;
  long *local_2890;
  int local_2888;
  int local_2884;
  int local_2880;
  int local_287c;
  long *local_2878;
  int local_2870;
  int local_286c;
  int local_2868;
  int local_2864;
  long *local_2860;
  int local_2858;
  int local_2854;
  int local_2850;
  int local_284c;
  long *local_2848;
  int local_2840;
  int local_283c;
  int local_2838;
  int local_2834;
  long *local_2830;
  int local_2828;
  int local_2824;
  int local_2820;
  int local_281c;
  long *local_2818;
  int local_2810;
  int local_280c;
  int local_2808;
  int local_2804;
  long *local_2800;
  int local_27f8;
  int local_27f4;
  int local_27f0;
  int local_27ec;
  long *local_27e8;
  int local_27e0;
  int local_27dc;
  int local_27d8;
  int local_27d4;
  long *local_27d0;
  int local_27c8;
  int local_27c4;
  int local_27c0;
  int local_27bc;
  long *local_27b8;
  int local_27b0;
  int local_27ac;
  int local_27a8;
  int local_27a4;
  long *local_27a0;
  int local_2798;
  int local_2794;
  int local_2790;
  int local_278c;
  long *local_2788;
  int local_2780;
  int local_277c;
  int local_2778;
  int local_2774;
  long *local_2770;
  int local_2768;
  int local_2764;
  int local_2760;
  int local_275c;
  long *local_2758;
  int local_2750;
  int local_274c;
  int local_2748;
  int local_2744;
  long *local_2740;
  int local_2738;
  int local_2734;
  int local_2730;
  int local_272c;
  long *local_2728;
  double local_2720;
  double local_2718;
  double local_2710;
  double local_2708;
  double local_2700;
  double local_26f8;
  double local_26f0;
  double local_26e8;
  double local_26e0;
  double local_26d8;
  undefined8 local_26d0;
  int local_26c8;
  undefined8 local_26bc;
  int local_26b4;
  undefined8 local_26b0;
  int local_26a8;
  undefined8 local_26a0;
  int local_2698;
  undefined8 local_2690;
  int *local_2680;
  long *local_2678;
  long *local_2670;
  long *local_2668;
  long *local_2660;
  long *local_2658;
  long *local_2650;
  long *local_2648;
  long *local_2640;
  long *local_2638;
  long *local_2630;
  long *local_2628;
  long *local_2620;
  long *local_2618;
  long *local_2610;
  long *local_2608;
  double local_2600;
  double local_25f8;
  double local_25f0;
  long *local_25e8;
  double local_25e0;
  long *local_25d8;
  long *local_25d0;
  int local_25c8;
  int local_25c4;
  int local_25c0;
  int local_25bc;
  undefined8 local_25b8;
  int local_25b0;
  int *local_25a8;
  int local_259c;
  int iStack_2598;
  int local_2594;
  undefined8 local_2590;
  int local_2588;
  int *local_2580;
  int local_2574;
  int iStack_2570;
  int local_256c;
  int local_2568;
  int local_2564;
  int local_2560;
  int local_255c;
  long *local_2558;
  int local_2550;
  int local_254c;
  int local_2548;
  int local_2544;
  long *local_2540;
  int local_2538;
  int local_2534;
  int local_2530;
  int local_252c;
  long *local_2528;
  int local_2520;
  int local_251c;
  int local_2518;
  int local_2514;
  long *local_2510;
  int local_2508;
  int local_2504;
  int local_2500;
  int local_24fc;
  long *local_24f8;
  int local_24f0;
  int local_24ec;
  int local_24e8;
  int local_24e4;
  long *local_24e0;
  int local_24d8;
  int local_24d4;
  int local_24d0;
  int local_24cc;
  long *local_24c8;
  int local_24c0;
  int local_24bc;
  int local_24b8;
  int local_24b4;
  long *local_24b0;
  int local_24a8;
  int local_24a4;
  int local_24a0;
  int local_249c;
  long *local_2498;
  int local_2490;
  int local_248c;
  int local_2488;
  int local_2484;
  long *local_2480;
  int local_2478;
  int local_2474;
  int local_2470;
  int local_246c;
  long *local_2468;
  int local_2460;
  int local_245c;
  int local_2458;
  int local_2454;
  long *local_2450;
  int local_2448;
  int local_2444;
  int local_2440;
  int local_243c;
  long *local_2438;
  int local_2430;
  int local_242c;
  int local_2428;
  int local_2424;
  long *local_2420;
  int local_2418;
  int local_2414;
  int local_2410;
  int local_240c;
  long *local_2408;
  int local_2400;
  int local_23fc;
  int local_23f8;
  int local_23f4;
  long *local_23f0;
  int local_23e8;
  int local_23e4;
  int local_23e0;
  int local_23dc;
  long *local_23d8;
  int local_23d0;
  int local_23cc;
  int local_23c8;
  int local_23c4;
  long *local_23c0;
  int local_23b8;
  int local_23b4;
  int local_23b0;
  int local_23ac;
  long *local_23a8;
  int local_23a0;
  int local_239c;
  int local_2398;
  int local_2394;
  long *local_2390;
  int local_2388;
  int local_2384;
  int local_2380;
  int local_237c;
  long *local_2378;
  int local_2370;
  int local_236c;
  int local_2368;
  int local_2364;
  long *local_2360;
  int local_2358;
  int local_2354;
  int local_2350;
  int local_234c;
  long *local_2348;
  int local_2340;
  int local_233c;
  int local_2338;
  int local_2334;
  long *local_2330;
  int local_2328;
  int local_2324;
  int local_2320;
  int local_231c;
  long *local_2318;
  int local_2310;
  int local_230c;
  int local_2308;
  int local_2304;
  long *local_2300;
  int local_22f8;
  int local_22f4;
  int local_22f0;
  int local_22ec;
  long *local_22e8;
  int local_22e0;
  int local_22dc;
  int local_22d8;
  int local_22d4;
  long *local_22d0;
  int local_22c8;
  int local_22c4;
  int local_22c0;
  int local_22bc;
  long *local_22b8;
  int local_22b0;
  int local_22ac;
  int local_22a8;
  int local_22a4;
  long *local_22a0;
  int local_2298;
  int local_2294;
  int local_2290;
  int local_228c;
  long *local_2288;
  int local_2280;
  int local_227c;
  int local_2278;
  int local_2274;
  long *local_2270;
  int local_2268;
  int local_2264;
  int local_2260;
  int local_225c;
  long *local_2258;
  int local_2250;
  int local_224c;
  int local_2248;
  int local_2244;
  long *local_2240;
  int local_2234;
  double local_2230;
  double local_2228;
  MFIter *local_2220;
  FabArray<amrex::FArrayBox> *local_2218;
  MFIter *local_2210;
  double local_2208;
  double local_2200;
  double local_21f8;
  double local_21f0;
  int local_21e4;
  int local_21e0;
  int local_21dc;
  int local_21d8;
  int local_21d4;
  double local_21d0;
  double local_21c8;
  double local_21c0;
  double local_21b8;
  double local_21b0;
  double local_21a8;
  double local_21a0;
  double local_2198;
  double local_2190;
  int local_2184;
  int local_2180;
  int local_217c;
  int local_2178;
  int local_2174;
  double local_2170;
  double local_2168;
  MFIter *local_2160;
  double local_2158;
  double local_2150;
  double local_2148;
  double local_2140;
  double local_2138;
  double local_2130;
  int local_2128;
  int local_2124;
  int local_2120;
  int local_211c;
  undefined1 local_2118 [256];
  double local_2018 [32];
  double local_1f18 [32];
  double local_1e18 [32];
  double local_1d18 [32];
  double local_1c18 [32];
  int local_1b18;
  int local_1b14;
  undefined8 local_1b10;
  int local_1b08;
  undefined8 local_1afc;
  int local_1af4;
  undefined8 local_1af0;
  int local_1ae8;
  undefined8 local_1ae0;
  int local_1ad8;
  int local_1ac8;
  undefined8 local_1ac0;
  int local_1ab8;
  undefined8 local_1ab0;
  undefined8 local_1aa0;
  int local_1a98;
  int local_1a90;
  int local_1a8c;
  int *local_1a88;
  long *local_1a80;
  long *local_1a78;
  long *local_1a70;
  long *local_1a68;
  long *local_1a60;
  long *local_1a58;
  long *local_1a50;
  long *local_1a48;
  long *local_1a40;
  long *local_1a38;
  long *local_1a30;
  long *local_1a28;
  long *local_1a20;
  long *local_1a18;
  long *local_1a10;
  double local_1a08;
  double local_1a00;
  double local_19f8;
  long *local_19f0;
  double local_19e8;
  long *local_19e0;
  long *local_19d8;
  Box *local_19d0;
  undefined8 local_19c8;
  int local_19c0;
  int *local_19b8;
  int local_19ac;
  int iStack_19a8;
  int local_19a4;
  undefined8 local_19a0;
  Box *local_1990;
  int local_1984;
  undefined8 local_1978;
  int local_1970;
  int *local_1968;
  int local_195c;
  int iStack_1958;
  int local_1954;
  int local_1948;
  Box *local_1940;
  int local_1934;
  int iStack_1930;
  int local_192c;
  int local_1928;
  int local_1924;
  int local_1920;
  int local_191c;
  long *local_1918;
  int local_1910;
  int local_190c;
  int local_1908;
  int local_1904;
  long *local_1900;
  int local_18f8;
  int local_18f4;
  int local_18f0;
  int local_18ec;
  long *local_18e8;
  int local_18e0;
  int local_18dc;
  int local_18d8;
  int local_18d4;
  long *local_18d0;
  int local_18c8;
  int local_18c4;
  int local_18c0;
  int local_18bc;
  long *local_18b8;
  int local_18b0;
  int local_18ac;
  int local_18a8;
  int local_18a4;
  long *local_18a0;
  int local_1898;
  int local_1894;
  int local_1890;
  int local_188c;
  long *local_1888;
  int local_1880;
  int local_187c;
  int local_1878;
  int local_1874;
  long *local_1870;
  int local_1868;
  int local_1864;
  int local_1860;
  int local_185c;
  long *local_1858;
  int local_1850;
  int local_184c;
  int local_1848;
  int local_1844;
  long *local_1840;
  int local_1838;
  int local_1834;
  int local_1830;
  int local_182c;
  long *local_1828;
  int local_1820;
  int local_181c;
  int local_1818;
  int local_1814;
  long *local_1810;
  int local_1808;
  int local_1804;
  int local_1800;
  int local_17fc;
  long *local_17f8;
  int local_17f0;
  int local_17ec;
  int local_17e8;
  int local_17e4;
  long *local_17e0;
  int local_17d8;
  int local_17d4;
  int local_17d0;
  int local_17cc;
  long *local_17c8;
  int local_17c0;
  int local_17bc;
  int local_17b8;
  int local_17b4;
  long *local_17b0;
  int local_17a8;
  int local_17a4;
  int local_17a0;
  int local_179c;
  long *local_1798;
  int local_1790;
  int local_178c;
  int local_1788;
  int local_1784;
  long *local_1780;
  int local_1778;
  int local_1774;
  int local_1770;
  int local_176c;
  long *local_1768;
  int local_1760;
  int local_175c;
  int local_1758;
  int local_1754;
  long *local_1750;
  int local_1748;
  int local_1744;
  int local_1740;
  int local_173c;
  long *local_1738;
  int local_1730;
  int local_172c;
  int local_1728;
  int local_1724;
  long *local_1720;
  int local_1718;
  int local_1714;
  int local_1710;
  int local_170c;
  long *local_1708;
  int local_1700;
  int local_16fc;
  int local_16f8;
  int local_16f4;
  long *local_16f0;
  int local_16e8;
  int local_16e4;
  int local_16e0;
  int local_16dc;
  long *local_16d8;
  int local_16d0;
  int local_16cc;
  int local_16c8;
  int local_16c4;
  long *local_16c0;
  int local_16b8;
  int local_16b4;
  int local_16b0;
  int local_16ac;
  long *local_16a8;
  int local_16a0;
  int local_169c;
  int local_1698;
  int local_1694;
  long *local_1690;
  int local_1688;
  int local_1684;
  int local_1680;
  int local_167c;
  long *local_1678;
  int local_1670;
  int local_166c;
  int local_1668;
  int local_1664;
  long *local_1660;
  int local_1658;
  int local_1654;
  int local_1650;
  int local_164c;
  long *local_1648;
  int local_1640;
  int local_163c;
  int local_1638;
  int local_1634;
  long *local_1630;
  int local_1628;
  int local_1624;
  int local_1620;
  int local_161c;
  long *local_1618;
  int local_1610;
  int local_160c;
  int local_1608;
  int local_1604;
  long *local_1600;
  int local_15f8;
  int local_15f4;
  int local_15f0;
  int local_15ec;
  long *local_15e8;
  int local_15e0;
  int local_15dc;
  int local_15d8;
  int local_15d4;
  long *local_15d0;
  int local_15c8;
  int local_15c4;
  int local_15c0;
  int local_15bc;
  long *local_15b8;
  int local_15b0;
  int local_15ac;
  int local_15a8;
  int local_15a4;
  long *local_15a0;
  int local_1598;
  int local_1594;
  int local_1590;
  int local_158c;
  long *local_1588;
  int local_1580;
  int local_157c;
  int local_1578;
  int local_1574;
  long *local_1570;
  int local_1568;
  int local_1564;
  int local_1560;
  int local_155c;
  long *local_1558;
  int local_1550;
  int local_154c;
  int local_1548;
  int local_1544;
  long *local_1540;
  int local_1538;
  int local_1534;
  int local_1530;
  int local_152c;
  long *local_1528;
  int local_1520;
  int local_151c;
  int local_1518;
  int local_1514;
  long *local_1510;
  int local_1508;
  int local_1504;
  int local_1500;
  int local_14fc;
  long *local_14f8;
  int local_14f0;
  int local_14ec;
  int local_14e8;
  int local_14e4;
  long *local_14e0;
  int local_14d8;
  int local_14d4;
  int local_14d0;
  int local_14cc;
  long *local_14c8;
  int local_14c0;
  int local_14bc;
  int local_14b8;
  int local_14b4;
  long *local_14b0;
  int local_14a8;
  int local_14a4;
  int local_14a0;
  int local_149c;
  long *local_1498;
  int local_1490;
  int local_148c;
  int local_1488;
  int local_1484;
  long *local_1480;
  int local_1478;
  int local_1474;
  int local_1470;
  int local_146c;
  long *local_1468;
  int local_1460;
  int local_145c;
  int local_1458;
  int local_1454;
  long *local_1450;
  int local_1448;
  int local_1444;
  int local_1440;
  int local_143c;
  long *local_1438;
  int local_1430;
  int local_142c;
  int local_1428;
  int local_1424;
  long *local_1420;
  int local_1418;
  int local_1414;
  int local_1410;
  int local_140c;
  long *local_1408;
  int local_1400;
  int local_13fc;
  int local_13f8;
  int local_13f4;
  long *local_13f0;
  int local_13e8;
  int local_13e4;
  int local_13e0;
  int local_13dc;
  long *local_13d8;
  int local_13d0;
  int local_13cc;
  int local_13c8;
  int local_13c4;
  long *local_13c0;
  int local_13b8;
  int local_13b4;
  int local_13b0;
  int local_13ac;
  long *local_13a8;
  int local_13a0;
  int local_139c;
  int local_1398;
  int local_1394;
  long *local_1390;
  int local_1388;
  int local_1384;
  int local_1380;
  int local_137c;
  long *local_1378;
  int local_1370;
  int local_136c;
  int local_1368;
  int local_1364;
  long *local_1360;
  int local_1358;
  int local_1354;
  int local_1350;
  int local_134c;
  long *local_1348;
  int local_1340;
  int local_133c;
  int local_1338;
  int local_1334;
  long *local_1330;
  int local_1328;
  int local_1324;
  int local_1320;
  int local_131c;
  long *local_1318;
  int local_1310;
  int local_130c;
  int local_1308;
  int local_1304;
  long *local_1300;
  int local_12f8;
  int local_12f4;
  int local_12f0;
  int local_12ec;
  long *local_12e8;
  int local_12e0;
  int local_12dc;
  int local_12d8;
  int local_12d4;
  long *local_12d0;
  int local_12c8;
  int local_12c4;
  int local_12c0;
  int local_12bc;
  long *local_12b8;
  int local_12b0;
  int local_12ac;
  int local_12a8;
  int local_12a4;
  long *local_12a0;
  int local_1298;
  int local_1294;
  int local_1290;
  int local_128c;
  long *local_1288;
  int local_1280;
  int local_127c;
  int local_1278;
  int local_1274;
  long *local_1270;
  int local_1268;
  int local_1264;
  int local_1260;
  int local_125c;
  long *local_1258;
  int local_1250;
  int local_124c;
  int local_1248;
  int local_1244;
  long *local_1240;
  int local_1238;
  int local_1234;
  int local_1230;
  int local_122c;
  long *local_1228;
  int local_1220;
  int local_121c;
  int local_1218;
  int local_1214;
  long *local_1210;
  int local_1208;
  int local_1204;
  int local_1200;
  int local_11fc;
  long *local_11f8;
  int local_11f0;
  int local_11ec;
  int local_11e8;
  int local_11e4;
  long *local_11e0;
  int local_11d8;
  int local_11d4;
  int local_11d0;
  int local_11cc;
  long *local_11c8;
  int local_11c0;
  int local_11bc;
  int local_11b8;
  int local_11b4;
  long *local_11b0;
  int local_11a8;
  int local_11a4;
  int local_11a0;
  int local_119c;
  long *local_1198;
  int local_1190;
  int local_118c;
  int local_1188;
  int local_1184;
  long *local_1180;
  int local_1178;
  int local_1174;
  int local_1170;
  int local_116c;
  long *local_1168;
  int local_1160;
  int local_115c;
  int local_1158;
  int local_1154;
  long *local_1150;
  int local_1148;
  int local_1144;
  int local_1140;
  int local_113c;
  long *local_1138;
  int local_1130;
  int local_112c;
  int local_1128;
  int local_1124;
  long *local_1120;
  int local_1118;
  int local_1114;
  int local_1110;
  int local_110c;
  long *local_1108;
  int local_1100;
  int local_10fc;
  int local_10f8;
  int local_10f4;
  long *local_10f0;
  int local_10e8;
  int local_10e4;
  int local_10e0;
  int local_10dc;
  long *local_10d8;
  int local_10d0;
  int local_10cc;
  int local_10c8;
  int local_10c4;
  long *local_10c0;
  int local_10b8;
  int local_10b4;
  int local_10b0;
  int local_10ac;
  long *local_10a8;
  int local_10a0;
  int local_109c;
  int local_1098;
  int local_1094;
  long *local_1090;
  int local_1088;
  int local_1084;
  int local_1080;
  int local_107c;
  long *local_1078;
  int local_1070;
  int local_106c;
  int local_1068;
  int local_1064;
  long *local_1060;
  int local_1058;
  int local_1054;
  int local_1050;
  int local_104c;
  long *local_1048;
  int local_1040;
  int local_103c;
  int local_1038;
  int local_1034;
  long *local_1030;
  int local_1028;
  int local_1024;
  int local_1020;
  int local_101c;
  long *local_1018;
  int local_1010;
  int local_100c;
  int local_1008;
  int local_1004;
  long *local_1000;
  int local_ff8;
  int local_ff4;
  int local_ff0;
  int local_fec;
  long *local_fe8;
  int local_fe0;
  int local_fdc;
  int local_fd8;
  int local_fd4;
  long *local_fd0;
  int local_fc8;
  int local_fc4;
  int local_fc0;
  int local_fbc;
  long *local_fb8;
  int local_fb0;
  int local_fac;
  int local_fa8;
  int local_fa4;
  long *local_fa0;
  int local_f98;
  int local_f94;
  int local_f90;
  int local_f8c;
  long *local_f88;
  int local_f80;
  int local_f7c;
  int local_f78;
  int local_f74;
  long *local_f70;
  int local_f68;
  int local_f64;
  int local_f60;
  int local_f5c;
  long *local_f58;
  int local_f50;
  int local_f4c;
  int local_f48;
  int local_f44;
  long *local_f40;
  int local_f38;
  int local_f34;
  int local_f30;
  int local_f2c;
  long *local_f28;
  int local_f20;
  int local_f1c;
  int local_f18;
  int local_f14;
  long *local_f10;
  int local_f08;
  int local_f04;
  int local_f00;
  int local_efc;
  long *local_ef8;
  int local_ef0;
  int local_eec;
  int local_ee8;
  int local_ee4;
  long *local_ee0;
  int local_ed8;
  int local_ed4;
  int local_ed0;
  int local_ecc;
  long *local_ec8;
  int local_ec0;
  int local_ebc;
  int local_eb8;
  int local_eb4;
  long *local_eb0;
  int local_ea8;
  int local_ea4;
  int local_ea0;
  int local_e9c;
  long *local_e98;
  int local_e90;
  int local_e8c;
  int local_e88;
  int local_e84;
  long *local_e80;
  int local_e78;
  int local_e74;
  int local_e70;
  int local_e6c;
  long *local_e68;
  int local_e60;
  int local_e5c;
  int local_e58;
  int local_e54;
  long *local_e50;
  int local_e48;
  int local_e44;
  int local_e40;
  int local_e3c;
  long *local_e38;
  int local_e30;
  int local_e2c;
  int local_e28;
  int local_e24;
  long *local_e20;
  int local_e18;
  int local_e14;
  int local_e10;
  int local_e0c;
  long *local_e08;
  int local_e00;
  int local_dfc;
  int local_df8;
  int local_df4;
  long *local_df0;
  int local_de8;
  int local_de4;
  int local_de0;
  int local_ddc;
  long *local_dd8;
  int local_dd0;
  int local_dcc;
  int local_dc8;
  int local_dc4;
  long *local_dc0;
  int local_db8;
  int local_db4;
  int local_db0;
  int local_dac;
  long *local_da8;
  int local_da0;
  int local_d9c;
  int local_d98;
  int local_d94;
  long *local_d90;
  int local_d88;
  int local_d84;
  int local_d80;
  int local_d7c;
  long *local_d78;
  int local_d70;
  int local_d6c;
  int local_d68;
  int local_d64;
  long *local_d60;
  int local_d54;
  int local_d50;
  int local_d4c;
  long *local_d48;
  int local_d3c;
  int local_d38;
  int local_d34;
  long *local_d30;
  int local_d24;
  int local_d20;
  int local_d1c;
  long *local_d18;
  int local_d0c;
  int local_d08;
  int local_d04;
  long *local_d00;
  int local_cf4;
  int local_cf0;
  int local_cec;
  long *local_ce8;
  int local_cdc;
  int local_cd8;
  int local_cd4;
  long *local_cd0;
  int local_cc4;
  int local_cc0;
  int local_cbc;
  long *local_cb8;
  int local_cac;
  int local_ca8;
  int local_ca4;
  long *local_ca0;
  int local_c94;
  int local_c90;
  int local_c8c;
  long *local_c88;
  int local_c7c;
  int local_c78;
  int local_c74;
  long *local_c70;
  int local_c64;
  int local_c60;
  int local_c5c;
  long *local_c58;
  int local_c4c;
  int local_c48;
  int local_c44;
  long *local_c40;
  int local_c34;
  int local_c30;
  int local_c2c;
  long *local_c28;
  int local_c1c;
  int local_c18;
  int local_c14;
  long *local_c10;
  int local_c04;
  int local_c00;
  int local_bfc;
  long *local_bf8;
  int local_bec;
  int local_be8;
  int local_be4;
  long *local_be0;
  int local_bd4;
  int local_bd0;
  int local_bcc;
  long *local_bc8;
  int local_bbc;
  int local_bb8;
  int local_bb4;
  long *local_bb0;
  int local_ba4;
  int local_ba0;
  int local_b9c;
  long *local_b98;
  int local_b8c;
  int local_b88;
  int local_b84;
  long *local_b80;
  int local_b74;
  int local_b70;
  int local_b6c;
  long *local_b68;
  int local_b5c;
  int local_b58;
  int local_b54;
  long *local_b50;
  int local_b44;
  int local_b40;
  int local_b3c;
  long *local_b38;
  int local_b2c;
  int local_b28;
  int local_b24;
  long *local_b20;
  int local_b14;
  int local_b10;
  int local_b0c;
  long *local_b08;
  int local_afc;
  int local_af8;
  int local_af4;
  long *local_af0;
  int local_ae4;
  int local_ae0;
  int local_adc;
  long *local_ad8;
  int local_acc;
  int local_ac8;
  int local_ac4;
  long *local_ac0;
  int local_ab4;
  int local_ab0;
  int local_aac;
  long *local_aa8;
  int local_a9c;
  int local_a98;
  int local_a94;
  long *local_a90;
  int local_a84;
  int local_a80;
  int local_a7c;
  long *local_a78;
  int local_a6c;
  int local_a68;
  int local_a64;
  long *local_a60;
  int local_a54;
  int local_a50;
  int local_a4c;
  long *local_a48;
  int local_a3c;
  int local_a38;
  int local_a34;
  long *local_a30;
  int local_a24;
  int local_a20;
  int local_a1c;
  long *local_a18;
  int local_a0c;
  int local_a08;
  int local_a04;
  long *local_a00;
  int local_9f4;
  int local_9f0;
  int local_9ec;
  long *local_9e8;
  int local_9dc;
  int local_9d8;
  int local_9d4;
  long *local_9d0;
  int local_9c4;
  int local_9c0;
  int local_9bc;
  long *local_9b8;
  int local_9ac;
  int local_9a8;
  int local_9a4;
  long *local_9a0;
  int local_994;
  int local_990;
  int local_98c;
  long *local_988;
  int local_97c;
  int local_978;
  int local_974;
  long *local_970;
  int local_964;
  int local_960;
  int local_95c;
  long *local_958;
  int local_94c;
  int local_948;
  int local_944;
  long *local_940;
  int local_934;
  int local_930;
  int local_92c;
  long *local_928;
  int local_91c;
  int local_918;
  int local_914;
  long *local_910;
  int local_904;
  int local_900;
  int local_8fc;
  long *local_8f8;
  int local_8ec;
  int local_8e8;
  int local_8e4;
  long *local_8e0;
  int local_8d4;
  int local_8d0;
  int local_8cc;
  long *local_8c8;
  undefined4 local_8bc;
  int *local_8b8;
  undefined4 local_8ac;
  int *local_8a8;
  undefined4 local_89c;
  int *local_898;
  undefined4 local_88c;
  int *local_888;
  undefined4 local_87c;
  int *local_878;
  undefined4 local_86c;
  int *local_868;
  undefined4 local_85c;
  undefined1 *local_858;
  undefined4 local_84c;
  undefined1 *local_848;
  undefined4 local_83c;
  undefined1 *local_838;
  undefined4 local_82c;
  Box *local_828;
  undefined4 local_81c;
  Box *local_818;
  undefined4 local_80c;
  Box *local_808;
  undefined4 local_7fc;
  int *local_7f8;
  undefined4 local_7ec;
  int *local_7e8;
  undefined4 local_7dc;
  int *local_7d8;
  undefined4 local_7cc;
  int *local_7c8;
  undefined4 local_7bc;
  int *local_7b8;
  undefined4 local_7ac;
  int *local_7a8;
  undefined4 local_79c;
  int *local_798;
  undefined4 local_78c;
  int *local_788;
  undefined4 local_77c;
  int *local_778;
  undefined4 local_76c;
  int *local_768;
  undefined4 local_75c;
  int *local_758;
  undefined4 local_74c;
  int *local_748;
  undefined4 local_73c;
  int *local_738;
  undefined4 local_72c;
  int *local_728;
  undefined4 local_71c;
  int *local_718;
  undefined4 local_70c;
  int *local_708;
  undefined4 local_6fc;
  int *local_6f8;
  undefined4 local_6ec;
  int *local_6e8;
  undefined4 local_6dc;
  int *local_6d8;
  undefined4 local_6cc;
  int *local_6c8;
  undefined4 local_6bc;
  int *local_6b8;
  undefined4 local_6ac;
  int *local_6a8;
  undefined4 local_69c;
  int *local_698;
  undefined4 local_68c;
  int *local_688;
  int local_67c;
  int local_678;
  int local_674;
  long *local_670;
  int local_664;
  int local_660;
  int local_65c;
  long *local_658;
  int local_64c;
  int local_648;
  int local_644;
  long *local_640;
  int local_634;
  int local_630;
  int local_62c;
  long *local_628;
  int local_61c;
  int local_618;
  int local_614;
  long *local_610;
  char *local_608;
  int local_5fc;
  double *local_5f8;
  int local_5ec;
  double *local_5e8;
  int local_5dc;
  double *local_5d8;
  int local_5cc;
  double *local_5c8;
  int local_5bc;
  double *local_5b8;
  int local_5ac;
  double *local_5a8;
  int local_59c;
  double *local_598;
  int local_58c;
  double *local_588;
  int local_57c;
  double *local_578;
  int local_56c;
  double *local_568;
  int local_55c;
  double *local_558;
  int local_54c;
  double *local_548;
  int local_53c;
  double *local_538;
  int local_52c;
  double *local_528;
  int local_51c;
  double *local_518;
  int local_50c;
  double *local_508;
  int local_4fc;
  double *local_4f8;
  int local_4ec;
  double *local_4e8;
  int local_4dc;
  double *local_4d8;
  int local_4cc;
  double *local_4c8;
  int local_4bc;
  double *local_4b8;
  int local_4ac;
  double *local_4a8;
  int local_49c;
  double *local_498;
  int local_48c;
  double *local_488;
  int local_47c;
  double *local_478;
  int local_46c;
  double *local_468;
  int local_45c;
  double *local_458;
  int local_44c;
  double *local_448;
  int local_43c;
  double *local_438;
  int local_42c;
  double *local_428;
  int local_420;
  int local_41c;
  double local_418;
  int local_40c;
  undefined1 *local_408;
  double *local_400;
  double *local_3f8;
  double *local_3f0;
  double *local_3e8;
  double *local_3e0;
  char *local_3d8;
  int local_3cc;
  double *local_3c8;
  int local_3bc;
  double *local_3b8;
  int local_3ac;
  undefined1 *local_3a8;
  int local_39c;
  double *local_398;
  int local_38c;
  double *local_388;
  int local_37c;
  double *local_378;
  int local_36c;
  double *local_368;
  int local_35c;
  double *local_358;
  int local_34c;
  undefined1 *local_348;
  int local_33c;
  double *local_338;
  int local_32c;
  double *local_328;
  int local_31c;
  undefined1 *local_318;
  int local_30c;
  double *local_308;
  undefined4 local_2fc;
  double *local_2f8;
  undefined4 local_2ec;
  double *local_2e8;
  undefined4 local_2dc;
  double *local_2d8;
  int local_2d0;
  int local_2cc;
  double local_2c8;
  int local_2bc;
  undefined1 *local_2b8;
  double *local_2b0;
  double *local_2a8;
  double *local_2a0;
  double *local_298;
  double *local_290;
  char *local_288;
  int local_27c;
  double *local_278;
  int local_26c;
  double *local_268;
  int local_25c;
  undefined1 *local_258;
  int local_24c;
  double *local_248;
  int local_23c;
  double *local_238;
  int local_22c;
  double *local_228;
  int local_21c;
  double *local_218;
  int local_20c;
  double *local_208;
  int local_1fc;
  undefined1 *local_1f8;
  int local_1ec;
  double *local_1e8;
  int local_1dc;
  double *local_1d8;
  int local_1cc;
  undefined1 *local_1c8;
  int local_1bc;
  double *local_1b8;
  undefined4 local_1ac;
  double *local_1a8;
  undefined4 local_19c;
  double *local_198;
  undefined4 local_18c;
  double *local_188;
  int local_180;
  int local_17c;
  double local_178;
  int local_16c;
  undefined1 *local_168;
  double *local_160;
  double *local_158;
  double *local_150;
  double *local_148;
  double *local_140;
  char *local_138;
  int local_12c;
  double *local_128;
  int local_11c;
  double *local_118;
  int local_10c;
  undefined1 *local_108;
  int local_fc;
  double *local_f8;
  int local_ec;
  double *local_e8;
  int local_dc;
  double *local_d8;
  int local_cc;
  double *local_c8;
  int local_bc;
  double *local_b8;
  int local_ac;
  undefined1 *local_a8;
  int local_9c;
  double *local_98;
  int local_8c;
  double *local_88;
  int local_7c;
  undefined1 *local_78;
  int local_6c;
  double *local_68;
  undefined4 local_5c;
  double *local_58;
  undefined4 local_4c;
  double *local_48;
  undefined4 local_3c;
  double *local_38;
  
  iVar5 = (int)((ulong)in_stack_ffffffffffffca68 >> 0x20);
  local_2d25 = true;
  local_2d24 = in_R9D;
  if ((in_ESI == 0) && (0 < in_EDX)) {
    local_2c30 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                           ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                            in_stack_ffffffffffffc850,(size_type)in_stack_ffffffffffffc848);
    local_2c34 = 2;
    local_35a1 = false;
    if ((local_2c30->vect[0] == 2) && (local_35a1 = false, local_2c30->vect[1] == 2)) {
      local_35a1 = local_2c30->vect[2] == 2;
    }
    local_2d25 = local_35a1;
  }
  Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                *)in_stack_ffffffffffffc850,(size_type)in_stack_ffffffffffffc848);
  local_2d30 = (FabArrayBase *)
               Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::operator[]
                         ((Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
                          in_stack_ffffffffffffc850,(size_type)in_stack_ffffffffffffc848);
  IVar4 = FabArrayBase::nGrowVect(local_2d30);
  local_2d50._0_8_ = IVar4.vect._0_8_;
  local_2d3c._0_4_ = local_2d50[0];
  local_2d3c._4_4_ = local_2d50[1];
  uVar1 = local_2d3c;
  local_2d50[2] = IVar4.vect[2];
  local_2d34 = local_2d50[2];
  local_2c40 = &local_2d3c;
  local_2c44 = 0;
  local_2d3c._0_4_ = IVar4.vect[0];
  local_35b1 = false;
  if ((int)local_2d3c == 0) {
    local_2d3c._4_4_ = IVar4.vect[1];
    local_35b1 = false;
    if (local_2d3c._4_4_ == 0) {
      local_35b1 = local_2d50[2] == 0;
    }
  }
  local_2d50 = IVar4.vect;
  local_2d3c = uVar1;
  if (!local_35b1) {
    local_2ce8 = "acoef.nGrowVect() == 0";
    local_2cf0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLABecLaplacian.cpp"
    ;
    local_2cf4 = 0x294;
    local_2d00 = 0;
    Assert_host(in_stack_ffffffffffffca80,in_stack_ffffffffffffca78,in_stack_ffffffffffffca74,
                in_stack_ffffffffffffca68);
  }
  Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                *)in_stack_ffffffffffffc850,(size_type)in_stack_ffffffffffffc848);
  Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>::
  operator[]((Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
              *)in_stack_ffffffffffffc850,(size_type)in_stack_ffffffffffffc848);
  local_2d58 = std::array<amrex::MultiFab,_3UL>::operator[]
                         ((array<amrex::MultiFab,_3UL> *)in_stack_ffffffffffffc850,
                          (size_type)in_stack_ffffffffffffc848);
  Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                *)in_stack_ffffffffffffc850,(size_type)in_stack_ffffffffffffc848);
  Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>::
  operator[]((Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
              *)in_stack_ffffffffffffc850,(size_type)in_stack_ffffffffffffc848);
  local_2d60 = std::array<amrex::MultiFab,_3UL>::operator[]
                         ((array<amrex::MultiFab,_3UL> *)in_stack_ffffffffffffc850,
                          (size_type)in_stack_ffffffffffffc848);
  Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                *)in_stack_ffffffffffffc850,(size_type)in_stack_ffffffffffffc848);
  Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>::
  operator[]((Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
              *)in_stack_ffffffffffffc850,(size_type)in_stack_ffffffffffffc848);
  local_2d68 = std::array<amrex::MultiFab,_3UL>::operator[]
                         ((array<amrex::MultiFab,_3UL> *)in_stack_ffffffffffffc850,
                          (size_type)in_stack_ffffffffffffc848);
  Vector<amrex::Vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>,_std::allocator<amrex::Vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>,_std::allocator<amrex::Vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>_>_>
                *)in_stack_ffffffffffffc850,(size_type)in_stack_ffffffffffffc848);
  local_2d70 = Vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_>::operator[]
                         ((Vector<amrex::BndryRegister,_std::allocator<amrex::BndryRegister>_> *)
                          in_stack_ffffffffffffc850,(size_type)in_stack_ffffffffffffc848);
  Vector<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>_>_>
                *)in_stack_ffffffffffffc850,(size_type)in_stack_ffffffffffffc848);
  local_2d78 = Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>
               ::operator[]((Vector<std::array<amrex::MultiMask,_6UL>,_std::allocator<std::array<amrex::MultiMask,_6UL>_>_>
                             *)in_stack_ffffffffffffc850,(size_type)in_stack_ffffffffffffc848);
  OrientationIter::OrientationIter(&local_2d7c);
  local_2d8c = (int)OrientationIter::operator()((OrientationIter *)in_stack_ffffffffffffc848);
  local_2d88 = BndryRegister::operator[]
                         (in_stack_ffffffffffffc848,
                          (Orientation)(int)((ulong)in_stack_ffffffffffffc850 >> 0x20));
  OrientationIter::operator++(&local_2d7c);
  local_2d9c = (int)OrientationIter::operator()((OrientationIter *)in_stack_ffffffffffffc848);
  local_2d98 = BndryRegister::operator[]
                         (in_stack_ffffffffffffc848,
                          (Orientation)(int)((ulong)in_stack_ffffffffffffc850 >> 0x20));
  OrientationIter::operator++(&local_2d7c);
  local_2dac = (int)OrientationIter::operator()((OrientationIter *)in_stack_ffffffffffffc848);
  local_2da8 = BndryRegister::operator[]
                         (in_stack_ffffffffffffc848,
                          (Orientation)(int)((ulong)in_stack_ffffffffffffc850 >> 0x20));
  OrientationIter::operator++(&local_2d7c);
  local_2dbc = (int)OrientationIter::operator()((OrientationIter *)in_stack_ffffffffffffc848);
  local_2db8 = BndryRegister::operator[]
                         (in_stack_ffffffffffffc848,
                          (Orientation)(int)((ulong)in_stack_ffffffffffffc850 >> 0x20));
  OrientationIter::operator++(&local_2d7c);
  local_2dcc = (int)OrientationIter::operator()((OrientationIter *)in_stack_ffffffffffffc848);
  local_2dc8 = BndryRegister::operator[]
                         (in_stack_ffffffffffffc848,
                          (Orientation)(int)((ulong)in_stack_ffffffffffffc850 >> 0x20));
  OrientationIter::operator++(&local_2d7c);
  local_2ddc = (int)OrientationIter::operator()((OrientationIter *)in_stack_ffffffffffffc848);
  local_2dd8 = BndryRegister::operator[]
                         (in_stack_ffffffffffffc848,
                          (Orientation)(int)((ulong)in_stack_ffffffffffffc850 >> 0x20));
  OrientationIter::operator++(&local_2d7c);
  local_2de8 = std::array<amrex::MultiMask,_6UL>::operator[]
                         ((array<amrex::MultiMask,_6UL> *)in_stack_ffffffffffffc850,
                          (size_type)in_stack_ffffffffffffc848);
  local_2df0 = std::array<amrex::MultiMask,_6UL>::operator[]
                         ((array<amrex::MultiMask,_6UL> *)in_stack_ffffffffffffc850,
                          (size_type)in_stack_ffffffffffffc848);
  local_2df8 = std::array<amrex::MultiMask,_6UL>::operator[]
                         ((array<amrex::MultiMask,_6UL> *)in_stack_ffffffffffffc850,
                          (size_type)in_stack_ffffffffffffc848);
  local_2e00 = std::array<amrex::MultiMask,_6UL>::operator[]
                         ((array<amrex::MultiMask,_6UL> *)in_stack_ffffffffffffc850,
                          (size_type)in_stack_ffffffffffffc848);
  local_2e08 = std::array<amrex::MultiMask,_6UL>::operator[]
                         ((array<amrex::MultiMask,_6UL> *)in_stack_ffffffffffffc850,
                          (size_type)in_stack_ffffffffffffc848);
  local_2e10 = std::array<amrex::MultiMask,_6UL>::operator[]
                         ((array<amrex::MultiMask,_6UL> *)in_stack_ffffffffffffc850,
                          (size_type)in_stack_ffffffffffffc848);
  local_2e14 = (**(code **)(*in_RDI + 0x28))();
  Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
  ::operator[]((Vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                *)in_stack_ffffffffffffc850,(size_type)in_stack_ffffffffffffc848);
  this_00 = Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                      ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                       in_stack_ffffffffffffc850,(size_type)in_stack_ffffffffffffc848);
  local_2e20 = CoordSys::CellSize(&this_00->super_CoordSys);
  local_2e28 = (double)in_RDI[0x66] / (*local_2e20 * *local_2e20);
  local_2e30 = (double)in_RDI[0x66] / (local_2e20[1] * local_2e20[1]);
  local_2e38 = (double)in_RDI[0x66] / (local_2e20[2] * local_2e20[2]);
  local_2e40 = (double)in_RDI[0x65];
  MFItInfo::MFItInfo((MFItInfo *)in_stack_ffffffffffffc860);
  this_01 = MFItInfo::EnableTiling(&local_2e54,(IntVect *)&FabArrayBase::mfiter_tile_size);
  MFItInfo::SetDynamic(this_01,true);
  MFIter::MFIter(in_stack_ffffffffffffc880,in_stack_ffffffffffffc878,in_stack_ffffffffffffc870);
  do {
    bVar3 = MFIter::isValid(&local_2eb8);
    if (!bVar3) {
      MFIter::~MFIter(in_stack_ffffffffffffc850);
      return;
    }
    MultiMask::array((MultiMask *)in_stack_ffffffffffffc850,(MFIter *)in_stack_ffffffffffffc848);
    local_2ec0 = local_2f00;
    MultiMask::array((MultiMask *)in_stack_ffffffffffffc850,(MFIter *)in_stack_ffffffffffffc848);
    local_2f08 = local_2f48;
    MultiMask::array((MultiMask *)in_stack_ffffffffffffc850,(MFIter *)in_stack_ffffffffffffc848);
    local_2f50 = local_2f90;
    MultiMask::array((MultiMask *)in_stack_ffffffffffffc850,(MFIter *)in_stack_ffffffffffffc848);
    local_2f98 = local_2fd8;
    MultiMask::array((MultiMask *)in_stack_ffffffffffffc850,(MFIter *)in_stack_ffffffffffffc848);
    local_2fe0 = local_3020;
    MultiMask::array((MultiMask *)in_stack_ffffffffffffc850,(MFIter *)in_stack_ffffffffffffc848);
    local_3028 = local_3068;
    MFIter::tilebox(in_stack_ffffffffffffc8b0);
    local_3070 = local_308c;
    MFIter::validbox(in_stack_ffffffffffffc860);
    local_3098 = local_30b4;
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (in_stack_ffffffffffffc858,in_stack_ffffffffffffc850);
    local_30c0 = local_3100;
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (in_stack_ffffffffffffc858,in_stack_ffffffffffffc850);
    local_3108 = local_3148;
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (in_stack_ffffffffffffc858,in_stack_ffffffffffffc850);
    local_3150 = local_3190;
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (in_stack_ffffffffffffc858,in_stack_ffffffffffffc850);
    local_3198 = local_31d8;
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (in_stack_ffffffffffffc858,in_stack_ffffffffffffc850);
    local_31e0 = local_3220;
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (in_stack_ffffffffffffc858,in_stack_ffffffffffffc850);
    local_3228 = local_3268;
    FabSet::const_array((FabSet *)in_stack_ffffffffffffc850,(MFIter *)in_stack_ffffffffffffc848);
    local_3270 = local_32b0;
    FabSet::const_array((FabSet *)in_stack_ffffffffffffc850,(MFIter *)in_stack_ffffffffffffc848);
    local_32b8 = local_32f8;
    FabSet::const_array((FabSet *)in_stack_ffffffffffffc850,(MFIter *)in_stack_ffffffffffffc848);
    local_3300 = local_3340;
    FabSet::const_array((FabSet *)in_stack_ffffffffffffc850,(MFIter *)in_stack_ffffffffffffc848);
    local_3348 = local_3388;
    FabSet::const_array((FabSet *)in_stack_ffffffffffffc850,(MFIter *)in_stack_ffffffffffffc848);
    local_3390 = local_33d0;
    FabSet::const_array((FabSet *)in_stack_ffffffffffffc850,(MFIter *)in_stack_ffffffffffffc848);
    local_33d8 = local_3418;
    Vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
    ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                  *)in_stack_ffffffffffffc850,(size_type)in_stack_ffffffffffffc848);
    Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                  *)in_stack_ffffffffffffc850,(size_type)in_stack_ffffffffffffc848);
    bVar3 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)
                       0x15598f0);
    if (bVar3) {
      Vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
      ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                    *)in_stack_ffffffffffffc850,(size_type)in_stack_ffffffffffffc848);
      Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
      ::operator[]((Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                    *)in_stack_ffffffffffffc850,(size_type)in_stack_ffffffffffffc848);
      std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>::operator->
                ((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)0x155992d);
      FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                ((FabArray<amrex::IArrayBox> *)in_stack_ffffffffffffc858,in_stack_ffffffffffffc850);
      local_2ca8 = local_3070;
      local_6b8 = local_3070;
      local_6bc = 0;
      local_2c9c = *local_3070;
      local_6c8 = local_3070;
      local_6cc = 1;
      iStack_2c98 = local_3070[1];
      local_3480 = *(undefined8 *)local_3070;
      local_6d8 = local_3070;
      local_6dc = 2;
      local_3478 = local_3070[2];
      local_2c58 = local_3070;
      local_718 = local_3070 + 3;
      local_71c = 0;
      local_2c50 = *local_718;
      local_728 = local_3070 + 3;
      local_72c = 1;
      iStack_2c4c = local_3070[4];
      local_34a0 = *(undefined8 *)local_718;
      local_738 = local_3070 + 3;
      local_73c = 2;
      local_3498 = local_3070[5];
      for (local_34a4 = 0; iVar2 = local_3478, local_348c = local_34a0, local_3484 = local_3498,
          local_3470 = local_3480, local_3468 = local_3478, local_3420 = &local_3460,
          local_2cb8 = local_3480, local_2cb0 = local_3478, local_2c94 = local_3478,
          local_2c68 = local_34a0, local_2c60 = local_3498, local_2c48 = local_3498,
          local_34a4 < local_2e14; local_34a4 = local_34a4 + 1) {
        while (local_34a8 = iVar2, iVar2 = iStack_2c98, local_34a8 <= local_3498) {
          while (local_34ac = iVar2, iVar2 = local_2c9c, local_34ac <= iStack_2c4c) {
            while (local_34b0 = iVar2, local_34b0 <= local_2c50) {
              local_2ae0 = local_2e40;
              local_2af0 = local_2e28;
              local_2af8 = local_2e30;
              local_2b00 = local_2e38;
              local_2b20 = local_2ec0;
              local_2b28 = local_2f50;
              local_2b30 = local_2fe0;
              local_2b38 = local_2f08;
              local_2b40 = local_2f98;
              local_2b48 = local_3028;
              local_2b50 = local_3270;
              local_2b58 = local_3300;
              local_2b60 = local_3390;
              local_2b68 = local_32b8;
              local_2b70 = local_3348;
              local_2b78 = local_33d8;
              local_2b88 = local_3098;
              local_2abc = local_34b0;
              local_2ac0 = local_34ac;
              local_2ac4 = local_34a8;
              local_2ac8 = local_34a4;
              local_2ad0 = local_30c0;
              local_2ad8 = local_3108;
              local_2ae8 = local_3150;
              local_2b08 = local_3198;
              local_2b10 = local_31e0;
              local_2b18 = local_3228;
              local_2b98 = 0x3ff2666666666666;
              if ((local_34b0 + local_34ac + local_34a8 + local_2d24) % 2 == 0) {
                local_8cc = local_34b0;
                local_8d0 = local_34ac;
                local_8d4 = local_34a8;
                local_8c8 = &local_3460;
                if (*(int *)(local_3460 +
                            ((long)(local_34b0 - local_3440) +
                             (local_34ac - local_343c) * local_3458 +
                            (local_34a8 - local_3438) * local_3450) * 4) == 0) {
                  local_2728 = local_30c0;
                  local_272c = local_34b0;
                  local_2730 = local_34ac;
                  local_2734 = local_34a8;
                  local_2738 = local_34a4;
                  *(undefined8 *)
                   (*local_30c0 +
                   ((long)(local_34b0 - (int)local_30c0[4]) +
                    (long)(local_34ac - *(int *)((long)local_30c0 + 0x24)) * local_30c0[1] +
                    (long)(local_34a8 - (int)local_30c0[5]) * local_30c0[2] +
                   (long)local_34a4 * local_30c0[3]) * 8) = 0;
                }
                else {
                  local_2aa8 = local_3098;
                  local_748 = local_3098;
                  local_74c = 0;
                  local_2a9c = *local_3098;
                  local_758 = local_3098;
                  local_75c = 1;
                  iStack_2a98 = local_3098[1];
                  local_2bb8 = *(undefined8 *)local_3098;
                  local_768 = local_3098;
                  local_76c = 2;
                  local_2bb0 = local_3098[2];
                  local_2a80 = local_3098;
                  local_778 = local_3098 + 3;
                  local_77c = 0;
                  local_2a74 = *local_778;
                  local_788 = local_3098 + 3;
                  local_78c = 1;
                  iStack_2a70 = local_3098[4];
                  local_2bd8 = *(undefined8 *)local_778;
                  local_798 = local_3098 + 3;
                  local_79c = 2;
                  local_2bd0 = local_3098[5];
                  if (local_34b0 == local_2a9c) {
                    local_95c = local_2a9c + -1;
                    local_958 = local_2ec0;
                    local_960 = local_34ac;
                    local_964 = local_34a8;
                    if (*(int *)(*local_2ec0 +
                                ((long)(local_95c - (int)local_2ec0[4]) +
                                 (long)(local_34ac - *(int *)((long)local_2ec0 + 0x24)) *
                                 local_2ec0[1] +
                                (long)(local_34a8 - (int)local_2ec0[5]) * local_2ec0[2]) * 4) < 1)
                    goto LAB_0155a344;
                    local_2818 = local_3270;
                    local_2820 = local_34ac;
                    local_2824 = local_34a8;
                    local_2828 = local_34a4;
                    local_3648 = *(double *)
                                  (*local_3270 +
                                  ((long)(local_2a9c - (int)local_3270[4]) +
                                   (long)(local_34ac - *(int *)((long)local_3270 + 0x24)) *
                                   local_3270[1] +
                                   (long)(local_34a8 - (int)local_3270[5]) * local_3270[2] +
                                  (long)local_34a4 * local_3270[3]) * 8);
                    local_281c = local_2a9c;
                  }
                  else {
LAB_0155a344:
                    local_3648 = 0.0;
                  }
                  local_2be0 = local_3648;
                  if (local_34ac == iStack_2a98) {
                    local_948 = iStack_2a98 + -1;
                    local_940 = local_2f08;
                    local_944 = local_34b0;
                    local_94c = local_34a8;
                    if (*(int *)(*local_2f08 +
                                ((long)(local_34b0 - (int)local_2f08[4]) +
                                 (long)(local_948 - *(int *)((long)local_2f08 + 0x24)) *
                                 local_2f08[1] +
                                (long)(local_34a8 - (int)local_2f08[5]) * local_2f08[2]) * 4) < 1)
                    goto LAB_0155a4ab;
                    local_2830 = local_32b8;
                    local_2834 = local_34b0;
                    local_283c = local_34a8;
                    local_2840 = local_34a4;
                    local_3650 = *(double *)
                                  (*local_32b8 +
                                  ((long)(local_34b0 - (int)local_32b8[4]) +
                                   (long)(iStack_2a98 - *(int *)((long)local_32b8 + 0x24)) *
                                   local_32b8[1] +
                                   (long)(local_34a8 - (int)local_32b8[5]) * local_32b8[2] +
                                  (long)local_34a4 * local_32b8[3]) * 8);
                    local_2838 = iStack_2a98;
                  }
                  else {
LAB_0155a4ab:
                    local_3650 = 0.0;
                  }
                  local_2be8 = local_3650;
                  if (local_34a8 == local_2bb0) {
                    local_934 = local_2bb0 + -1;
                    local_928 = local_2f50;
                    local_92c = local_34b0;
                    local_930 = local_34ac;
                    if (*(int *)(*local_2f50 +
                                ((long)(local_34b0 - (int)local_2f50[4]) +
                                 (long)(local_34ac - *(int *)((long)local_2f50 + 0x24)) *
                                 local_2f50[1] +
                                (long)(local_934 - (int)local_2f50[5]) * local_2f50[2]) * 4) < 1)
                    goto LAB_0155a612;
                    local_2848 = local_3300;
                    local_284c = local_34b0;
                    local_2850 = local_34ac;
                    local_2858 = local_34a4;
                    local_3658 = *(double *)
                                  (*local_3300 +
                                  ((long)(local_34b0 - (int)local_3300[4]) +
                                   (long)(local_34ac - *(int *)((long)local_3300 + 0x24)) *
                                   local_3300[1] +
                                   (long)(local_2bb0 - (int)local_3300[5]) * local_3300[2] +
                                  (long)local_34a4 * local_3300[3]) * 8);
                    local_2854 = local_2bb0;
                  }
                  else {
LAB_0155a612:
                    local_3658 = 0.0;
                  }
                  local_2bf0 = local_3658;
                  if (local_34b0 == local_2a74) {
                    local_914 = local_2a74 + 1;
                    local_910 = local_2f98;
                    local_918 = local_34ac;
                    local_91c = local_34a8;
                    if (*(int *)(*local_2f98 +
                                ((long)(local_914 - (int)local_2f98[4]) +
                                 (long)(local_34ac - *(int *)((long)local_2f98 + 0x24)) *
                                 local_2f98[1] +
                                (long)(local_34a8 - (int)local_2f98[5]) * local_2f98[2]) * 4) < 1)
                    goto LAB_0155a779;
                    local_2860 = local_3348;
                    local_2868 = local_34ac;
                    local_286c = local_34a8;
                    local_2870 = local_34a4;
                    local_3660 = *(double *)
                                  (*local_3348 +
                                  ((long)(local_2a74 - (int)local_3348[4]) +
                                   (long)(local_34ac - *(int *)((long)local_3348 + 0x24)) *
                                   local_3348[1] +
                                   (long)(local_34a8 - (int)local_3348[5]) * local_3348[2] +
                                  (long)local_34a4 * local_3348[3]) * 8);
                    local_2864 = local_2a74;
                  }
                  else {
LAB_0155a779:
                    local_3660 = 0.0;
                  }
                  local_2bf8 = local_3660;
                  if (local_34ac == iStack_2a70) {
                    local_900 = iStack_2a70 + 1;
                    local_8f8 = local_2fe0;
                    local_8fc = local_34b0;
                    local_904 = local_34a8;
                    if (*(int *)(*local_2fe0 +
                                ((long)(local_34b0 - (int)local_2fe0[4]) +
                                 (long)(local_900 - *(int *)((long)local_2fe0 + 0x24)) *
                                 local_2fe0[1] +
                                (long)(local_34a8 - (int)local_2fe0[5]) * local_2fe0[2]) * 4) < 1)
                    goto LAB_0155a8e0;
                    local_2878 = local_3390;
                    local_287c = local_34b0;
                    local_2884 = local_34a8;
                    local_2888 = local_34a4;
                    local_3668 = *(double *)
                                  (*local_3390 +
                                  ((long)(local_34b0 - (int)local_3390[4]) +
                                   (long)(iStack_2a70 - *(int *)((long)local_3390 + 0x24)) *
                                   local_3390[1] +
                                   (long)(local_34a8 - (int)local_3390[5]) * local_3390[2] +
                                  (long)local_34a4 * local_3390[3]) * 8);
                    local_2880 = iStack_2a70;
                  }
                  else {
LAB_0155a8e0:
                    local_3668 = 0.0;
                  }
                  local_2c00 = local_3668;
                  if (local_34a8 == local_2bd0) {
                    local_8ec = local_2bd0 + 1;
                    local_8e0 = local_3028;
                    local_8e4 = local_34b0;
                    local_8e8 = local_34ac;
                    if (*(int *)(*local_3028 +
                                ((long)(local_34b0 - (int)local_3028[4]) +
                                 (long)(local_34ac - *(int *)((long)local_3028 + 0x24)) *
                                 local_3028[1] +
                                (long)(local_8ec - (int)local_3028[5]) * local_3028[2]) * 4) < 1)
                    goto LAB_0155aa47;
                    local_2890 = local_33d8;
                    local_2894 = local_34b0;
                    local_2898 = local_34ac;
                    local_28a0 = local_34a4;
                    local_3670 = *(double *)
                                  (*local_33d8 +
                                  ((long)(local_34b0 - (int)local_33d8[4]) +
                                   (long)(local_34ac - *(int *)((long)local_33d8 + 0x24)) *
                                   local_33d8[1] +
                                   (long)(local_2bd0 - (int)local_33d8[5]) * local_33d8[2] +
                                  (long)local_34a4 * local_33d8[3]) * 8);
                    local_289c = local_2bd0;
                  }
                  else {
LAB_0155aa47:
                    local_3670 = 0.0;
                  }
                  local_2c08 = local_3670;
                  local_610 = local_3150;
                  local_614 = local_34b0;
                  local_618 = local_34ac;
                  local_61c = local_34a8;
                  local_28a8 = local_3198;
                  local_28ac = local_34b0;
                  local_28b0 = local_34ac;
                  local_28b4 = local_34a8;
                  local_28b8 = local_34a4;
                  local_28c4 = local_34b0 + 1;
                  local_28c0 = local_3198;
                  local_28c8 = local_34ac;
                  local_28cc = local_34a8;
                  local_28d0 = local_34a4;
                  local_28d8 = local_31e0;
                  local_28dc = local_34b0;
                  local_28e0 = local_34ac;
                  local_28e4 = local_34a8;
                  local_28e8 = local_34a4;
                  local_28f8 = local_34ac + 1;
                  local_28f0 = local_31e0;
                  local_28f4 = local_34b0;
                  local_28fc = local_34a8;
                  local_2900 = local_34a4;
                  local_2908 = local_3228;
                  local_290c = local_34b0;
                  local_2910 = local_34ac;
                  local_2914 = local_34a8;
                  local_2918 = local_34a4;
                  local_292c = local_34a8 + 1;
                  local_2920 = local_3228;
                  local_2924 = local_34b0;
                  local_2928 = local_34ac;
                  local_2930 = local_34a4;
                  local_2c10 = local_2e38 *
                               (*(double *)
                                 (*local_3228 +
                                 ((long)(local_34b0 - (int)local_3228[4]) +
                                  (long)(local_34ac - *(int *)((long)local_3228 + 0x24)) *
                                  local_3228[1] +
                                  (long)(local_34a8 - (int)local_3228[5]) * local_3228[2] +
                                 (long)local_34a4 * local_3228[3]) * 8) +
                               *(double *)
                                (*local_3228 +
                                ((long)(local_34b0 - (int)local_3228[4]) +
                                 (long)(local_34ac - *(int *)((long)local_3228 + 0x24)) *
                                 local_3228[1] +
                                 (long)(local_292c - (int)local_3228[5]) * local_3228[2] +
                                (long)local_34a4 * local_3228[3]) * 8)) +
                               local_2e30 *
                               (*(double *)
                                 (*local_31e0 +
                                 ((long)(local_34b0 - (int)local_31e0[4]) +
                                  (long)(local_34ac - *(int *)((long)local_31e0 + 0x24)) *
                                  local_31e0[1] +
                                  (long)(local_34a8 - (int)local_31e0[5]) * local_31e0[2] +
                                 (long)local_34a4 * local_31e0[3]) * 8) +
                               *(double *)
                                (*local_31e0 +
                                ((long)(local_34b0 - (int)local_31e0[4]) +
                                 (long)(local_28f8 - *(int *)((long)local_31e0 + 0x24)) *
                                 local_31e0[1] +
                                 (long)(local_34a8 - (int)local_31e0[5]) * local_31e0[2] +
                                (long)local_34a4 * local_31e0[3]) * 8)) +
                               local_2e40 *
                               *(double *)
                                (*local_3150 +
                                ((long)(local_34b0 - (int)local_3150[4]) +
                                 (long)(local_34ac - *(int *)((long)local_3150 + 0x24)) *
                                 local_3150[1] +
                                (long)(local_34a8 - (int)local_3150[5]) * local_3150[2]) * 8) +
                               local_2e28 *
                               (*(double *)
                                 (*local_3198 +
                                 ((long)(local_34b0 - (int)local_3198[4]) +
                                  (long)(local_34ac - *(int *)((long)local_3198 + 0x24)) *
                                  local_3198[1] +
                                  (long)(local_34a8 - (int)local_3198[5]) * local_3198[2] +
                                 (long)local_34a4 * local_3198[3]) * 8) +
                               *(double *)
                                (*local_3198 +
                                ((long)(local_28c4 - (int)local_3198[4]) +
                                 (long)(local_34ac - *(int *)((long)local_3198 + 0x24)) *
                                 local_3198[1] +
                                 (long)(local_34a8 - (int)local_3198[5]) * local_3198[2] +
                                (long)local_34a4 * local_3198[3]) * 8));
                  local_2938 = local_3198;
                  local_293c = local_34b0;
                  local_2940 = local_34ac;
                  local_2944 = local_34a8;
                  local_2948 = local_34a4;
                  local_2954 = local_34b0 + 1;
                  local_2950 = local_3198;
                  local_2958 = local_34ac;
                  local_295c = local_34a8;
                  local_2960 = local_34a4;
                  local_2968 = local_31e0;
                  local_296c = local_34b0;
                  local_2970 = local_34ac;
                  local_2974 = local_34a8;
                  local_2978 = local_34a4;
                  local_2988 = local_34ac + 1;
                  local_2980 = local_31e0;
                  local_2984 = local_34b0;
                  local_298c = local_34a8;
                  local_2990 = local_34a4;
                  local_2998 = local_3228;
                  local_299c = local_34b0;
                  local_29a0 = local_34ac;
                  local_29a4 = local_34a8;
                  local_29a8 = local_34a4;
                  local_29bc = local_34a8 + 1;
                  local_29b0 = local_3228;
                  local_29b4 = local_34b0;
                  local_29b8 = local_34ac;
                  local_29c0 = local_34a4;
                  local_2c18 = local_2c10 -
                               (local_2e38 *
                                (*(double *)
                                  (*local_3228 +
                                  ((long)(local_34b0 - (int)local_3228[4]) +
                                   (long)(local_34ac - *(int *)((long)local_3228 + 0x24)) *
                                   local_3228[1] +
                                   (long)(local_34a8 - (int)local_3228[5]) * local_3228[2] +
                                  (long)local_34a4 * local_3228[3]) * 8) * local_3658 +
                                *(double *)
                                 (*local_3228 +
                                 ((long)(local_34b0 - (int)local_3228[4]) +
                                  (long)(local_34ac - *(int *)((long)local_3228 + 0x24)) *
                                  local_3228[1] +
                                  (long)(local_29bc - (int)local_3228[5]) * local_3228[2] +
                                 (long)local_34a4 * local_3228[3]) * 8) * local_3670) +
                               local_2e28 *
                               (*(double *)
                                 (*local_3198 +
                                 ((long)(local_34b0 - (int)local_3198[4]) +
                                  (long)(local_34ac - *(int *)((long)local_3198 + 0x24)) *
                                  local_3198[1] +
                                  (long)(local_34a8 - (int)local_3198[5]) * local_3198[2] +
                                 (long)local_34a4 * local_3198[3]) * 8) * local_3648 +
                               *(double *)
                                (*local_3198 +
                                ((long)(local_2954 - (int)local_3198[4]) +
                                 (long)(local_34ac - *(int *)((long)local_3198 + 0x24)) *
                                 local_3198[1] +
                                 (long)(local_34a8 - (int)local_3198[5]) * local_3198[2] +
                                (long)local_34a4 * local_3198[3]) * 8) * local_3660) +
                               local_2e30 *
                               (*(double *)
                                 (*local_31e0 +
                                 ((long)(local_34b0 - (int)local_31e0[4]) +
                                  (long)(local_34ac - *(int *)((long)local_31e0 + 0x24)) *
                                  local_31e0[1] +
                                  (long)(local_34a8 - (int)local_31e0[5]) * local_31e0[2] +
                                 (long)local_34a4 * local_31e0[3]) * 8) * local_3650 +
                               *(double *)
                                (*local_31e0 +
                                ((long)(local_34b0 - (int)local_31e0[4]) +
                                 (long)(local_2988 - *(int *)((long)local_31e0 + 0x24)) *
                                 local_31e0[1] +
                                 (long)(local_34a8 - (int)local_31e0[5]) * local_31e0[2] +
                                (long)local_34a4 * local_31e0[3]) * 8) * local_3668));
                  local_29c8 = local_3198;
                  local_29cc = local_34b0;
                  local_29d0 = local_34ac;
                  local_29d4 = local_34a8;
                  local_29d8 = local_34a4;
                  local_2744 = local_34b0 + -1;
                  local_2740 = local_30c0;
                  local_2748 = local_34ac;
                  local_274c = local_34a8;
                  local_2750 = local_34a4;
                  local_29e4 = local_34b0 + 1;
                  local_29e0 = local_3198;
                  local_29e8 = local_34ac;
                  local_29ec = local_34a8;
                  local_29f0 = local_34a4;
                  local_275c = local_34b0 + 1;
                  local_2758 = local_30c0;
                  local_2760 = local_34ac;
                  local_2764 = local_34a8;
                  local_2768 = local_34a4;
                  local_29f8 = local_31e0;
                  local_29fc = local_34b0;
                  local_2a00 = local_34ac;
                  local_2a04 = local_34a8;
                  local_2a08 = local_34a4;
                  local_2778 = local_34ac + -1;
                  local_2770 = local_30c0;
                  local_2774 = local_34b0;
                  local_277c = local_34a8;
                  local_2780 = local_34a4;
                  local_2a18 = local_34ac + 1;
                  local_2a10 = local_31e0;
                  local_2a14 = local_34b0;
                  local_2a1c = local_34a8;
                  local_2a20 = local_34a4;
                  local_2790 = local_34ac + 1;
                  local_2788 = local_30c0;
                  local_278c = local_34b0;
                  local_2794 = local_34a8;
                  local_2798 = local_34a4;
                  local_2a28 = local_3228;
                  local_2a2c = local_34b0;
                  local_2a30 = local_34ac;
                  local_2a34 = local_34a8;
                  local_2a38 = local_34a4;
                  local_27ac = local_34a8 + -1;
                  local_27a0 = local_30c0;
                  local_27a4 = local_34b0;
                  local_27a8 = local_34ac;
                  local_27b0 = local_34a4;
                  local_2a4c = local_34a8 + 1;
                  local_2a40 = local_3228;
                  local_2a44 = local_34b0;
                  local_2a48 = local_34ac;
                  local_2a50 = local_34a4;
                  local_27c4 = local_34a8 + 1;
                  local_27b8 = local_30c0;
                  local_27bc = local_34b0;
                  local_27c0 = local_34ac;
                  local_27c8 = local_34a4;
                  local_2c20 = local_2e38 *
                               (*(double *)
                                 (*local_3228 +
                                 ((long)(local_34b0 - (int)local_3228[4]) +
                                  (long)(local_34ac - *(int *)((long)local_3228 + 0x24)) *
                                  local_3228[1] +
                                  (long)(local_34a8 - (int)local_3228[5]) * local_3228[2] +
                                 (long)local_34a4 * local_3228[3]) * 8) *
                                *(double *)
                                 (*local_30c0 +
                                 ((long)(local_34b0 - (int)local_30c0[4]) +
                                  (long)(local_34ac - *(int *)((long)local_30c0 + 0x24)) *
                                  local_30c0[1] +
                                  (long)(local_27ac - (int)local_30c0[5]) * local_30c0[2] +
                                 (long)local_34a4 * local_30c0[3]) * 8) +
                               *(double *)
                                (*local_3228 +
                                ((long)(local_34b0 - (int)local_3228[4]) +
                                 (long)(local_34ac - *(int *)((long)local_3228 + 0x24)) *
                                 local_3228[1] +
                                 (long)(local_2a4c - (int)local_3228[5]) * local_3228[2] +
                                (long)local_34a4 * local_3228[3]) * 8) *
                               *(double *)
                                (*local_30c0 +
                                ((long)(local_34b0 - (int)local_30c0[4]) +
                                 (long)(local_34ac - *(int *)((long)local_30c0 + 0x24)) *
                                 local_30c0[1] +
                                 (long)(local_27c4 - (int)local_30c0[5]) * local_30c0[2] +
                                (long)local_34a4 * local_30c0[3]) * 8)) +
                               local_2e28 *
                               (*(double *)
                                 (*local_3198 +
                                 ((long)(local_34b0 - (int)local_3198[4]) +
                                  (long)(local_34ac - *(int *)((long)local_3198 + 0x24)) *
                                  local_3198[1] +
                                  (long)(local_34a8 - (int)local_3198[5]) * local_3198[2] +
                                 (long)local_34a4 * local_3198[3]) * 8) *
                                *(double *)
                                 (*local_30c0 +
                                 ((long)(local_2744 - (int)local_30c0[4]) +
                                  (long)(local_34ac - *(int *)((long)local_30c0 + 0x24)) *
                                  local_30c0[1] +
                                  (long)(local_34a8 - (int)local_30c0[5]) * local_30c0[2] +
                                 (long)local_34a4 * local_30c0[3]) * 8) +
                               *(double *)
                                (*local_3198 +
                                ((long)(local_29e4 - (int)local_3198[4]) +
                                 (long)(local_34ac - *(int *)((long)local_3198 + 0x24)) *
                                 local_3198[1] +
                                 (long)(local_34a8 - (int)local_3198[5]) * local_3198[2] +
                                (long)local_34a4 * local_3198[3]) * 8) *
                               *(double *)
                                (*local_30c0 +
                                ((long)(local_275c - (int)local_30c0[4]) +
                                 (long)(local_34ac - *(int *)((long)local_30c0 + 0x24)) *
                                 local_30c0[1] +
                                 (long)(local_34a8 - (int)local_30c0[5]) * local_30c0[2] +
                                (long)local_34a4 * local_30c0[3]) * 8)) +
                               local_2e30 *
                               (*(double *)
                                 (*local_31e0 +
                                 ((long)(local_34b0 - (int)local_31e0[4]) +
                                  (long)(local_34ac - *(int *)((long)local_31e0 + 0x24)) *
                                  local_31e0[1] +
                                  (long)(local_34a8 - (int)local_31e0[5]) * local_31e0[2] +
                                 (long)local_34a4 * local_31e0[3]) * 8) *
                                *(double *)
                                 (*local_30c0 +
                                 ((long)(local_34b0 - (int)local_30c0[4]) +
                                  (long)(local_2778 - *(int *)((long)local_30c0 + 0x24)) *
                                  local_30c0[1] +
                                  (long)(local_34a8 - (int)local_30c0[5]) * local_30c0[2] +
                                 (long)local_34a4 * local_30c0[3]) * 8) +
                               *(double *)
                                (*local_31e0 +
                                ((long)(local_34b0 - (int)local_31e0[4]) +
                                 (long)(local_2a18 - *(int *)((long)local_31e0 + 0x24)) *
                                 local_31e0[1] +
                                 (long)(local_34a8 - (int)local_31e0[5]) * local_31e0[2] +
                                (long)local_34a4 * local_31e0[3]) * 8) *
                               *(double *)
                                (*local_30c0 +
                                ((long)(local_34b0 - (int)local_30c0[4]) +
                                 (long)(local_2790 - *(int *)((long)local_30c0 + 0x24)) *
                                 local_30c0[1] +
                                 (long)(local_34a8 - (int)local_30c0[5]) * local_30c0[2] +
                                (long)local_34a4 * local_30c0[3]) * 8));
                  local_2a58 = local_3108;
                  local_2a5c = local_34b0;
                  local_2a60 = local_34ac;
                  local_2a64 = local_34a8;
                  local_2a68 = local_34a4;
                  local_27d0 = local_30c0;
                  local_27d4 = local_34b0;
                  local_27d8 = local_34ac;
                  local_27dc = local_34a8;
                  local_27e0 = local_34a4;
                  local_2c28 = *(double *)
                                (*local_3108 +
                                ((long)(local_34b0 - (int)local_3108[4]) +
                                 (long)(local_34ac - *(int *)((long)local_3108 + 0x24)) *
                                 local_3108[1] +
                                 (long)(local_34a8 - (int)local_3108[5]) * local_3108[2] +
                                (long)local_34a4 * local_3108[3]) * 8) -
                               (local_2c10 *
                                *(double *)
                                 (*local_30c0 +
                                 ((long)(local_34b0 - (int)local_30c0[4]) +
                                  (long)(local_34ac - *(int *)((long)local_30c0 + 0x24)) *
                                  local_30c0[1] +
                                  (long)(local_34a8 - (int)local_30c0[5]) * local_30c0[2] +
                                 (long)local_34a4 * local_30c0[3]) * 8) + -local_2c20);
                  local_27e8 = local_30c0;
                  local_27ec = local_34b0;
                  local_27f0 = local_34ac;
                  local_27f4 = local_34a8;
                  local_27f8 = local_34a4;
                  local_2800 = local_30c0;
                  local_2804 = local_34b0;
                  local_2808 = local_34ac;
                  local_280c = local_34a8;
                  local_2810 = local_34a4;
                  *(double *)
                   (*local_30c0 +
                   ((long)(local_34b0 - (int)local_30c0[4]) +
                    (long)(local_34ac - *(int *)((long)local_30c0 + 0x24)) * local_30c0[1] +
                    (long)(local_34a8 - (int)local_30c0[5]) * local_30c0[2] +
                   (long)local_34a4 * local_30c0[3]) * 8) =
                       (1.15 / local_2c18) * local_2c28 +
                       *(double *)
                        (*local_30c0 +
                        ((long)(local_34b0 - (int)local_30c0[4]) +
                         (long)(local_34ac - *(int *)((long)local_30c0 + 0x24)) * local_30c0[1] +
                         (long)(local_34a8 - (int)local_30c0[5]) * local_30c0[2] +
                        (long)local_34a4 * local_30c0[3]) * 8);
                  local_2bc4 = local_2bd8;
                  local_2bbc = local_2bd0;
                  local_2ba8 = local_2bb8;
                  local_2ba0 = local_2bb0;
                  local_2ab8 = local_2bb8;
                  local_2ab0 = local_2bb0;
                  local_2a94 = local_2bb0;
                  local_2a90 = local_2bd8;
                  local_2a88 = local_2bd0;
                  local_2a6c = local_2bd0;
                }
              }
              local_2b80 = &local_3460;
              iVar2 = local_34b0 + 1;
            }
            iVar2 = local_34ac + 1;
          }
          iVar2 = local_34a8 + 1;
        }
      }
    }
    else if ((local_2d25 & 1U) == 0) {
      Gpu::LaunchSafeGuard::LaunchSafeGuard(&local_3501,false);
      Gpu::Range<amrex::Box>((Box *)in_stack_ffffffffffffc850);
      local_3520 = local_3548;
      Gpu::range_detail::range_impl<amrex::Box>::begin
                ((range_impl<amrex::Box> *)in_stack_ffffffffffffc850);
      Gpu::range_detail::range_impl<amrex::Box>::end
                ((range_impl<amrex::Box> *)in_stack_ffffffffffffc850);
      while (bVar3 = Gpu::range_detail::range_impl<amrex::Box>::iterator::operator!=
                               (&local_3560,&local_3578), bVar3) {
        Gpu::range_detail::range_impl<amrex::Box>::iterator::operator*
                  ((Box *)&stack0xffffffffffffca6c,&local_3560);
        local_1984 = iVar5;
        local_19d8 = local_30c0;
        local_19e0 = local_3108;
        local_19e8 = local_2e40;
        local_19f0 = local_3150;
        local_19f8 = local_2e28;
        local_1a00 = local_2e30;
        local_1a08 = local_2e38;
        local_1a10 = local_3198;
        local_1a18 = local_31e0;
        local_1a20 = local_3228;
        local_1a28 = local_2ec0;
        local_1a30 = local_2f50;
        local_1a38 = local_2fe0;
        local_1a40 = local_2f08;
        local_1a48 = local_2f98;
        local_1a50 = local_3028;
        local_1a58 = local_3270;
        local_1a60 = local_3300;
        local_1a68 = local_3390;
        local_1a70 = local_32b8;
        local_1a78 = local_3348;
        local_1a80 = local_33d8;
        local_1a88 = local_3098;
        local_1a8c = local_2d24;
        local_1a90 = local_2e14;
        local_80c = 0;
        local_81c = 1;
        local_1ab0 = CONCAT44(local_3590,local_1984);
        local_82c = 2;
        local_838 = &stack0xffffffffffffca78;
        local_83c = 0;
        local_1934 = (int)in_stack_ffffffffffffca78;
        local_848 = &stack0xffffffffffffca78;
        local_84c = 1;
        iStack_1930 = (int)((ulong)in_stack_ffffffffffffca78 >> 0x20);
        local_858 = &stack0xffffffffffffca78;
        local_85c = 2;
        local_1ac8 = (int)in_stack_ffffffffffffca80;
        local_19b8 = local_3098;
        local_868 = local_3098;
        local_86c = 0;
        local_19ac = *local_3098;
        local_878 = local_3098;
        local_87c = 1;
        iStack_19a8 = local_3098[1];
        local_1af0 = *(undefined8 *)local_3098;
        local_888 = local_3098;
        local_88c = 2;
        local_1ae8 = local_3098[2];
        local_1968 = local_3098;
        local_898 = local_3098 + 3;
        local_89c = 0;
        local_195c = *local_898;
        local_8a8 = local_3098 + 3;
        local_8ac = 1;
        iStack_1958 = local_3098[4];
        local_1b10 = *(undefined8 *)local_898;
        local_8b8 = local_3098 + 3;
        local_8bc = 2;
        local_1b08 = local_3098[5];
        local_1b14 = 2;
        local_1b18 = (local_1ac8 - in_stack_ffffffffffffca74) + 1;
        if ((local_2e28 <= local_2e30) && (local_2e38 <= local_2e30)) {
          local_1b14 = 1;
          local_1b18 = (iStack_1930 - local_3590) + 1;
        }
        if ((local_2e30 <= local_2e28) && (local_2e38 <= local_2e28)) {
          local_1b14 = 0;
          local_1b18 = (local_1934 - local_1984) + 1;
        }
        local_1afc = local_1b10;
        local_1af4 = local_1b08;
        local_1ae0 = local_1af0;
        local_1ad8 = local_1ae8;
        local_1ac0 = in_stack_ffffffffffffca78;
        local_1ab8 = local_1ac8;
        local_1aa0 = local_1ab0;
        local_1a98 = in_stack_ffffffffffffca74;
        local_19d0 = (Box *)&stack0xffffffffffffca6c;
        local_19c8 = local_1af0;
        local_19c0 = local_1ae8;
        local_19a4 = local_1ae8;
        local_19a0 = local_1ab0;
        local_1990 = (Box *)&stack0xffffffffffffca6c;
        local_1978 = local_1b10;
        local_1970 = local_1b08;
        local_1954 = local_1b08;
        local_1948 = local_1ac8;
        local_1940 = (Box *)&stack0xffffffffffffca6c;
        local_192c = local_1ac8;
        local_828 = (Box *)&stack0xffffffffffffca6c;
        local_818 = (Box *)&stack0xffffffffffffca6c;
        local_808 = (Box *)&stack0xffffffffffffca6c;
        iVar5 = local_1984;
        if (0x20 < local_1b18) {
          local_608 = "abec_gsrb_with_line_solve is hard-wired to be no longer than 32";
          Abort_host((char *)in_stack_ffffffffffffc860);
        }
        if (local_1b14 == 2) {
          for (local_211c = 0; local_211c < local_1a90; local_211c = local_211c + 1) {
            for (local_2120 = local_1aa0._4_4_; local_2120 <= local_1ac0._4_4_;
                local_2120 = local_2120 + 1) {
              for (local_2124 = (int)local_1aa0; local_2124 <= (int)local_1ac0;
                  local_2124 = local_2124 + 1) {
                if ((local_2124 + local_2120 + local_1a8c) % 2 == 0) {
                  for (local_2128 = local_1a98; local_2128 <= local_1ab8;
                      local_2128 = local_2128 + 1) {
                    local_670 = local_19f0;
                    local_674 = local_2124;
                    local_678 = local_2120;
                    local_67c = local_2128;
                    local_1078 = local_1a10;
                    local_107c = local_2124;
                    local_1080 = local_2120;
                    local_1084 = local_2128;
                    local_1088 = local_211c;
                    local_1090 = local_1a10;
                    local_1094 = local_2124 + 1;
                    local_1098 = local_2120;
                    local_109c = local_2128;
                    local_10a0 = local_211c;
                    local_10a8 = local_1a18;
                    local_10ac = local_2124;
                    local_10b0 = local_2120;
                    local_10b4 = local_2128;
                    local_10b8 = local_211c;
                    local_10c0 = local_1a18;
                    local_10c4 = local_2124;
                    local_10c8 = local_2120 + 1;
                    local_10cc = local_2128;
                    local_10d0 = local_211c;
                    local_10d8 = local_1a20;
                    local_10dc = local_2124;
                    local_10e0 = local_2120;
                    local_10e4 = local_2128;
                    local_10e8 = local_211c;
                    local_10f0 = local_1a20;
                    local_10f4 = local_2124;
                    local_10f8 = local_2120;
                    local_10fc = local_2128 + 1;
                    local_1100 = local_211c;
                    local_2130 = local_1a08 *
                                 (*(double *)
                                   (*local_1a20 +
                                   ((long)(local_2124 - (int)local_1a20[4]) +
                                    (long)(local_2120 - *(int *)((long)local_1a20 + 0x24)) *
                                    local_1a20[1] +
                                    (long)(local_2128 - (int)local_1a20[5]) * local_1a20[2] +
                                   (long)local_211c * local_1a20[3]) * 8) +
                                 *(double *)
                                  (*local_1a20 +
                                  ((long)(local_2124 - (int)local_1a20[4]) +
                                   (long)(local_2120 - *(int *)((long)local_1a20 + 0x24)) *
                                   local_1a20[1] +
                                   (long)(local_10fc - (int)local_1a20[5]) * local_1a20[2] +
                                  (long)local_211c * local_1a20[3]) * 8)) +
                                 local_1a00 *
                                 (*(double *)
                                   (*local_1a18 +
                                   ((long)(local_2124 - (int)local_1a18[4]) +
                                    (long)(local_2120 - *(int *)((long)local_1a18 + 0x24)) *
                                    local_1a18[1] +
                                    (long)(local_2128 - (int)local_1a18[5]) * local_1a18[2] +
                                   (long)local_211c * local_1a18[3]) * 8) +
                                 *(double *)
                                  (*local_1a18 +
                                  ((long)(local_2124 - (int)local_1a18[4]) +
                                   (long)(local_10c8 - *(int *)((long)local_1a18 + 0x24)) *
                                   local_1a18[1] +
                                   (long)(local_2128 - (int)local_1a18[5]) * local_1a18[2] +
                                  (long)local_211c * local_1a18[3]) * 8)) +
                                 local_19e8 *
                                 *(double *)
                                  (*local_19f0 +
                                  ((long)(local_2124 - (int)local_19f0[4]) +
                                   (long)(local_2120 - *(int *)((long)local_19f0 + 0x24)) *
                                   local_19f0[1] +
                                  (long)(local_2128 - (int)local_19f0[5]) * local_19f0[2]) * 8) +
                                 local_19f8 *
                                 (*(double *)
                                   (*local_1a10 +
                                   ((long)(local_2124 - (int)local_1a10[4]) +
                                    (long)(local_2120 - *(int *)((long)local_1a10 + 0x24)) *
                                    local_1a10[1] +
                                    (long)(local_2128 - (int)local_1a10[5]) * local_1a10[2] +
                                   (long)local_211c * local_1a10[3]) * 8) +
                                 *(double *)
                                  (*local_1a10 +
                                  ((long)(local_1094 - (int)local_1a10[4]) +
                                   (long)(local_2120 - *(int *)((long)local_1a10 + 0x24)) *
                                   local_1a10[1] +
                                   (long)(local_2128 - (int)local_1a10[5]) * local_1a10[2] +
                                  (long)local_211c * local_1a10[3]) * 8));
                    if (local_2124 == (int)local_1ae0) {
                      local_d4c = (int)local_1ae0 + -1;
                      local_d48 = local_1a28;
                      local_d50 = local_2120;
                      local_d54 = local_2128;
                      if (*(int *)(*local_1a28 +
                                  ((long)(local_d4c - (int)local_1a28[4]) +
                                   (long)(local_2120 - *(int *)((long)local_1a28 + 0x24)) *
                                   local_1a28[1] +
                                  (long)(local_2128 - (int)local_1a28[5]) * local_1a28[2]) * 4) < 1)
                      goto LAB_0155f0a5;
                      local_1108 = local_1a58;
                      local_110c = (int)local_1ae0;
                      local_1110 = local_2120;
                      local_1114 = local_2128;
                      local_1118 = local_211c;
                      local_3728 = *(double *)
                                    (*local_1a58 +
                                    ((long)((int)local_1ae0 - (int)local_1a58[4]) +
                                     (long)(local_2120 - *(int *)((long)local_1a58 + 0x24)) *
                                     local_1a58[1] +
                                     (long)(local_2128 - (int)local_1a58[5]) * local_1a58[2] +
                                    (long)local_211c * local_1a58[3]) * 8);
                    }
                    else {
LAB_0155f0a5:
                      local_3728 = 0.0;
                    }
                    local_2138 = local_3728;
                    if (local_2120 == local_1ae0._4_4_) {
                      local_d38 = local_1ae0._4_4_ + -1;
                      local_d30 = local_1a40;
                      local_d34 = local_2124;
                      local_d3c = local_2128;
                      if (*(int *)(*local_1a40 +
                                  ((long)(local_2124 - (int)local_1a40[4]) +
                                   (long)(local_d38 - *(int *)((long)local_1a40 + 0x24)) *
                                   local_1a40[1] +
                                  (long)(local_2128 - (int)local_1a40[5]) * local_1a40[2]) * 4) < 1)
                      goto LAB_0155f20c;
                      local_1120 = local_1a70;
                      local_1124 = local_2124;
                      local_1128 = local_1ae0._4_4_;
                      local_112c = local_2128;
                      local_1130 = local_211c;
                      local_3730 = *(double *)
                                    (*local_1a70 +
                                    ((long)(local_2124 - (int)local_1a70[4]) +
                                     (long)(local_1ae0._4_4_ - *(int *)((long)local_1a70 + 0x24)) *
                                     local_1a70[1] +
                                     (long)(local_2128 - (int)local_1a70[5]) * local_1a70[2] +
                                    (long)local_211c * local_1a70[3]) * 8);
                    }
                    else {
LAB_0155f20c:
                      local_3730 = 0.0;
                    }
                    local_2140 = local_3730;
                    if (local_2128 == local_1ad8) {
                      local_d24 = local_1ad8 + -1;
                      local_d18 = local_1a30;
                      local_d1c = local_2124;
                      local_d20 = local_2120;
                      if (*(int *)(*local_1a30 +
                                  ((long)(local_2124 - (int)local_1a30[4]) +
                                   (long)(local_2120 - *(int *)((long)local_1a30 + 0x24)) *
                                   local_1a30[1] +
                                  (long)(local_d24 - (int)local_1a30[5]) * local_1a30[2]) * 4) < 1)
                      goto LAB_0155f373;
                      local_1138 = local_1a60;
                      local_113c = local_2124;
                      local_1140 = local_2120;
                      local_1144 = local_1ad8;
                      local_1148 = local_211c;
                      local_3738 = *(double *)
                                    (*local_1a60 +
                                    ((long)(local_2124 - (int)local_1a60[4]) +
                                     (long)(local_2120 - *(int *)((long)local_1a60 + 0x24)) *
                                     local_1a60[1] +
                                     (long)(local_1ad8 - (int)local_1a60[5]) * local_1a60[2] +
                                    (long)local_211c * local_1a60[3]) * 8);
                    }
                    else {
LAB_0155f373:
                      local_3738 = 0.0;
                    }
                    local_2148 = local_3738;
                    if (local_2124 == (int)local_1afc) {
                      local_d04 = (int)local_1afc + 1;
                      local_d00 = local_1a48;
                      local_d08 = local_2120;
                      local_d0c = local_2128;
                      if (*(int *)(*local_1a48 +
                                  ((long)(local_d04 - (int)local_1a48[4]) +
                                   (long)(local_2120 - *(int *)((long)local_1a48 + 0x24)) *
                                   local_1a48[1] +
                                  (long)(local_2128 - (int)local_1a48[5]) * local_1a48[2]) * 4) < 1)
                      goto LAB_0155f4d7;
                      local_1150 = local_1a78;
                      local_1154 = (int)local_1afc;
                      local_1158 = local_2120;
                      local_115c = local_2128;
                      local_1160 = local_211c;
                      local_3740 = *(double *)
                                    (*local_1a78 +
                                    ((long)((int)local_1afc - (int)local_1a78[4]) +
                                     (long)(local_2120 - *(int *)((long)local_1a78 + 0x24)) *
                                     local_1a78[1] +
                                     (long)(local_2128 - (int)local_1a78[5]) * local_1a78[2] +
                                    (long)local_211c * local_1a78[3]) * 8);
                    }
                    else {
LAB_0155f4d7:
                      local_3740 = 0.0;
                    }
                    local_2150 = local_3740;
                    if (local_2120 == local_1afc._4_4_) {
                      local_cf0 = local_1afc._4_4_ + 1;
                      local_ce8 = local_1a38;
                      local_cec = local_2124;
                      local_cf4 = local_2128;
                      if (*(int *)(*local_1a38 +
                                  ((long)(local_2124 - (int)local_1a38[4]) +
                                   (long)(local_cf0 - *(int *)((long)local_1a38 + 0x24)) *
                                   local_1a38[1] +
                                  (long)(local_2128 - (int)local_1a38[5]) * local_1a38[2]) * 4) < 1)
                      goto LAB_0155f635;
                      local_1168 = local_1a68;
                      local_116c = local_2124;
                      local_1170 = local_1afc._4_4_;
                      local_1174 = local_2128;
                      local_1178 = local_211c;
                      local_3748 = *(double *)
                                    (*local_1a68 +
                                    ((long)(local_2124 - (int)local_1a68[4]) +
                                     (long)(local_1afc._4_4_ - *(int *)((long)local_1a68 + 0x24)) *
                                     local_1a68[1] +
                                     (long)(local_2128 - (int)local_1a68[5]) * local_1a68[2] +
                                    (long)local_211c * local_1a68[3]) * 8);
                    }
                    else {
LAB_0155f635:
                      local_3748 = 0.0;
                    }
                    local_2158 = local_3748;
                    if (local_2128 == local_1af4) {
                      local_cdc = local_1af4 + 1;
                      local_cd0 = local_1a50;
                      local_cd4 = local_2124;
                      local_cd8 = local_2120;
                      if (*(int *)(*local_1a50 +
                                  ((long)(local_2124 - (int)local_1a50[4]) +
                                   (long)(local_2120 - *(int *)((long)local_1a50 + 0x24)) *
                                   local_1a50[1] +
                                  (long)(local_cdc - (int)local_1a50[5]) * local_1a50[2]) * 4) < 1)
                      goto LAB_0155f793;
                      local_1180 = local_1a80;
                      local_1184 = local_2124;
                      local_1188 = local_2120;
                      local_118c = local_1af4;
                      local_1190 = local_211c;
                      in_stack_ffffffffffffc8b0 =
                           *(MFIter **)
                            (*local_1a80 +
                            ((long)(local_2124 - (int)local_1a80[4]) +
                             (long)(local_2120 - *(int *)((long)local_1a80 + 0x24)) * local_1a80[1]
                             + (long)(local_1af4 - (int)local_1a80[5]) * local_1a80[2] +
                            (long)local_211c * local_1a80[3]) * 8);
                    }
                    else {
LAB_0155f793:
                      in_stack_ffffffffffffc8b0 = (MFIter *)0x0;
                    }
                    local_1198 = local_1a10;
                    local_119c = local_2124;
                    local_11a0 = local_2120;
                    local_11a4 = local_2128;
                    local_11a8 = local_211c;
                    local_11b0 = local_1a10;
                    local_11b4 = local_2124 + 1;
                    local_11b8 = local_2120;
                    local_11bc = local_2128;
                    local_11c0 = local_211c;
                    local_11c8 = local_1a18;
                    local_11cc = local_2124;
                    local_11d0 = local_2120;
                    local_11d4 = local_2128;
                    local_11d8 = local_211c;
                    local_11e0 = local_1a18;
                    local_11e4 = local_2124;
                    local_11e8 = local_2120 + 1;
                    local_11ec = local_2128;
                    local_11f0 = local_211c;
                    local_11f8 = local_1a20;
                    local_11fc = local_2124;
                    local_1200 = local_2120;
                    local_1204 = local_2128;
                    local_1208 = local_211c;
                    local_1210 = local_1a20;
                    local_1214 = local_2124;
                    local_1218 = local_2120;
                    local_121c = local_2128 + 1;
                    local_1220 = local_211c;
                    local_2168 = local_2130 -
                                 (local_1a08 *
                                  (*(double *)
                                    (*local_1a20 +
                                    ((long)(local_2124 - (int)local_1a20[4]) +
                                     (long)(local_2120 - *(int *)((long)local_1a20 + 0x24)) *
                                     local_1a20[1] +
                                     (long)(local_2128 - (int)local_1a20[5]) * local_1a20[2] +
                                    (long)local_211c * local_1a20[3]) * 8) * local_3738 +
                                  *(double *)
                                   (*local_1a20 +
                                   ((long)(local_2124 - (int)local_1a20[4]) +
                                    (long)(local_2120 - *(int *)((long)local_1a20 + 0x24)) *
                                    local_1a20[1] +
                                    (long)(local_121c - (int)local_1a20[5]) * local_1a20[2] +
                                   (long)local_211c * local_1a20[3]) * 8) *
                                  (double)in_stack_ffffffffffffc8b0) +
                                 local_19f8 *
                                 (*(double *)
                                   (*local_1a10 +
                                   ((long)(local_2124 - (int)local_1a10[4]) +
                                    (long)(local_2120 - *(int *)((long)local_1a10 + 0x24)) *
                                    local_1a10[1] +
                                    (long)(local_2128 - (int)local_1a10[5]) * local_1a10[2] +
                                   (long)local_211c * local_1a10[3]) * 8) * local_3728 +
                                 *(double *)
                                  (*local_1a10 +
                                  ((long)(local_11b4 - (int)local_1a10[4]) +
                                   (long)(local_2120 - *(int *)((long)local_1a10 + 0x24)) *
                                   local_1a10[1] +
                                   (long)(local_2128 - (int)local_1a10[5]) * local_1a10[2] +
                                  (long)local_211c * local_1a10[3]) * 8) * local_3740) +
                                 local_1a00 *
                                 (*(double *)
                                   (*local_1a18 +
                                   ((long)(local_2124 - (int)local_1a18[4]) +
                                    (long)(local_2120 - *(int *)((long)local_1a18 + 0x24)) *
                                    local_1a18[1] +
                                    (long)(local_2128 - (int)local_1a18[5]) * local_1a18[2] +
                                   (long)local_211c * local_1a18[3]) * 8) * local_3730 +
                                 *(double *)
                                  (*local_1a18 +
                                  ((long)(local_2124 - (int)local_1a18[4]) +
                                   (long)(local_11e8 - *(int *)((long)local_1a18 + 0x24)) *
                                   local_1a18[1] +
                                   (long)(local_2128 - (int)local_1a18[5]) * local_1a18[2] +
                                  (long)local_211c * local_1a18[3]) * 8) * local_3748));
                    local_1228 = local_1a10;
                    local_122c = local_2124;
                    local_1230 = local_2120;
                    local_1234 = local_2128;
                    local_1238 = local_211c;
                    local_d60 = local_19d8;
                    local_d64 = local_2124 + -1;
                    local_d68 = local_2120;
                    local_d6c = local_2128;
                    local_d70 = local_211c;
                    local_1240 = local_1a10;
                    local_1244 = local_2124 + 1;
                    local_1248 = local_2120;
                    local_124c = local_2128;
                    local_1250 = local_211c;
                    local_d78 = local_19d8;
                    local_d7c = local_2124 + 1;
                    local_d80 = local_2120;
                    local_d84 = local_2128;
                    local_d88 = local_211c;
                    local_1258 = local_1a18;
                    local_125c = local_2124;
                    local_1260 = local_2120;
                    local_1264 = local_2128;
                    local_1268 = local_211c;
                    local_d90 = local_19d8;
                    local_d94 = local_2124;
                    local_d98 = local_2120 + -1;
                    local_d9c = local_2128;
                    local_da0 = local_211c;
                    local_1270 = local_1a18;
                    local_1274 = local_2124;
                    local_1278 = local_2120 + 1;
                    local_127c = local_2128;
                    local_1280 = local_211c;
                    local_da8 = local_19d8;
                    local_dac = local_2124;
                    local_db0 = local_2120 + 1;
                    local_db4 = local_2128;
                    local_db8 = local_211c;
                    local_2170 = local_19f8 *
                                 (*(double *)
                                   (*local_1a10 +
                                   ((long)(local_2124 - (int)local_1a10[4]) +
                                    (long)(local_2120 - *(int *)((long)local_1a10 + 0x24)) *
                                    local_1a10[1] +
                                    (long)(local_2128 - (int)local_1a10[5]) * local_1a10[2] +
                                   (long)local_211c * local_1a10[3]) * 8) *
                                  *(double *)
                                   (*local_19d8 +
                                   ((long)(local_d64 - (int)local_19d8[4]) +
                                    (long)(local_2120 - *(int *)((long)local_19d8 + 0x24)) *
                                    local_19d8[1] +
                                    (long)(local_2128 - (int)local_19d8[5]) * local_19d8[2] +
                                   (long)local_211c * local_19d8[3]) * 8) +
                                 *(double *)
                                  (*local_1a10 +
                                  ((long)(local_1244 - (int)local_1a10[4]) +
                                   (long)(local_2120 - *(int *)((long)local_1a10 + 0x24)) *
                                   local_1a10[1] +
                                   (long)(local_2128 - (int)local_1a10[5]) * local_1a10[2] +
                                  (long)local_211c * local_1a10[3]) * 8) *
                                 *(double *)
                                  (*local_19d8 +
                                  ((long)(local_d7c - (int)local_19d8[4]) +
                                   (long)(local_2120 - *(int *)((long)local_19d8 + 0x24)) *
                                   local_19d8[1] +
                                   (long)(local_2128 - (int)local_19d8[5]) * local_19d8[2] +
                                  (long)local_211c * local_19d8[3]) * 8)) +
                                 local_1a00 *
                                 (*(double *)
                                   (*local_1a18 +
                                   ((long)(local_2124 - (int)local_1a18[4]) +
                                    (long)(local_2120 - *(int *)((long)local_1a18 + 0x24)) *
                                    local_1a18[1] +
                                    (long)(local_2128 - (int)local_1a18[5]) * local_1a18[2] +
                                   (long)local_211c * local_1a18[3]) * 8) *
                                  *(double *)
                                   (*local_19d8 +
                                   ((long)(local_2124 - (int)local_19d8[4]) +
                                    (long)(local_d98 - *(int *)((long)local_19d8 + 0x24)) *
                                    local_19d8[1] +
                                    (long)(local_2128 - (int)local_19d8[5]) * local_19d8[2] +
                                   (long)local_211c * local_19d8[3]) * 8) +
                                 *(double *)
                                  (*local_1a18 +
                                  ((long)(local_2124 - (int)local_1a18[4]) +
                                   (long)(local_1278 - *(int *)((long)local_1a18 + 0x24)) *
                                   local_1a18[1] +
                                   (long)(local_2128 - (int)local_1a18[5]) * local_1a18[2] +
                                  (long)local_211c * local_1a18[3]) * 8) *
                                 *(double *)
                                  (*local_19d8 +
                                  ((long)(local_2124 - (int)local_19d8[4]) +
                                   (long)(local_db0 - *(int *)((long)local_19d8 + 0x24)) *
                                   local_19d8[1] +
                                   (long)(local_2128 - (int)local_19d8[5]) * local_19d8[2] +
                                  (long)local_211c * local_19d8[3]) * 8));
                    if (local_2124 == (int)local_1ae0) {
                      local_cbc = (int)local_1ae0 + -1;
                      local_cb8 = local_1a28;
                      local_cc0 = local_2120;
                      local_cc4 = local_2128;
                      if (0 < *(int *)(*local_1a28 +
                                      ((long)(local_cbc - (int)local_1a28[4]) +
                                       (long)(local_2120 - *(int *)((long)local_1a28 + 0x24)) *
                                       local_1a28[1] +
                                      (long)(local_2128 - (int)local_1a28[5]) * local_1a28[2]) * 4))
                      {
                        local_1288 = local_1a10;
                        local_128c = local_2124;
                        local_1290 = local_2120;
                        local_1294 = local_2128;
                        local_1298 = local_211c;
                        local_dc4 = local_2124 + -1;
                        local_dc0 = local_19d8;
                        local_dc8 = local_2120;
                        local_dcc = local_2128;
                        local_dd0 = local_211c;
                        local_2170 = -(local_19f8 *
                                      *(double *)
                                       (*local_1a10 +
                                       ((long)(local_2124 - (int)local_1a10[4]) +
                                        (long)(local_2120 - *(int *)((long)local_1a10 + 0x24)) *
                                        local_1a10[1] +
                                        (long)(local_2128 - (int)local_1a10[5]) * local_1a10[2] +
                                       (long)local_211c * local_1a10[3]) * 8)) *
                                     *(double *)
                                      (*local_19d8 +
                                      ((long)(local_dc4 - (int)local_19d8[4]) +
                                       (long)(local_2120 - *(int *)((long)local_19d8 + 0x24)) *
                                       local_19d8[1] +
                                       (long)(local_2128 - (int)local_19d8[5]) * local_19d8[2] +
                                      (long)local_211c * local_19d8[3]) * 8) + local_2170;
                      }
                    }
                    if (local_2124 == (int)local_1afc) {
                      local_ca4 = (int)local_1afc + 1;
                      local_ca0 = local_1a48;
                      local_ca8 = local_2120;
                      local_cac = local_2128;
                      if (0 < *(int *)(*local_1a48 +
                                      ((long)(local_ca4 - (int)local_1a48[4]) +
                                       (long)(local_2120 - *(int *)((long)local_1a48 + 0x24)) *
                                       local_1a48[1] +
                                      (long)(local_2128 - (int)local_1a48[5]) * local_1a48[2]) * 4))
                      {
                        local_12a4 = local_2124 + 1;
                        local_12a0 = local_1a10;
                        local_12a8 = local_2120;
                        local_12ac = local_2128;
                        local_12b0 = local_211c;
                        local_ddc = local_2124 + 1;
                        local_dd8 = local_19d8;
                        local_de0 = local_2120;
                        local_de4 = local_2128;
                        local_de8 = local_211c;
                        local_2170 = -(local_19f8 *
                                      *(double *)
                                       (*local_1a10 +
                                       ((long)(local_12a4 - (int)local_1a10[4]) +
                                        (long)(local_2120 - *(int *)((long)local_1a10 + 0x24)) *
                                        local_1a10[1] +
                                        (long)(local_2128 - (int)local_1a10[5]) * local_1a10[2] +
                                       (long)local_211c * local_1a10[3]) * 8)) *
                                     *(double *)
                                      (*local_19d8 +
                                      ((long)(local_ddc - (int)local_19d8[4]) +
                                       (long)(local_2120 - *(int *)((long)local_19d8 + 0x24)) *
                                       local_19d8[1] +
                                       (long)(local_2128 - (int)local_19d8[5]) * local_19d8[2] +
                                      (long)local_211c * local_19d8[3]) * 8) + local_2170;
                      }
                    }
                    if (local_2120 == local_1ae0._4_4_) {
                      local_c90 = local_1ae0._4_4_ + -1;
                      local_c88 = local_1a40;
                      local_c8c = local_2124;
                      local_c94 = local_2128;
                      if (0 < *(int *)(*local_1a40 +
                                      ((long)(local_2124 - (int)local_1a40[4]) +
                                       (long)(local_c90 - *(int *)((long)local_1a40 + 0x24)) *
                                       local_1a40[1] +
                                      (long)(local_2128 - (int)local_1a40[5]) * local_1a40[2]) * 4))
                      {
                        local_12b8 = local_1a18;
                        local_12bc = local_2124;
                        local_12c0 = local_2120;
                        local_12c4 = local_2128;
                        local_12c8 = local_211c;
                        local_df8 = local_2120 + -1;
                        local_df0 = local_19d8;
                        local_df4 = local_2124;
                        local_dfc = local_2128;
                        local_e00 = local_211c;
                        local_2170 = -(local_1a00 *
                                      *(double *)
                                       (*local_1a18 +
                                       ((long)(local_2124 - (int)local_1a18[4]) +
                                        (long)(local_2120 - *(int *)((long)local_1a18 + 0x24)) *
                                        local_1a18[1] +
                                        (long)(local_2128 - (int)local_1a18[5]) * local_1a18[2] +
                                       (long)local_211c * local_1a18[3]) * 8)) *
                                     *(double *)
                                      (*local_19d8 +
                                      ((long)(local_2124 - (int)local_19d8[4]) +
                                       (long)(local_df8 - *(int *)((long)local_19d8 + 0x24)) *
                                       local_19d8[1] +
                                       (long)(local_2128 - (int)local_19d8[5]) * local_19d8[2] +
                                      (long)local_211c * local_19d8[3]) * 8) + local_2170;
                      }
                    }
                    if (local_2120 == local_1afc._4_4_) {
                      local_c78 = local_1afc._4_4_ + 1;
                      local_c70 = local_1a38;
                      local_c74 = local_2124;
                      local_c7c = local_2128;
                      if (0 < *(int *)(*local_1a38 +
                                      ((long)(local_2124 - (int)local_1a38[4]) +
                                       (long)(local_c78 - *(int *)((long)local_1a38 + 0x24)) *
                                       local_1a38[1] +
                                      (long)(local_2128 - (int)local_1a38[5]) * local_1a38[2]) * 4))
                      {
                        local_12d8 = local_2120 + 1;
                        local_12d0 = local_1a18;
                        local_12d4 = local_2124;
                        local_12dc = local_2128;
                        local_12e0 = local_211c;
                        local_e10 = local_2120 + 1;
                        local_e08 = local_19d8;
                        local_e0c = local_2124;
                        local_e14 = local_2128;
                        local_e18 = local_211c;
                        local_2170 = -(local_1a00 *
                                      *(double *)
                                       (*local_1a18 +
                                       ((long)(local_2124 - (int)local_1a18[4]) +
                                        (long)(local_12d8 - *(int *)((long)local_1a18 + 0x24)) *
                                        local_1a18[1] +
                                        (long)(local_2128 - (int)local_1a18[5]) * local_1a18[2] +
                                       (long)local_211c * local_1a18[3]) * 8)) *
                                     *(double *)
                                      (*local_19d8 +
                                      ((long)(local_2124 - (int)local_19d8[4]) +
                                       (long)(local_e10 - *(int *)((long)local_19d8 + 0x24)) *
                                       local_19d8[1] +
                                       (long)(local_2128 - (int)local_19d8[5]) * local_19d8[2] +
                                      (long)local_211c * local_19d8[3]) * 8) + local_2170;
                      }
                    }
                    local_12e8 = local_1a20;
                    local_12ec = local_2124;
                    local_12f0 = local_2120;
                    local_12f4 = local_2128;
                    local_12f8 = local_211c;
                    local_57c = local_2128 - local_1a98;
                    local_578 = local_1c18;
                    local_578[local_57c] =
                         -local_1a08 *
                         *(double *)
                          (*local_1a20 +
                          ((long)(local_2124 - (int)local_1a20[4]) +
                           (long)(local_2120 - *(int *)((long)local_1a20 + 0x24)) * local_1a20[1] +
                           (long)(local_2128 - (int)local_1a20[5]) * local_1a20[2] +
                          (long)local_211c * local_1a20[3]) * 8);
                    local_58c = local_2128 - local_1a98;
                    local_588 = local_1d18;
                    local_588[local_58c] = local_2168;
                    local_1300 = local_1a20;
                    local_1304 = local_2124;
                    local_1308 = local_2120;
                    local_130c = local_2128 + 1;
                    local_1310 = local_211c;
                    local_59c = local_2128 - local_1a98;
                    local_598 = local_1e18;
                    local_598[local_59c] =
                         -local_1a08 *
                         *(double *)
                          (*local_1a20 +
                          ((long)(local_2124 - (int)local_1a20[4]) +
                           (long)(local_2120 - *(int *)((long)local_1a20 + 0x24)) * local_1a20[1] +
                           (long)(local_130c - (int)local_1a20[5]) * local_1a20[2] +
                          (long)local_211c * local_1a20[3]) * 8);
                    local_5ac = local_2128 - local_1a98;
                    local_5a8 = local_2018;
                    local_5a8[local_5ac] = 0.0;
                    local_1318 = local_19e0;
                    local_131c = local_2124;
                    local_1320 = local_2120;
                    local_1324 = local_2128;
                    local_1328 = local_211c;
                    local_5bc = local_2128 - local_1a98;
                    local_5b8 = local_1f18;
                    local_5b8[local_5bc] =
                         *(double *)
                          (*local_19e0 +
                          ((long)(local_2124 - (int)local_19e0[4]) +
                           (long)(local_2120 - *(int *)((long)local_19e0 + 0x24)) * local_19e0[1] +
                           (long)(local_2128 - (int)local_19e0[5]) * local_19e0[2] +
                          (long)local_211c * local_19e0[3]) * 8) + local_2170;
                    if (local_2128 == local_1a98) {
                      local_5ec = local_2128 - local_1a98;
                      local_5e8 = local_1c18;
                      local_5e8[local_5ec] = 0.0;
                      local_c64 = local_1ad8 + -1;
                      local_c58 = local_1a30;
                      local_c5c = local_2124;
                      local_c60 = local_2120;
                      if (*(int *)(*local_1a30 +
                                  ((long)(local_2124 - (int)local_1a30[4]) +
                                   (long)(local_2120 - *(int *)((long)local_1a30 + 0x24)) *
                                   local_1a30[1] +
                                  (long)(local_c64 - (int)local_1a30[5]) * local_1a30[2]) * 4) < 1)
                      {
                        local_1330 = local_1a20;
                        local_1334 = local_2124;
                        local_1338 = local_2120;
                        local_133c = local_2128;
                        local_1340 = local_211c;
                        local_e2c = local_2128 + -1;
                        local_e20 = local_19d8;
                        local_e24 = local_2124;
                        local_e28 = local_2120;
                        local_e30 = local_211c;
                        local_5fc = local_2128 - local_1a98;
                        local_5f8 = local_1f18;
                        local_5f8[local_5fc] =
                             local_1a08 *
                             *(double *)
                              (*local_1a20 +
                              ((long)(local_2124 - (int)local_1a20[4]) +
                               (long)(local_2120 - *(int *)((long)local_1a20 + 0x24)) *
                               local_1a20[1] +
                               (long)(local_2128 - (int)local_1a20[5]) * local_1a20[2] +
                              (long)local_211c * local_1a20[3]) * 8) *
                             *(double *)
                              (*local_19d8 +
                              ((long)(local_2124 - (int)local_19d8[4]) +
                               (long)(local_2120 - *(int *)((long)local_19d8 + 0x24)) *
                               local_19d8[1] +
                               (long)(local_e2c - (int)local_19d8[5]) * local_19d8[2] +
                              (long)local_211c * local_19d8[3]) * 8) + local_5f8[local_5fc];
                      }
                    }
                    if (local_2128 == local_1ab8) {
                      local_5cc = local_2128 - local_1a98;
                      local_5c8 = local_1e18;
                      local_5c8[local_5cc] = 0.0;
                      local_c4c = local_1af4 + 1;
                      local_c40 = local_1a50;
                      local_c44 = local_2124;
                      local_c48 = local_2120;
                      if (*(int *)(*local_1a50 +
                                  ((long)(local_2124 - (int)local_1a50[4]) +
                                   (long)(local_2120 - *(int *)((long)local_1a50 + 0x24)) *
                                   local_1a50[1] +
                                  (long)(local_c4c - (int)local_1a50[5]) * local_1a50[2]) * 4) < 1)
                      {
                        local_1354 = local_2128 + 1;
                        local_1348 = local_1a20;
                        local_134c = local_2124;
                        local_1350 = local_2120;
                        local_1358 = local_211c;
                        local_e44 = local_2128 + 1;
                        local_e38 = local_19d8;
                        local_e3c = local_2124;
                        local_e40 = local_2120;
                        local_e48 = local_211c;
                        local_5dc = local_2128 - local_1a98;
                        local_5d8 = local_1f18;
                        local_5d8[local_5dc] =
                             local_1a08 *
                             *(double *)
                              (*local_1a20 +
                              ((long)(local_2124 - (int)local_1a20[4]) +
                               (long)(local_2120 - *(int *)((long)local_1a20 + 0x24)) *
                               local_1a20[1] +
                               (long)(local_1354 - (int)local_1a20[5]) * local_1a20[2] +
                              (long)local_211c * local_1a20[3]) * 8) *
                             *(double *)
                              (*local_19d8 +
                              ((long)(local_2124 - (int)local_19d8[4]) +
                               (long)(local_2120 - *(int *)((long)local_19d8 + 0x24)) *
                               local_19d8[1] +
                               (long)(local_e44 - (int)local_19d8[5]) * local_19d8[2] +
                              (long)local_211c * local_19d8[3]) * 8) + local_5d8[local_5dc];
                      }
                    }
                    local_2160 = in_stack_ffffffffffffc8b0;
                  }
                  local_3e0 = local_1c18;
                  local_3e8 = local_1d18;
                  local_3f0 = local_1e18;
                  local_3f8 = local_1f18;
                  local_400 = local_2018;
                  local_408 = local_2118;
                  local_40c = local_1b18;
                  local_2dc = 0;
                  local_418 = local_1d18[0];
                  local_2ec = 0;
                  local_2018[0] = local_1f18[0] / local_1d18[0];
                  local_2fc = 0;
                  local_2f8 = local_400;
                  local_2e8 = local_3f8;
                  local_2d8 = local_3e8;
                  for (local_41c = 1; local_41c <= local_40c + -1; local_41c = local_41c + 1) {
                    local_30c = local_41c + -1;
                    local_308 = local_3f0;
                    local_318 = local_408;
                    local_31c = local_41c;
                    *(double *)(local_408 + (long)local_41c * 8) = local_3f0[local_30c] / local_418;
                    local_328 = local_3e8;
                    local_32c = local_41c;
                    local_338 = local_3e0;
                    local_33c = local_41c;
                    local_348 = local_408;
                    local_34c = local_41c;
                    local_418 = -local_3e0[local_41c] * *(double *)(local_408 + (long)local_41c * 8)
                                + local_3e8[local_41c];
                    if ((local_418 == 0.0) && (!NAN(local_418))) {
                      local_3d8 = ">>>TRIDIAG FAILED";
                      Abort_host((char *)in_stack_ffffffffffffc860);
                    }
                    local_358 = local_3f8;
                    local_35c = local_41c;
                    local_368 = local_3e0;
                    local_36c = local_41c;
                    local_378 = local_400;
                    local_37c = local_41c + -1;
                    local_388 = local_400;
                    local_38c = local_41c;
                    local_400[local_41c] =
                         (-local_3e0[local_41c] * local_400[local_37c] + local_3f8[local_41c]) /
                         local_418;
                  }
                  for (local_420 = local_40c + -2; -1 < local_420; local_420 = local_420 + -1) {
                    local_398 = local_400;
                    local_39c = local_420;
                    local_3a8 = local_408;
                    local_3ac = local_420 + 1;
                    local_3b8 = local_400;
                    local_3bc = local_420 + 1;
                    local_3c8 = local_400;
                    local_3cc = local_420;
                    local_400[local_420] =
                         -*(double *)(local_408 + (long)local_3ac * 8) * local_400[local_3bc] +
                         local_400[local_420];
                  }
                  for (local_2174 = local_1a98; local_2174 <= local_1ab8;
                      local_2174 = local_2174 + 1) {
                    local_56c = local_2174 - local_1a98;
                    local_568 = local_2018;
                    local_e50 = local_19d8;
                    local_e54 = local_2124;
                    local_e58 = local_2120;
                    local_e5c = local_2174;
                    local_e60 = local_211c;
                    *(double *)
                     (*local_19d8 +
                     ((long)(local_2124 - (int)local_19d8[4]) +
                      (long)(local_2120 - *(int *)((long)local_19d8 + 0x24)) * local_19d8[1] +
                      (long)(local_2174 - (int)local_19d8[5]) * local_19d8[2] +
                     (long)local_211c * local_19d8[3]) * 8) = local_568[local_56c];
                  }
                }
              }
            }
          }
        }
        else if (local_1b14 == 1) {
          for (local_2178 = 0; local_2178 < local_1a90; local_2178 = local_2178 + 1) {
            for (local_217c = (int)local_1aa0; local_217c <= (int)local_1ac0;
                local_217c = local_217c + 1) {
              for (local_2180 = local_1a98; local_2180 <= local_1ab8; local_2180 = local_2180 + 1) {
                if ((local_217c + local_2180 + local_1a8c) % 2 == 0) {
                  for (local_2184 = local_1aa0._4_4_; local_2184 <= local_1ac0._4_4_;
                      local_2184 = local_2184 + 1) {
                    local_658 = local_19f0;
                    local_65c = local_217c;
                    local_660 = local_2184;
                    local_664 = local_2180;
                    local_1360 = local_1a10;
                    local_1364 = local_217c;
                    local_1368 = local_2184;
                    local_136c = local_2180;
                    local_1370 = local_2178;
                    local_1378 = local_1a10;
                    local_137c = local_217c + 1;
                    local_1380 = local_2184;
                    local_1384 = local_2180;
                    local_1388 = local_2178;
                    local_1390 = local_1a18;
                    local_1394 = local_217c;
                    local_1398 = local_2184;
                    local_139c = local_2180;
                    local_13a0 = local_2178;
                    local_13a8 = local_1a18;
                    local_13ac = local_217c;
                    local_13b0 = local_2184 + 1;
                    local_13b4 = local_2180;
                    local_13b8 = local_2178;
                    local_13c0 = local_1a20;
                    local_13c4 = local_217c;
                    local_13c8 = local_2184;
                    local_13cc = local_2180;
                    local_13d0 = local_2178;
                    local_13d8 = local_1a20;
                    local_13dc = local_217c;
                    local_13e0 = local_2184;
                    local_13e4 = local_2180 + 1;
                    local_13e8 = local_2178;
                    local_2190 = local_1a08 *
                                 (*(double *)
                                   (*local_1a20 +
                                   ((long)(local_217c - (int)local_1a20[4]) +
                                    (long)(local_2184 - *(int *)((long)local_1a20 + 0x24)) *
                                    local_1a20[1] +
                                    (long)(local_2180 - (int)local_1a20[5]) * local_1a20[2] +
                                   (long)local_2178 * local_1a20[3]) * 8) +
                                 *(double *)
                                  (*local_1a20 +
                                  ((long)(local_217c - (int)local_1a20[4]) +
                                   (long)(local_2184 - *(int *)((long)local_1a20 + 0x24)) *
                                   local_1a20[1] +
                                   (long)(local_13e4 - (int)local_1a20[5]) * local_1a20[2] +
                                  (long)local_2178 * local_1a20[3]) * 8)) +
                                 local_1a00 *
                                 (*(double *)
                                   (*local_1a18 +
                                   ((long)(local_217c - (int)local_1a18[4]) +
                                    (long)(local_2184 - *(int *)((long)local_1a18 + 0x24)) *
                                    local_1a18[1] +
                                    (long)(local_2180 - (int)local_1a18[5]) * local_1a18[2] +
                                   (long)local_2178 * local_1a18[3]) * 8) +
                                 *(double *)
                                  (*local_1a18 +
                                  ((long)(local_217c - (int)local_1a18[4]) +
                                   (long)(local_13b0 - *(int *)((long)local_1a18 + 0x24)) *
                                   local_1a18[1] +
                                   (long)(local_2180 - (int)local_1a18[5]) * local_1a18[2] +
                                  (long)local_2178 * local_1a18[3]) * 8)) +
                                 local_19e8 *
                                 *(double *)
                                  (*local_19f0 +
                                  ((long)(local_217c - (int)local_19f0[4]) +
                                   (long)(local_2184 - *(int *)((long)local_19f0 + 0x24)) *
                                   local_19f0[1] +
                                  (long)(local_2180 - (int)local_19f0[5]) * local_19f0[2]) * 8) +
                                 local_19f8 *
                                 (*(double *)
                                   (*local_1a10 +
                                   ((long)(local_217c - (int)local_1a10[4]) +
                                    (long)(local_2184 - *(int *)((long)local_1a10 + 0x24)) *
                                    local_1a10[1] +
                                    (long)(local_2180 - (int)local_1a10[5]) * local_1a10[2] +
                                   (long)local_2178 * local_1a10[3]) * 8) +
                                 *(double *)
                                  (*local_1a10 +
                                  ((long)(local_137c - (int)local_1a10[4]) +
                                   (long)(local_2184 - *(int *)((long)local_1a10 + 0x24)) *
                                   local_1a10[1] +
                                   (long)(local_2180 - (int)local_1a10[5]) * local_1a10[2] +
                                  (long)local_2178 * local_1a10[3]) * 8));
                    if (local_217c == (int)local_1ae0) {
                      local_c2c = (int)local_1ae0 + -1;
                      local_c28 = local_1a28;
                      local_c30 = local_2184;
                      local_c34 = local_2180;
                      if (*(int *)(*local_1a28 +
                                  ((long)(local_c2c - (int)local_1a28[4]) +
                                   (long)(local_2184 - *(int *)((long)local_1a28 + 0x24)) *
                                   local_1a28[1] +
                                  (long)(local_2180 - (int)local_1a28[5]) * local_1a28[2]) * 4) < 1)
                      goto LAB_01561eae;
                      local_13f0 = local_1a58;
                      local_13f4 = (int)local_1ae0;
                      local_13f8 = local_2184;
                      local_13fc = local_2180;
                      local_1400 = local_2178;
                      local_3758 = *(double *)
                                    (*local_1a58 +
                                    ((long)((int)local_1ae0 - (int)local_1a58[4]) +
                                     (long)(local_2184 - *(int *)((long)local_1a58 + 0x24)) *
                                     local_1a58[1] +
                                     (long)(local_2180 - (int)local_1a58[5]) * local_1a58[2] +
                                    (long)local_2178 * local_1a58[3]) * 8);
                    }
                    else {
LAB_01561eae:
                      local_3758 = 0.0;
                    }
                    local_2198 = local_3758;
                    if (local_2184 == local_1ae0._4_4_) {
                      local_c18 = local_1ae0._4_4_ + -1;
                      local_c10 = local_1a40;
                      local_c14 = local_217c;
                      local_c1c = local_2180;
                      if (*(int *)(*local_1a40 +
                                  ((long)(local_217c - (int)local_1a40[4]) +
                                   (long)(local_c18 - *(int *)((long)local_1a40 + 0x24)) *
                                   local_1a40[1] +
                                  (long)(local_2180 - (int)local_1a40[5]) * local_1a40[2]) * 4) < 1)
                      goto LAB_0156200c;
                      local_1408 = local_1a70;
                      local_140c = local_217c;
                      local_1410 = local_1ae0._4_4_;
                      local_1414 = local_2180;
                      local_1418 = local_2178;
                      local_3760 = *(double *)
                                    (*local_1a70 +
                                    ((long)(local_217c - (int)local_1a70[4]) +
                                     (long)(local_1ae0._4_4_ - *(int *)((long)local_1a70 + 0x24)) *
                                     local_1a70[1] +
                                     (long)(local_2180 - (int)local_1a70[5]) * local_1a70[2] +
                                    (long)local_2178 * local_1a70[3]) * 8);
                    }
                    else {
LAB_0156200c:
                      local_3760 = 0.0;
                    }
                    local_21a0 = local_3760;
                    if (local_2180 == local_1ad8) {
                      local_c04 = local_1ad8 + -1;
                      local_bf8 = local_1a30;
                      local_bfc = local_217c;
                      local_c00 = local_2184;
                      if (*(int *)(*local_1a30 +
                                  ((long)(local_217c - (int)local_1a30[4]) +
                                   (long)(local_2184 - *(int *)((long)local_1a30 + 0x24)) *
                                   local_1a30[1] +
                                  (long)(local_c04 - (int)local_1a30[5]) * local_1a30[2]) * 4) < 1)
                      goto LAB_0156216a;
                      local_1420 = local_1a60;
                      local_1424 = local_217c;
                      local_1428 = local_2184;
                      local_142c = local_1ad8;
                      local_1430 = local_2178;
                      local_3768 = *(double *)
                                    (*local_1a60 +
                                    ((long)(local_217c - (int)local_1a60[4]) +
                                     (long)(local_2184 - *(int *)((long)local_1a60 + 0x24)) *
                                     local_1a60[1] +
                                     (long)(local_1ad8 - (int)local_1a60[5]) * local_1a60[2] +
                                    (long)local_2178 * local_1a60[3]) * 8);
                    }
                    else {
LAB_0156216a:
                      local_3768 = 0.0;
                    }
                    local_21a8 = local_3768;
                    if (local_217c == (int)local_1afc) {
                      local_be4 = (int)local_1afc + 1;
                      local_be0 = local_1a48;
                      local_be8 = local_2184;
                      local_bec = local_2180;
                      if (*(int *)(*local_1a48 +
                                  ((long)(local_be4 - (int)local_1a48[4]) +
                                   (long)(local_2184 - *(int *)((long)local_1a48 + 0x24)) *
                                   local_1a48[1] +
                                  (long)(local_2180 - (int)local_1a48[5]) * local_1a48[2]) * 4) < 1)
                      goto LAB_015622c8;
                      local_1438 = local_1a78;
                      local_143c = (int)local_1afc;
                      local_1440 = local_2184;
                      local_1444 = local_2180;
                      local_1448 = local_2178;
                      local_3770 = *(double *)
                                    (*local_1a78 +
                                    ((long)((int)local_1afc - (int)local_1a78[4]) +
                                     (long)(local_2184 - *(int *)((long)local_1a78 + 0x24)) *
                                     local_1a78[1] +
                                     (long)(local_2180 - (int)local_1a78[5]) * local_1a78[2] +
                                    (long)local_2178 * local_1a78[3]) * 8);
                    }
                    else {
LAB_015622c8:
                      local_3770 = 0.0;
                    }
                    local_21b0 = local_3770;
                    if (local_2184 == local_1afc._4_4_) {
                      local_bd0 = local_1afc._4_4_ + 1;
                      local_bc8 = local_1a38;
                      local_bcc = local_217c;
                      local_bd4 = local_2180;
                      if (*(int *)(*local_1a38 +
                                  ((long)(local_217c - (int)local_1a38[4]) +
                                   (long)(local_bd0 - *(int *)((long)local_1a38 + 0x24)) *
                                   local_1a38[1] +
                                  (long)(local_2180 - (int)local_1a38[5]) * local_1a38[2]) * 4) < 1)
                      goto LAB_01562426;
                      local_1450 = local_1a68;
                      local_1454 = local_217c;
                      local_1458 = local_1afc._4_4_;
                      local_145c = local_2180;
                      local_1460 = local_2178;
                      local_3778 = *(double *)
                                    (*local_1a68 +
                                    ((long)(local_217c - (int)local_1a68[4]) +
                                     (long)(local_1afc._4_4_ - *(int *)((long)local_1a68 + 0x24)) *
                                     local_1a68[1] +
                                     (long)(local_2180 - (int)local_1a68[5]) * local_1a68[2] +
                                    (long)local_2178 * local_1a68[3]) * 8);
                    }
                    else {
LAB_01562426:
                      local_3778 = 0.0;
                    }
                    local_21b8 = local_3778;
                    if (local_2180 == local_1af4) {
                      local_bbc = local_1af4 + 1;
                      local_bb0 = local_1a50;
                      local_bb4 = local_217c;
                      local_bb8 = local_2184;
                      if (*(int *)(*local_1a50 +
                                  ((long)(local_217c - (int)local_1a50[4]) +
                                   (long)(local_2184 - *(int *)((long)local_1a50 + 0x24)) *
                                   local_1a50[1] +
                                  (long)(local_bbc - (int)local_1a50[5]) * local_1a50[2]) * 4) < 1)
                      goto LAB_01562584;
                      local_1468 = local_1a80;
                      local_146c = local_217c;
                      local_1470 = local_2184;
                      local_1474 = local_1af4;
                      local_1478 = local_2178;
                      local_21c0 = *(double *)
                                    (*local_1a80 +
                                    ((long)(local_217c - (int)local_1a80[4]) +
                                     (long)(local_2184 - *(int *)((long)local_1a80 + 0x24)) *
                                     local_1a80[1] +
                                     (long)(local_1af4 - (int)local_1a80[5]) * local_1a80[2] +
                                    (long)local_2178 * local_1a80[3]) * 8);
                    }
                    else {
LAB_01562584:
                      local_21c0 = 0.0;
                    }
                    local_1480 = local_1a10;
                    local_1484 = local_217c;
                    local_1488 = local_2184;
                    local_148c = local_2180;
                    local_1490 = local_2178;
                    local_1498 = local_1a10;
                    local_149c = local_217c + 1;
                    local_14a0 = local_2184;
                    local_14a4 = local_2180;
                    local_14a8 = local_2178;
                    local_14b0 = local_1a18;
                    local_14b4 = local_217c;
                    local_14b8 = local_2184;
                    local_14bc = local_2180;
                    local_14c0 = local_2178;
                    local_14c8 = local_1a18;
                    local_14cc = local_217c;
                    local_14d0 = local_2184 + 1;
                    local_14d4 = local_2180;
                    local_14d8 = local_2178;
                    local_14e0 = local_1a20;
                    local_14e4 = local_217c;
                    local_14e8 = local_2184;
                    local_14ec = local_2180;
                    local_14f0 = local_2178;
                    local_14f8 = local_1a20;
                    local_14fc = local_217c;
                    local_1500 = local_2184;
                    local_1504 = local_2180 + 1;
                    local_1508 = local_2178;
                    local_21c8 = local_2190 -
                                 (local_1a08 *
                                  (*(double *)
                                    (*local_1a20 +
                                    ((long)(local_217c - (int)local_1a20[4]) +
                                     (long)(local_2184 - *(int *)((long)local_1a20 + 0x24)) *
                                     local_1a20[1] +
                                     (long)(local_2180 - (int)local_1a20[5]) * local_1a20[2] +
                                    (long)local_2178 * local_1a20[3]) * 8) * local_3768 +
                                  *(double *)
                                   (*local_1a20 +
                                   ((long)(local_217c - (int)local_1a20[4]) +
                                    (long)(local_2184 - *(int *)((long)local_1a20 + 0x24)) *
                                    local_1a20[1] +
                                    (long)(local_1504 - (int)local_1a20[5]) * local_1a20[2] +
                                   (long)local_2178 * local_1a20[3]) * 8) * local_21c0) +
                                 local_19f8 *
                                 (*(double *)
                                   (*local_1a10 +
                                   ((long)(local_217c - (int)local_1a10[4]) +
                                    (long)(local_2184 - *(int *)((long)local_1a10 + 0x24)) *
                                    local_1a10[1] +
                                    (long)(local_2180 - (int)local_1a10[5]) * local_1a10[2] +
                                   (long)local_2178 * local_1a10[3]) * 8) * local_3758 +
                                 *(double *)
                                  (*local_1a10 +
                                  ((long)(local_149c - (int)local_1a10[4]) +
                                   (long)(local_2184 - *(int *)((long)local_1a10 + 0x24)) *
                                   local_1a10[1] +
                                   (long)(local_2180 - (int)local_1a10[5]) * local_1a10[2] +
                                  (long)local_2178 * local_1a10[3]) * 8) * local_3770) +
                                 local_1a00 *
                                 (*(double *)
                                   (*local_1a18 +
                                   ((long)(local_217c - (int)local_1a18[4]) +
                                    (long)(local_2184 - *(int *)((long)local_1a18 + 0x24)) *
                                    local_1a18[1] +
                                    (long)(local_2180 - (int)local_1a18[5]) * local_1a18[2] +
                                   (long)local_2178 * local_1a18[3]) * 8) * local_3760 +
                                 *(double *)
                                  (*local_1a18 +
                                  ((long)(local_217c - (int)local_1a18[4]) +
                                   (long)(local_14d0 - *(int *)((long)local_1a18 + 0x24)) *
                                   local_1a18[1] +
                                   (long)(local_2180 - (int)local_1a18[5]) * local_1a18[2] +
                                  (long)local_2178 * local_1a18[3]) * 8) * local_3778));
                    local_1510 = local_1a10;
                    local_1514 = local_217c;
                    local_1518 = local_2184;
                    local_151c = local_2180;
                    local_1520 = local_2178;
                    local_e68 = local_19d8;
                    local_e6c = local_217c + -1;
                    local_e70 = local_2184;
                    local_e74 = local_2180;
                    local_e78 = local_2178;
                    local_1528 = local_1a10;
                    local_152c = local_217c + 1;
                    local_1530 = local_2184;
                    local_1534 = local_2180;
                    local_1538 = local_2178;
                    local_e80 = local_19d8;
                    local_e84 = local_217c + 1;
                    local_e88 = local_2184;
                    local_e8c = local_2180;
                    local_e90 = local_2178;
                    local_1540 = local_1a20;
                    local_1544 = local_217c;
                    local_1548 = local_2184;
                    local_154c = local_2180;
                    local_1550 = local_2178;
                    local_e98 = local_19d8;
                    local_e9c = local_217c;
                    local_ea0 = local_2184;
                    local_ea4 = local_2180 + -1;
                    local_ea8 = local_2178;
                    local_1558 = local_1a20;
                    local_155c = local_217c;
                    local_1560 = local_2184;
                    local_1564 = local_2180 + 1;
                    local_1568 = local_2178;
                    local_eb0 = local_19d8;
                    local_eb4 = local_217c;
                    local_eb8 = local_2184;
                    local_ebc = local_2180 + 1;
                    local_ec0 = local_2178;
                    local_21d0 = local_19f8 *
                                 (*(double *)
                                   (*local_1a10 +
                                   ((long)(local_217c - (int)local_1a10[4]) +
                                    (long)(local_2184 - *(int *)((long)local_1a10 + 0x24)) *
                                    local_1a10[1] +
                                    (long)(local_2180 - (int)local_1a10[5]) * local_1a10[2] +
                                   (long)local_2178 * local_1a10[3]) * 8) *
                                  *(double *)
                                   (*local_19d8 +
                                   ((long)(local_e6c - (int)local_19d8[4]) +
                                    (long)(local_2184 - *(int *)((long)local_19d8 + 0x24)) *
                                    local_19d8[1] +
                                    (long)(local_2180 - (int)local_19d8[5]) * local_19d8[2] +
                                   (long)local_2178 * local_19d8[3]) * 8) +
                                 *(double *)
                                  (*local_1a10 +
                                  ((long)(local_152c - (int)local_1a10[4]) +
                                   (long)(local_2184 - *(int *)((long)local_1a10 + 0x24)) *
                                   local_1a10[1] +
                                   (long)(local_2180 - (int)local_1a10[5]) * local_1a10[2] +
                                  (long)local_2178 * local_1a10[3]) * 8) *
                                 *(double *)
                                  (*local_19d8 +
                                  ((long)(local_e84 - (int)local_19d8[4]) +
                                   (long)(local_2184 - *(int *)((long)local_19d8 + 0x24)) *
                                   local_19d8[1] +
                                   (long)(local_2180 - (int)local_19d8[5]) * local_19d8[2] +
                                  (long)local_2178 * local_19d8[3]) * 8)) +
                                 local_1a08 *
                                 (*(double *)
                                   (*local_1a20 +
                                   ((long)(local_217c - (int)local_1a20[4]) +
                                    (long)(local_2184 - *(int *)((long)local_1a20 + 0x24)) *
                                    local_1a20[1] +
                                    (long)(local_2180 - (int)local_1a20[5]) * local_1a20[2] +
                                   (long)local_2178 * local_1a20[3]) * 8) *
                                  *(double *)
                                   (*local_19d8 +
                                   ((long)(local_217c - (int)local_19d8[4]) +
                                    (long)(local_2184 - *(int *)((long)local_19d8 + 0x24)) *
                                    local_19d8[1] +
                                    (long)(local_ea4 - (int)local_19d8[5]) * local_19d8[2] +
                                   (long)local_2178 * local_19d8[3]) * 8) +
                                 *(double *)
                                  (*local_1a20 +
                                  ((long)(local_217c - (int)local_1a20[4]) +
                                   (long)(local_2184 - *(int *)((long)local_1a20 + 0x24)) *
                                   local_1a20[1] +
                                   (long)(local_1564 - (int)local_1a20[5]) * local_1a20[2] +
                                  (long)local_2178 * local_1a20[3]) * 8) *
                                 *(double *)
                                  (*local_19d8 +
                                  ((long)(local_217c - (int)local_19d8[4]) +
                                   (long)(local_2184 - *(int *)((long)local_19d8 + 0x24)) *
                                   local_19d8[1] +
                                   (long)(local_ebc - (int)local_19d8[5]) * local_19d8[2] +
                                  (long)local_2178 * local_19d8[3]) * 8));
                    if (local_217c == (int)local_1ae0) {
                      local_b9c = (int)local_1ae0 + -1;
                      local_b98 = local_1a28;
                      local_ba0 = local_2184;
                      local_ba4 = local_2180;
                      if (0 < *(int *)(*local_1a28 +
                                      ((long)(local_b9c - (int)local_1a28[4]) +
                                       (long)(local_2184 - *(int *)((long)local_1a28 + 0x24)) *
                                       local_1a28[1] +
                                      (long)(local_2180 - (int)local_1a28[5]) * local_1a28[2]) * 4))
                      {
                        local_1570 = local_1a10;
                        local_1574 = local_217c;
                        local_1578 = local_2184;
                        local_157c = local_2180;
                        local_1580 = local_2178;
                        local_ecc = local_217c + -1;
                        local_ec8 = local_19d8;
                        local_ed0 = local_2184;
                        local_ed4 = local_2180;
                        local_ed8 = local_2178;
                        local_21d0 = -(local_19f8 *
                                      *(double *)
                                       (*local_1a10 +
                                       ((long)(local_217c - (int)local_1a10[4]) +
                                        (long)(local_2184 - *(int *)((long)local_1a10 + 0x24)) *
                                        local_1a10[1] +
                                        (long)(local_2180 - (int)local_1a10[5]) * local_1a10[2] +
                                       (long)local_2178 * local_1a10[3]) * 8)) *
                                     *(double *)
                                      (*local_19d8 +
                                      ((long)(local_ecc - (int)local_19d8[4]) +
                                       (long)(local_2184 - *(int *)((long)local_19d8 + 0x24)) *
                                       local_19d8[1] +
                                       (long)(local_2180 - (int)local_19d8[5]) * local_19d8[2] +
                                      (long)local_2178 * local_19d8[3]) * 8) + local_21d0;
                      }
                    }
                    if (local_217c == (int)local_1afc) {
                      local_b84 = (int)local_1afc + 1;
                      local_b80 = local_1a48;
                      local_b88 = local_2184;
                      local_b8c = local_2180;
                      if (0 < *(int *)(*local_1a48 +
                                      ((long)(local_b84 - (int)local_1a48[4]) +
                                       (long)(local_2184 - *(int *)((long)local_1a48 + 0x24)) *
                                       local_1a48[1] +
                                      (long)(local_2180 - (int)local_1a48[5]) * local_1a48[2]) * 4))
                      {
                        local_158c = local_217c + 1;
                        local_1588 = local_1a10;
                        local_1590 = local_2184;
                        local_1594 = local_2180;
                        local_1598 = local_2178;
                        local_ee4 = local_217c + 1;
                        local_ee0 = local_19d8;
                        local_ee8 = local_2184;
                        local_eec = local_2180;
                        local_ef0 = local_2178;
                        local_21d0 = -(local_19f8 *
                                      *(double *)
                                       (*local_1a10 +
                                       ((long)(local_158c - (int)local_1a10[4]) +
                                        (long)(local_2184 - *(int *)((long)local_1a10 + 0x24)) *
                                        local_1a10[1] +
                                        (long)(local_2180 - (int)local_1a10[5]) * local_1a10[2] +
                                       (long)local_2178 * local_1a10[3]) * 8)) *
                                     *(double *)
                                      (*local_19d8 +
                                      ((long)(local_ee4 - (int)local_19d8[4]) +
                                       (long)(local_2184 - *(int *)((long)local_19d8 + 0x24)) *
                                       local_19d8[1] +
                                       (long)(local_2180 - (int)local_19d8[5]) * local_19d8[2] +
                                      (long)local_2178 * local_19d8[3]) * 8) + local_21d0;
                      }
                    }
                    if (local_2180 == local_1ad8) {
                      local_b74 = local_1ad8 + -1;
                      local_b68 = local_1a30;
                      local_b6c = local_217c;
                      local_b70 = local_2184;
                      if (0 < *(int *)(*local_1a30 +
                                      ((long)(local_217c - (int)local_1a30[4]) +
                                       (long)(local_2184 - *(int *)((long)local_1a30 + 0x24)) *
                                       local_1a30[1] +
                                      (long)(local_b74 - (int)local_1a30[5]) * local_1a30[2]) * 4))
                      {
                        local_15a0 = local_1a20;
                        local_15a4 = local_217c;
                        local_15a8 = local_2184;
                        local_15ac = local_2180;
                        local_15b0 = local_2178;
                        local_f04 = local_2180 + -1;
                        local_ef8 = local_19d8;
                        local_efc = local_217c;
                        local_f00 = local_2184;
                        local_f08 = local_2178;
                        local_21d0 = -(local_1a08 *
                                      *(double *)
                                       (*local_1a20 +
                                       ((long)(local_217c - (int)local_1a20[4]) +
                                        (long)(local_2184 - *(int *)((long)local_1a20 + 0x24)) *
                                        local_1a20[1] +
                                        (long)(local_2180 - (int)local_1a20[5]) * local_1a20[2] +
                                       (long)local_2178 * local_1a20[3]) * 8)) *
                                     *(double *)
                                      (*local_19d8 +
                                      ((long)(local_217c - (int)local_19d8[4]) +
                                       (long)(local_2184 - *(int *)((long)local_19d8 + 0x24)) *
                                       local_19d8[1] +
                                       (long)(local_f04 - (int)local_19d8[5]) * local_19d8[2] +
                                      (long)local_2178 * local_19d8[3]) * 8) + local_21d0;
                      }
                    }
                    if (local_2180 == local_1af4) {
                      local_b5c = local_1af4 + 1;
                      local_b50 = local_1a50;
                      local_b54 = local_217c;
                      local_b58 = local_2184;
                      if (0 < *(int *)(*local_1a50 +
                                      ((long)(local_217c - (int)local_1a50[4]) +
                                       (long)(local_2184 - *(int *)((long)local_1a50 + 0x24)) *
                                       local_1a50[1] +
                                      (long)(local_b5c - (int)local_1a50[5]) * local_1a50[2]) * 4))
                      {
                        local_15c4 = local_2180 + 1;
                        local_15b8 = local_1a20;
                        local_15bc = local_217c;
                        local_15c0 = local_2184;
                        local_15c8 = local_2178;
                        local_f1c = local_2180 + 1;
                        local_f10 = local_19d8;
                        local_f14 = local_217c;
                        local_f18 = local_2184;
                        local_f20 = local_2178;
                        local_21d0 = -(local_1a08 *
                                      *(double *)
                                       (*local_1a20 +
                                       ((long)(local_217c - (int)local_1a20[4]) +
                                        (long)(local_2184 - *(int *)((long)local_1a20 + 0x24)) *
                                        local_1a20[1] +
                                        (long)(local_15c4 - (int)local_1a20[5]) * local_1a20[2] +
                                       (long)local_2178 * local_1a20[3]) * 8)) *
                                     *(double *)
                                      (*local_19d8 +
                                      ((long)(local_217c - (int)local_19d8[4]) +
                                       (long)(local_2184 - *(int *)((long)local_19d8 + 0x24)) *
                                       local_19d8[1] +
                                       (long)(local_f1c - (int)local_19d8[5]) * local_19d8[2] +
                                      (long)local_2178 * local_19d8[3]) * 8) + local_21d0;
                      }
                    }
                    local_15d0 = local_1a18;
                    local_15d4 = local_217c;
                    local_15d8 = local_2184;
                    local_15dc = local_2180;
                    local_15e0 = local_2178;
                    local_4dc = local_2184 - local_1aa0._4_4_;
                    local_4d8 = local_1c18;
                    local_4d8[local_4dc] =
                         -local_1a00 *
                         *(double *)
                          (*local_1a18 +
                          ((long)(local_217c - (int)local_1a18[4]) +
                           (long)(local_2184 - *(int *)((long)local_1a18 + 0x24)) * local_1a18[1] +
                           (long)(local_2180 - (int)local_1a18[5]) * local_1a18[2] +
                          (long)local_2178 * local_1a18[3]) * 8);
                    local_4ec = local_2184 - local_1aa0._4_4_;
                    local_4e8 = local_1d18;
                    local_4e8[local_4ec] = local_21c8;
                    local_15e8 = local_1a18;
                    local_15ec = local_217c;
                    local_15f0 = local_2184 + 1;
                    local_15f4 = local_2180;
                    local_15f8 = local_2178;
                    local_4fc = local_2184 - local_1aa0._4_4_;
                    local_4f8 = local_1e18;
                    local_4f8[local_4fc] =
                         -local_1a00 *
                         *(double *)
                          (*local_1a18 +
                          ((long)(local_217c - (int)local_1a18[4]) +
                           (long)(local_15f0 - *(int *)((long)local_1a18 + 0x24)) * local_1a18[1] +
                           (long)(local_2180 - (int)local_1a18[5]) * local_1a18[2] +
                          (long)local_2178 * local_1a18[3]) * 8);
                    local_50c = local_2184 - local_1aa0._4_4_;
                    local_508 = local_2018;
                    local_508[local_50c] = 0.0;
                    local_1600 = local_19e0;
                    local_1604 = local_217c;
                    local_1608 = local_2184;
                    local_160c = local_2180;
                    local_1610 = local_2178;
                    local_51c = local_2184 - local_1aa0._4_4_;
                    local_518 = local_1f18;
                    local_518[local_51c] =
                         *(double *)
                          (*local_19e0 +
                          ((long)(local_217c - (int)local_19e0[4]) +
                           (long)(local_2184 - *(int *)((long)local_19e0 + 0x24)) * local_19e0[1] +
                           (long)(local_2180 - (int)local_19e0[5]) * local_19e0[2] +
                          (long)local_2178 * local_19e0[3]) * 8) + local_21d0;
                    if (local_2184 == local_1aa0._4_4_) {
                      local_54c = local_2184 - local_1aa0._4_4_;
                      local_548 = local_1c18;
                      local_548[local_54c] = 0.0;
                      local_b40 = local_1ae0._4_4_ + -1;
                      local_b38 = local_1a40;
                      local_b3c = local_217c;
                      local_b44 = local_2180;
                      if (*(int *)(*local_1a40 +
                                  ((long)(local_217c - (int)local_1a40[4]) +
                                   (long)(local_b40 - *(int *)((long)local_1a40 + 0x24)) *
                                   local_1a40[1] +
                                  (long)(local_2180 - (int)local_1a40[5]) * local_1a40[2]) * 4) < 1)
                      {
                        local_1618 = local_1a18;
                        local_161c = local_217c;
                        local_1620 = local_2184;
                        local_1624 = local_2180;
                        local_1628 = local_2178;
                        local_f30 = local_2184 + -1;
                        local_f28 = local_19d8;
                        local_f2c = local_217c;
                        local_f34 = local_2180;
                        local_f38 = local_2178;
                        local_55c = local_2184 - local_1aa0._4_4_;
                        local_558 = local_1f18;
                        local_558[local_55c] =
                             local_1a00 *
                             *(double *)
                              (*local_1a18 +
                              ((long)(local_217c - (int)local_1a18[4]) +
                               (long)(local_2184 - *(int *)((long)local_1a18 + 0x24)) *
                               local_1a18[1] +
                               (long)(local_2180 - (int)local_1a18[5]) * local_1a18[2] +
                              (long)local_2178 * local_1a18[3]) * 8) *
                             *(double *)
                              (*local_19d8 +
                              ((long)(local_217c - (int)local_19d8[4]) +
                               (long)(local_f30 - *(int *)((long)local_19d8 + 0x24)) * local_19d8[1]
                               + (long)(local_2180 - (int)local_19d8[5]) * local_19d8[2] +
                              (long)local_2178 * local_19d8[3]) * 8) + local_558[local_55c];
                      }
                    }
                    if (local_2184 == local_1ac0._4_4_) {
                      local_52c = local_2184 - local_1aa0._4_4_;
                      local_528 = local_1e18;
                      local_528[local_52c] = 0.0;
                      local_b28 = local_1afc._4_4_ + 1;
                      local_b20 = local_1a38;
                      local_b24 = local_217c;
                      local_b2c = local_2180;
                      if (*(int *)(*local_1a38 +
                                  ((long)(local_217c - (int)local_1a38[4]) +
                                   (long)(local_b28 - *(int *)((long)local_1a38 + 0x24)) *
                                   local_1a38[1] +
                                  (long)(local_2180 - (int)local_1a38[5]) * local_1a38[2]) * 4) < 1)
                      {
                        local_1638 = local_2184 + 1;
                        local_1630 = local_1a18;
                        local_1634 = local_217c;
                        local_163c = local_2180;
                        local_1640 = local_2178;
                        local_f48 = local_2184 + 1;
                        local_f40 = local_19d8;
                        local_f44 = local_217c;
                        local_f4c = local_2180;
                        local_f50 = local_2178;
                        local_53c = local_2184 - local_1aa0._4_4_;
                        local_538 = local_1f18;
                        local_538[local_53c] =
                             local_1a00 *
                             *(double *)
                              (*local_1a18 +
                              ((long)(local_217c - (int)local_1a18[4]) +
                               (long)(local_1638 - *(int *)((long)local_1a18 + 0x24)) *
                               local_1a18[1] +
                               (long)(local_2180 - (int)local_1a18[5]) * local_1a18[2] +
                              (long)local_2178 * local_1a18[3]) * 8) *
                             *(double *)
                              (*local_19d8 +
                              ((long)(local_217c - (int)local_19d8[4]) +
                               (long)(local_f48 - *(int *)((long)local_19d8 + 0x24)) * local_19d8[1]
                               + (long)(local_2180 - (int)local_19d8[5]) * local_19d8[2] +
                              (long)local_2178 * local_19d8[3]) * 8) + local_538[local_53c];
                      }
                    }
                  }
                  local_290 = local_1c18;
                  local_298 = local_1d18;
                  local_2a0 = local_1e18;
                  local_2a8 = local_1f18;
                  local_2b0 = local_2018;
                  local_2b8 = local_2118;
                  local_2bc = local_1b18;
                  local_18c = 0;
                  local_2c8 = local_1d18[0];
                  local_19c = 0;
                  local_2018[0] = local_1f18[0] / local_1d18[0];
                  local_1ac = 0;
                  local_1a8 = local_2b0;
                  local_198 = local_2a8;
                  local_188 = local_298;
                  for (local_2cc = 1; local_2cc <= local_2bc + -1; local_2cc = local_2cc + 1) {
                    local_1bc = local_2cc + -1;
                    local_1b8 = local_2a0;
                    local_1c8 = local_2b8;
                    local_1cc = local_2cc;
                    *(double *)(local_2b8 + (long)local_2cc * 8) = local_2a0[local_1bc] / local_2c8;
                    local_1d8 = local_298;
                    local_1dc = local_2cc;
                    local_1e8 = local_290;
                    local_1ec = local_2cc;
                    local_1f8 = local_2b8;
                    local_1fc = local_2cc;
                    local_2c8 = -local_290[local_2cc] * *(double *)(local_2b8 + (long)local_2cc * 8)
                                + local_298[local_2cc];
                    if ((local_2c8 == 0.0) && (!NAN(local_2c8))) {
                      local_288 = ">>>TRIDIAG FAILED";
                      Abort_host((char *)in_stack_ffffffffffffc860);
                    }
                    local_208 = local_2a8;
                    local_20c = local_2cc;
                    local_218 = local_290;
                    local_21c = local_2cc;
                    local_228 = local_2b0;
                    local_22c = local_2cc + -1;
                    local_238 = local_2b0;
                    local_23c = local_2cc;
                    local_2b0[local_2cc] =
                         (-local_290[local_2cc] * local_2b0[local_22c] + local_2a8[local_2cc]) /
                         local_2c8;
                  }
                  for (local_2d0 = local_2bc + -2; -1 < local_2d0; local_2d0 = local_2d0 + -1) {
                    local_248 = local_2b0;
                    local_24c = local_2d0;
                    local_258 = local_2b8;
                    local_25c = local_2d0 + 1;
                    local_268 = local_2b0;
                    local_26c = local_2d0 + 1;
                    local_278 = local_2b0;
                    local_27c = local_2d0;
                    local_2b0[local_2d0] =
                         -*(double *)(local_2b8 + (long)local_25c * 8) * local_2b0[local_26c] +
                         local_2b0[local_2d0];
                  }
                  for (local_21d4 = local_1aa0._4_4_; local_21d4 <= local_1ac0._4_4_;
                      local_21d4 = local_21d4 + 1) {
                    local_4cc = local_21d4 - local_1aa0._4_4_;
                    local_4c8 = local_2018;
                    local_f58 = local_19d8;
                    local_f5c = local_217c;
                    local_f60 = local_21d4;
                    local_f64 = local_2180;
                    local_f68 = local_2178;
                    *(double *)
                     (*local_19d8 +
                     ((long)(local_217c - (int)local_19d8[4]) +
                      (long)(local_21d4 - *(int *)((long)local_19d8 + 0x24)) * local_19d8[1] +
                      (long)(local_2180 - (int)local_19d8[5]) * local_19d8[2] +
                     (long)local_2178 * local_19d8[3]) * 8) = local_4c8[local_4cc];
                  }
                }
              }
            }
          }
        }
        else if (local_1b14 == 0) {
          for (local_21d8 = 0; local_21d8 < local_1a90; local_21d8 = local_21d8 + 1) {
            for (local_21dc = local_1aa0._4_4_; local_21dc <= local_1ac0._4_4_;
                local_21dc = local_21dc + 1) {
              for (local_21e0 = local_1a98; local_21e0 <= local_1ab8; local_21e0 = local_21e0 + 1) {
                if ((local_21dc + local_21e0 + local_1a8c) % 2 == 0) {
                  for (local_21e4 = (int)local_1aa0; local_21e4 <= (int)local_1ac0;
                      local_21e4 = local_21e4 + 1) {
                    local_640 = local_19f0;
                    local_644 = local_21e4;
                    local_648 = local_21dc;
                    local_64c = local_21e0;
                    local_1648 = local_1a10;
                    local_164c = local_21e4;
                    local_1650 = local_21dc;
                    local_1654 = local_21e0;
                    local_1658 = local_21d8;
                    local_1660 = local_1a10;
                    local_1664 = local_21e4 + 1;
                    local_1668 = local_21dc;
                    local_166c = local_21e0;
                    local_1670 = local_21d8;
                    local_1678 = local_1a18;
                    local_167c = local_21e4;
                    local_1680 = local_21dc;
                    local_1684 = local_21e0;
                    local_1688 = local_21d8;
                    local_1690 = local_1a18;
                    local_1694 = local_21e4;
                    local_1698 = local_21dc + 1;
                    local_169c = local_21e0;
                    local_16a0 = local_21d8;
                    local_16a8 = local_1a20;
                    local_16ac = local_21e4;
                    local_16b0 = local_21dc;
                    local_16b4 = local_21e0;
                    local_16b8 = local_21d8;
                    local_16c0 = local_1a20;
                    local_16c4 = local_21e4;
                    local_16c8 = local_21dc;
                    local_16cc = local_21e0 + 1;
                    local_16d0 = local_21d8;
                    local_21f0 = local_1a08 *
                                 (*(double *)
                                   (*local_1a20 +
                                   ((long)(local_21e4 - (int)local_1a20[4]) +
                                    (long)(local_21dc - *(int *)((long)local_1a20 + 0x24)) *
                                    local_1a20[1] +
                                    (long)(local_21e0 - (int)local_1a20[5]) * local_1a20[2] +
                                   (long)local_21d8 * local_1a20[3]) * 8) +
                                 *(double *)
                                  (*local_1a20 +
                                  ((long)(local_21e4 - (int)local_1a20[4]) +
                                   (long)(local_21dc - *(int *)((long)local_1a20 + 0x24)) *
                                   local_1a20[1] +
                                   (long)(local_16cc - (int)local_1a20[5]) * local_1a20[2] +
                                  (long)local_21d8 * local_1a20[3]) * 8)) +
                                 local_1a00 *
                                 (*(double *)
                                   (*local_1a18 +
                                   ((long)(local_21e4 - (int)local_1a18[4]) +
                                    (long)(local_21dc - *(int *)((long)local_1a18 + 0x24)) *
                                    local_1a18[1] +
                                    (long)(local_21e0 - (int)local_1a18[5]) * local_1a18[2] +
                                   (long)local_21d8 * local_1a18[3]) * 8) +
                                 *(double *)
                                  (*local_1a18 +
                                  ((long)(local_21e4 - (int)local_1a18[4]) +
                                   (long)(local_1698 - *(int *)((long)local_1a18 + 0x24)) *
                                   local_1a18[1] +
                                   (long)(local_21e0 - (int)local_1a18[5]) * local_1a18[2] +
                                  (long)local_21d8 * local_1a18[3]) * 8)) +
                                 local_19e8 *
                                 *(double *)
                                  (*local_19f0 +
                                  ((long)(local_21e4 - (int)local_19f0[4]) +
                                   (long)(local_21dc - *(int *)((long)local_19f0 + 0x24)) *
                                   local_19f0[1] +
                                  (long)(local_21e0 - (int)local_19f0[5]) * local_19f0[2]) * 8) +
                                 local_19f8 *
                                 (*(double *)
                                   (*local_1a10 +
                                   ((long)(local_21e4 - (int)local_1a10[4]) +
                                    (long)(local_21dc - *(int *)((long)local_1a10 + 0x24)) *
                                    local_1a10[1] +
                                    (long)(local_21e0 - (int)local_1a10[5]) * local_1a10[2] +
                                   (long)local_21d8 * local_1a10[3]) * 8) +
                                 *(double *)
                                  (*local_1a10 +
                                  ((long)(local_1664 - (int)local_1a10[4]) +
                                   (long)(local_21dc - *(int *)((long)local_1a10 + 0x24)) *
                                   local_1a10[1] +
                                   (long)(local_21e0 - (int)local_1a10[5]) * local_1a10[2] +
                                  (long)local_21d8 * local_1a10[3]) * 8));
                    if (local_21e4 == (int)local_1ae0) {
                      local_b0c = (int)local_1ae0 + -1;
                      local_b08 = local_1a28;
                      local_b10 = local_21dc;
                      local_b14 = local_21e0;
                      if (*(int *)(*local_1a28 +
                                  ((long)(local_b0c - (int)local_1a28[4]) +
                                   (long)(local_21dc - *(int *)((long)local_1a28 + 0x24)) *
                                   local_1a28[1] +
                                  (long)(local_21e0 - (int)local_1a28[5]) * local_1a28[2]) * 4) < 1)
                      goto LAB_01564c9f;
                      local_16d8 = local_1a58;
                      local_16dc = (int)local_1ae0;
                      local_16e0 = local_21dc;
                      local_16e4 = local_21e0;
                      local_16e8 = local_21d8;
                      local_21f8 = *(double *)
                                    (*local_1a58 +
                                    ((long)((int)local_1ae0 - (int)local_1a58[4]) +
                                     (long)(local_21dc - *(int *)((long)local_1a58 + 0x24)) *
                                     local_1a58[1] +
                                     (long)(local_21e0 - (int)local_1a58[5]) * local_1a58[2] +
                                    (long)local_21d8 * local_1a58[3]) * 8);
                    }
                    else {
LAB_01564c9f:
                      local_21f8 = 0.0;
                    }
                    if (local_21dc == local_1ae0._4_4_) {
                      local_af8 = local_1ae0._4_4_ + -1;
                      local_af0 = local_1a40;
                      local_af4 = local_21e4;
                      local_afc = local_21e0;
                      if (*(int *)(*local_1a40 +
                                  ((long)(local_21e4 - (int)local_1a40[4]) +
                                   (long)(local_af8 - *(int *)((long)local_1a40 + 0x24)) *
                                   local_1a40[1] +
                                  (long)(local_21e0 - (int)local_1a40[5]) * local_1a40[2]) * 4) < 1)
                      goto LAB_01564dfd;
                      local_16f0 = local_1a70;
                      local_16f4 = local_21e4;
                      local_16f8 = local_1ae0._4_4_;
                      local_16fc = local_21e0;
                      local_1700 = local_21d8;
                      local_2200 = *(double *)
                                    (*local_1a70 +
                                    ((long)(local_21e4 - (int)local_1a70[4]) +
                                     (long)(local_1ae0._4_4_ - *(int *)((long)local_1a70 + 0x24)) *
                                     local_1a70[1] +
                                     (long)(local_21e0 - (int)local_1a70[5]) * local_1a70[2] +
                                    (long)local_21d8 * local_1a70[3]) * 8);
                    }
                    else {
LAB_01564dfd:
                      local_2200 = 0.0;
                    }
                    if (local_21e0 == local_1ad8) {
                      local_ae4 = local_1ad8 + -1;
                      local_ad8 = local_1a30;
                      local_adc = local_21e4;
                      local_ae0 = local_21dc;
                      if (*(int *)(*local_1a30 +
                                  ((long)(local_21e4 - (int)local_1a30[4]) +
                                   (long)(local_21dc - *(int *)((long)local_1a30 + 0x24)) *
                                   local_1a30[1] +
                                  (long)(local_ae4 - (int)local_1a30[5]) * local_1a30[2]) * 4) < 1)
                      goto LAB_01564f5b;
                      local_1708 = local_1a60;
                      local_170c = local_21e4;
                      local_1710 = local_21dc;
                      local_1714 = local_1ad8;
                      local_1718 = local_21d8;
                      local_3798 = *(double *)
                                    (*local_1a60 +
                                    ((long)(local_21e4 - (int)local_1a60[4]) +
                                     (long)(local_21dc - *(int *)((long)local_1a60 + 0x24)) *
                                     local_1a60[1] +
                                     (long)(local_1ad8 - (int)local_1a60[5]) * local_1a60[2] +
                                    (long)local_21d8 * local_1a60[3]) * 8);
                    }
                    else {
LAB_01564f5b:
                      local_3798 = 0.0;
                    }
                    local_2208 = local_3798;
                    if (local_21e4 == (int)local_1afc) {
                      local_ac4 = (int)local_1afc + 1;
                      local_ac0 = local_1a48;
                      local_ac8 = local_21dc;
                      local_acc = local_21e0;
                      if (*(int *)(*local_1a48 +
                                  ((long)(local_ac4 - (int)local_1a48[4]) +
                                   (long)(local_21dc - *(int *)((long)local_1a48 + 0x24)) *
                                   local_1a48[1] +
                                  (long)(local_21e0 - (int)local_1a48[5]) * local_1a48[2]) * 4) < 1)
                      goto LAB_015650b9;
                      local_1720 = local_1a78;
                      local_1724 = (int)local_1afc;
                      local_1728 = local_21dc;
                      local_172c = local_21e0;
                      local_1730 = local_21d8;
                      in_stack_ffffffffffffc860 =
                           *(MFIter **)
                            (*local_1a78 +
                            ((long)((int)local_1afc - (int)local_1a78[4]) +
                             (long)(local_21dc - *(int *)((long)local_1a78 + 0x24)) * local_1a78[1]
                             + (long)(local_21e0 - (int)local_1a78[5]) * local_1a78[2] +
                            (long)local_21d8 * local_1a78[3]) * 8);
                    }
                    else {
LAB_015650b9:
                      in_stack_ffffffffffffc860 = (MFIter *)0x0;
                    }
                    if (local_21dc == local_1afc._4_4_) {
                      local_ab0 = local_1afc._4_4_ + 1;
                      local_aa8 = local_1a38;
                      local_aac = local_21e4;
                      local_ab4 = local_21e0;
                      if (*(int *)(*local_1a38 +
                                  ((long)(local_21e4 - (int)local_1a38[4]) +
                                   (long)(local_ab0 - *(int *)((long)local_1a38 + 0x24)) *
                                   local_1a38[1] +
                                  (long)(local_21e0 - (int)local_1a38[5]) * local_1a38[2]) * 4) < 1)
                      goto LAB_01565217;
                      local_1738 = local_1a68;
                      local_173c = local_21e4;
                      local_1740 = local_1afc._4_4_;
                      local_1744 = local_21e0;
                      local_1748 = local_21d8;
                      in_stack_ffffffffffffc858 =
                           *(FabArray<amrex::FArrayBox> **)
                            (*local_1a68 +
                            ((long)(local_21e4 - (int)local_1a68[4]) +
                             (long)(local_1afc._4_4_ - *(int *)((long)local_1a68 + 0x24)) *
                             local_1a68[1] + (long)(local_21e0 - (int)local_1a68[5]) * local_1a68[2]
                            + (long)local_21d8 * local_1a68[3]) * 8);
                    }
                    else {
LAB_01565217:
                      in_stack_ffffffffffffc858 = (FabArray<amrex::FArrayBox> *)0x0;
                    }
                    if (local_21e0 == local_1af4) {
                      local_a9c = local_1af4 + 1;
                      local_a90 = local_1a50;
                      local_a94 = local_21e4;
                      local_a98 = local_21dc;
                      if (*(int *)(*local_1a50 +
                                  ((long)(local_21e4 - (int)local_1a50[4]) +
                                   (long)(local_21dc - *(int *)((long)local_1a50 + 0x24)) *
                                   local_1a50[1] +
                                  (long)(local_a9c - (int)local_1a50[5]) * local_1a50[2]) * 4) < 1)
                      goto LAB_01565375;
                      local_1750 = local_1a80;
                      local_1754 = local_21e4;
                      local_1758 = local_21dc;
                      local_175c = local_1af4;
                      local_1760 = local_21d8;
                      in_stack_ffffffffffffc850 =
                           *(MFIter **)
                            (*local_1a80 +
                            ((long)(local_21e4 - (int)local_1a80[4]) +
                             (long)(local_21dc - *(int *)((long)local_1a80 + 0x24)) * local_1a80[1]
                             + (long)(local_1af4 - (int)local_1a80[5]) * local_1a80[2] +
                            (long)local_21d8 * local_1a80[3]) * 8);
                    }
                    else {
LAB_01565375:
                      in_stack_ffffffffffffc850 = (MFIter *)0x0;
                    }
                    local_1768 = local_1a10;
                    local_176c = local_21e4;
                    local_1770 = local_21dc;
                    local_1774 = local_21e0;
                    local_1778 = local_21d8;
                    local_1780 = local_1a10;
                    local_1784 = local_21e4 + 1;
                    local_1788 = local_21dc;
                    local_178c = local_21e0;
                    local_1790 = local_21d8;
                    local_1798 = local_1a18;
                    local_179c = local_21e4;
                    local_17a0 = local_21dc;
                    local_17a4 = local_21e0;
                    local_17a8 = local_21d8;
                    local_17b0 = local_1a18;
                    local_17b4 = local_21e4;
                    local_17b8 = local_21dc + 1;
                    local_17bc = local_21e0;
                    local_17c0 = local_21d8;
                    local_17c8 = local_1a20;
                    local_17cc = local_21e4;
                    local_17d0 = local_21dc;
                    local_17d4 = local_21e0;
                    local_17d8 = local_21d8;
                    local_17e0 = local_1a20;
                    local_17e4 = local_21e4;
                    local_17e8 = local_21dc;
                    local_17ec = local_21e0 + 1;
                    local_17f0 = local_21d8;
                    local_2228 = local_21f0 -
                                 (local_1a08 *
                                  (*(double *)
                                    (*local_1a20 +
                                    ((long)(local_21e4 - (int)local_1a20[4]) +
                                     (long)(local_21dc - *(int *)((long)local_1a20 + 0x24)) *
                                     local_1a20[1] +
                                     (long)(local_21e0 - (int)local_1a20[5]) * local_1a20[2] +
                                    (long)local_21d8 * local_1a20[3]) * 8) * local_3798 +
                                  *(double *)
                                   (*local_1a20 +
                                   ((long)(local_21e4 - (int)local_1a20[4]) +
                                    (long)(local_21dc - *(int *)((long)local_1a20 + 0x24)) *
                                    local_1a20[1] +
                                    (long)(local_17ec - (int)local_1a20[5]) * local_1a20[2] +
                                   (long)local_21d8 * local_1a20[3]) * 8) *
                                  (double)in_stack_ffffffffffffc850) +
                                 local_19f8 *
                                 (*(double *)
                                   (*local_1a10 +
                                   ((long)(local_21e4 - (int)local_1a10[4]) +
                                    (long)(local_21dc - *(int *)((long)local_1a10 + 0x24)) *
                                    local_1a10[1] +
                                    (long)(local_21e0 - (int)local_1a10[5]) * local_1a10[2] +
                                   (long)local_21d8 * local_1a10[3]) * 8) * local_21f8 +
                                 *(double *)
                                  (*local_1a10 +
                                  ((long)(local_1784 - (int)local_1a10[4]) +
                                   (long)(local_21dc - *(int *)((long)local_1a10 + 0x24)) *
                                   local_1a10[1] +
                                   (long)(local_21e0 - (int)local_1a10[5]) * local_1a10[2] +
                                  (long)local_21d8 * local_1a10[3]) * 8) *
                                 (double)in_stack_ffffffffffffc860) +
                                 local_1a00 *
                                 (*(double *)
                                   (*local_1a18 +
                                   ((long)(local_21e4 - (int)local_1a18[4]) +
                                    (long)(local_21dc - *(int *)((long)local_1a18 + 0x24)) *
                                    local_1a18[1] +
                                    (long)(local_21e0 - (int)local_1a18[5]) * local_1a18[2] +
                                   (long)local_21d8 * local_1a18[3]) * 8) * local_2200 +
                                 *(double *)
                                  (*local_1a18 +
                                  ((long)(local_21e4 - (int)local_1a18[4]) +
                                   (long)(local_17b8 - *(int *)((long)local_1a18 + 0x24)) *
                                   local_1a18[1] +
                                   (long)(local_21e0 - (int)local_1a18[5]) * local_1a18[2] +
                                  (long)local_21d8 * local_1a18[3]) * 8) *
                                 (double)in_stack_ffffffffffffc858));
                    local_17f8 = local_1a18;
                    local_17fc = local_21e4;
                    local_1800 = local_21dc;
                    local_1804 = local_21e0;
                    local_1808 = local_21d8;
                    local_f70 = local_19d8;
                    local_f74 = local_21e4;
                    local_f78 = local_21dc + -1;
                    local_f7c = local_21e0;
                    local_f80 = local_21d8;
                    local_1810 = local_1a18;
                    local_1814 = local_21e4;
                    local_1818 = local_21dc + 1;
                    local_181c = local_21e0;
                    local_1820 = local_21d8;
                    local_f88 = local_19d8;
                    local_f8c = local_21e4;
                    local_f90 = local_21dc + 1;
                    local_f94 = local_21e0;
                    local_f98 = local_21d8;
                    local_1828 = local_1a20;
                    local_182c = local_21e4;
                    local_1830 = local_21dc;
                    local_1834 = local_21e0;
                    local_1838 = local_21d8;
                    local_fa0 = local_19d8;
                    local_fa4 = local_21e4;
                    local_fa8 = local_21dc;
                    local_fac = local_21e0 + -1;
                    local_fb0 = local_21d8;
                    local_1840 = local_1a20;
                    local_1844 = local_21e4;
                    local_1848 = local_21dc;
                    local_184c = local_21e0 + 1;
                    local_1850 = local_21d8;
                    local_fb8 = local_19d8;
                    local_fbc = local_21e4;
                    local_fc0 = local_21dc;
                    local_fc4 = local_21e0 + 1;
                    local_fc8 = local_21d8;
                    local_2230 = local_1a00 *
                                 (*(double *)
                                   (*local_1a18 +
                                   ((long)(local_21e4 - (int)local_1a18[4]) +
                                    (long)(local_21dc - *(int *)((long)local_1a18 + 0x24)) *
                                    local_1a18[1] +
                                    (long)(local_21e0 - (int)local_1a18[5]) * local_1a18[2] +
                                   (long)local_21d8 * local_1a18[3]) * 8) *
                                  *(double *)
                                   (*local_19d8 +
                                   ((long)(local_21e4 - (int)local_19d8[4]) +
                                    (long)(local_f78 - *(int *)((long)local_19d8 + 0x24)) *
                                    local_19d8[1] +
                                    (long)(local_21e0 - (int)local_19d8[5]) * local_19d8[2] +
                                   (long)local_21d8 * local_19d8[3]) * 8) +
                                 *(double *)
                                  (*local_1a18 +
                                  ((long)(local_21e4 - (int)local_1a18[4]) +
                                   (long)(local_1818 - *(int *)((long)local_1a18 + 0x24)) *
                                   local_1a18[1] +
                                   (long)(local_21e0 - (int)local_1a18[5]) * local_1a18[2] +
                                  (long)local_21d8 * local_1a18[3]) * 8) *
                                 *(double *)
                                  (*local_19d8 +
                                  ((long)(local_21e4 - (int)local_19d8[4]) +
                                   (long)(local_f90 - *(int *)((long)local_19d8 + 0x24)) *
                                   local_19d8[1] +
                                   (long)(local_21e0 - (int)local_19d8[5]) * local_19d8[2] +
                                  (long)local_21d8 * local_19d8[3]) * 8)) +
                                 local_1a08 *
                                 (*(double *)
                                   (*local_1a20 +
                                   ((long)(local_21e4 - (int)local_1a20[4]) +
                                    (long)(local_21dc - *(int *)((long)local_1a20 + 0x24)) *
                                    local_1a20[1] +
                                    (long)(local_21e0 - (int)local_1a20[5]) * local_1a20[2] +
                                   (long)local_21d8 * local_1a20[3]) * 8) *
                                  *(double *)
                                   (*local_19d8 +
                                   ((long)(local_21e4 - (int)local_19d8[4]) +
                                    (long)(local_21dc - *(int *)((long)local_19d8 + 0x24)) *
                                    local_19d8[1] +
                                    (long)(local_fac - (int)local_19d8[5]) * local_19d8[2] +
                                   (long)local_21d8 * local_19d8[3]) * 8) +
                                 *(double *)
                                  (*local_1a20 +
                                  ((long)(local_21e4 - (int)local_1a20[4]) +
                                   (long)(local_21dc - *(int *)((long)local_1a20 + 0x24)) *
                                   local_1a20[1] +
                                   (long)(local_184c - (int)local_1a20[5]) * local_1a20[2] +
                                  (long)local_21d8 * local_1a20[3]) * 8) *
                                 *(double *)
                                  (*local_19d8 +
                                  ((long)(local_21e4 - (int)local_19d8[4]) +
                                   (long)(local_21dc - *(int *)((long)local_19d8 + 0x24)) *
                                   local_19d8[1] +
                                   (long)(local_fc4 - (int)local_19d8[5]) * local_19d8[2] +
                                  (long)local_21d8 * local_19d8[3]) * 8));
                    if (local_21dc == local_1ae0._4_4_) {
                      local_a80 = local_1ae0._4_4_ + -1;
                      local_a78 = local_1a40;
                      local_a7c = local_21e4;
                      local_a84 = local_21e0;
                      if (0 < *(int *)(*local_1a40 +
                                      ((long)(local_21e4 - (int)local_1a40[4]) +
                                       (long)(local_a80 - *(int *)((long)local_1a40 + 0x24)) *
                                       local_1a40[1] +
                                      (long)(local_21e0 - (int)local_1a40[5]) * local_1a40[2]) * 4))
                      {
                        local_1858 = local_1a18;
                        local_185c = local_21e4;
                        local_1860 = local_21dc;
                        local_1864 = local_21e0;
                        local_1868 = local_21d8;
                        local_fd8 = local_21dc + -1;
                        local_fd0 = local_19d8;
                        local_fd4 = local_21e4;
                        local_fdc = local_21e0;
                        local_fe0 = local_21d8;
                        local_2230 = -(local_1a00 *
                                      *(double *)
                                       (*local_1a18 +
                                       ((long)(local_21e4 - (int)local_1a18[4]) +
                                        (long)(local_21dc - *(int *)((long)local_1a18 + 0x24)) *
                                        local_1a18[1] +
                                        (long)(local_21e0 - (int)local_1a18[5]) * local_1a18[2] +
                                       (long)local_21d8 * local_1a18[3]) * 8)) *
                                     *(double *)
                                      (*local_19d8 +
                                      ((long)(local_21e4 - (int)local_19d8[4]) +
                                       (long)(local_fd8 - *(int *)((long)local_19d8 + 0x24)) *
                                       local_19d8[1] +
                                       (long)(local_21e0 - (int)local_19d8[5]) * local_19d8[2] +
                                      (long)local_21d8 * local_19d8[3]) * 8) + local_2230;
                      }
                    }
                    if (local_21dc == local_1afc._4_4_) {
                      local_a68 = local_1afc._4_4_ + 1;
                      local_a60 = local_1a38;
                      local_a64 = local_21e4;
                      local_a6c = local_21e0;
                      if (0 < *(int *)(*local_1a38 +
                                      ((long)(local_21e4 - (int)local_1a38[4]) +
                                       (long)(local_a68 - *(int *)((long)local_1a38 + 0x24)) *
                                       local_1a38[1] +
                                      (long)(local_21e0 - (int)local_1a38[5]) * local_1a38[2]) * 4))
                      {
                        local_1878 = local_21dc + 1;
                        local_1870 = local_1a18;
                        local_1874 = local_21e4;
                        local_187c = local_21e0;
                        local_1880 = local_21d8;
                        local_ff0 = local_21dc + 1;
                        local_fe8 = local_19d8;
                        local_fec = local_21e4;
                        local_ff4 = local_21e0;
                        local_ff8 = local_21d8;
                        local_2230 = -(local_1a00 *
                                      *(double *)
                                       (*local_1a18 +
                                       ((long)(local_21e4 - (int)local_1a18[4]) +
                                        (long)(local_1878 - *(int *)((long)local_1a18 + 0x24)) *
                                        local_1a18[1] +
                                        (long)(local_21e0 - (int)local_1a18[5]) * local_1a18[2] +
                                       (long)local_21d8 * local_1a18[3]) * 8)) *
                                     *(double *)
                                      (*local_19d8 +
                                      ((long)(local_21e4 - (int)local_19d8[4]) +
                                       (long)(local_ff0 - *(int *)((long)local_19d8 + 0x24)) *
                                       local_19d8[1] +
                                       (long)(local_21e0 - (int)local_19d8[5]) * local_19d8[2] +
                                      (long)local_21d8 * local_19d8[3]) * 8) + local_2230;
                      }
                    }
                    if (local_21e0 == local_1ad8) {
                      local_a54 = local_1ad8 + -1;
                      local_a48 = local_1a30;
                      local_a4c = local_21e4;
                      local_a50 = local_21dc;
                      if (0 < *(int *)(*local_1a30 +
                                      ((long)(local_21e4 - (int)local_1a30[4]) +
                                       (long)(local_21dc - *(int *)((long)local_1a30 + 0x24)) *
                                       local_1a30[1] +
                                      (long)(local_a54 - (int)local_1a30[5]) * local_1a30[2]) * 4))
                      {
                        local_1888 = local_1a20;
                        local_188c = local_21e4;
                        local_1890 = local_21dc;
                        local_1894 = local_21e0;
                        local_1898 = local_21d8;
                        local_100c = local_21e0 + -1;
                        local_1000 = local_19d8;
                        local_1004 = local_21e4;
                        local_1008 = local_21dc;
                        local_1010 = local_21d8;
                        local_2230 = -(local_1a08 *
                                      *(double *)
                                       (*local_1a20 +
                                       ((long)(local_21e4 - (int)local_1a20[4]) +
                                        (long)(local_21dc - *(int *)((long)local_1a20 + 0x24)) *
                                        local_1a20[1] +
                                        (long)(local_21e0 - (int)local_1a20[5]) * local_1a20[2] +
                                       (long)local_21d8 * local_1a20[3]) * 8)) *
                                     *(double *)
                                      (*local_19d8 +
                                      ((long)(local_21e4 - (int)local_19d8[4]) +
                                       (long)(local_21dc - *(int *)((long)local_19d8 + 0x24)) *
                                       local_19d8[1] +
                                       (long)(local_100c - (int)local_19d8[5]) * local_19d8[2] +
                                      (long)local_21d8 * local_19d8[3]) * 8) + local_2230;
                      }
                    }
                    if (local_21e0 == local_1af4) {
                      local_a3c = local_1af4 + 1;
                      local_a30 = local_1a50;
                      local_a34 = local_21e4;
                      local_a38 = local_21dc;
                      if (0 < *(int *)(*local_1a50 +
                                      ((long)(local_21e4 - (int)local_1a50[4]) +
                                       (long)(local_21dc - *(int *)((long)local_1a50 + 0x24)) *
                                       local_1a50[1] +
                                      (long)(local_a3c - (int)local_1a50[5]) * local_1a50[2]) * 4))
                      {
                        local_18ac = local_21e0 + 1;
                        local_18a0 = local_1a20;
                        local_18a4 = local_21e4;
                        local_18a8 = local_21dc;
                        local_18b0 = local_21d8;
                        local_1024 = local_21e0 + 1;
                        local_1018 = local_19d8;
                        local_101c = local_21e4;
                        local_1020 = local_21dc;
                        local_1028 = local_21d8;
                        local_2230 = -(local_1a08 *
                                      *(double *)
                                       (*local_1a20 +
                                       ((long)(local_21e4 - (int)local_1a20[4]) +
                                        (long)(local_21dc - *(int *)((long)local_1a20 + 0x24)) *
                                        local_1a20[1] +
                                        (long)(local_18ac - (int)local_1a20[5]) * local_1a20[2] +
                                       (long)local_21d8 * local_1a20[3]) * 8)) *
                                     *(double *)
                                      (*local_19d8 +
                                      ((long)(local_21e4 - (int)local_19d8[4]) +
                                       (long)(local_21dc - *(int *)((long)local_19d8 + 0x24)) *
                                       local_19d8[1] +
                                       (long)(local_1024 - (int)local_19d8[5]) * local_19d8[2] +
                                      (long)local_21d8 * local_19d8[3]) * 8) + local_2230;
                      }
                    }
                    local_18b8 = local_1a10;
                    local_18bc = local_21e4;
                    local_18c0 = local_21dc;
                    local_18c4 = local_21e0;
                    local_18c8 = local_21d8;
                    local_43c = local_21e4 - (int)local_1aa0;
                    local_438 = local_1c18;
                    local_438[local_43c] =
                         -local_19f8 *
                         *(double *)
                          (*local_1a10 +
                          ((long)(local_21e4 - (int)local_1a10[4]) +
                           (long)(local_21dc - *(int *)((long)local_1a10 + 0x24)) * local_1a10[1] +
                           (long)(local_21e0 - (int)local_1a10[5]) * local_1a10[2] +
                          (long)local_21d8 * local_1a10[3]) * 8);
                    local_44c = local_21e4 - (int)local_1aa0;
                    local_448 = local_1d18;
                    local_448[local_44c] = local_2228;
                    local_18d0 = local_1a10;
                    local_18d4 = local_21e4 + 1;
                    local_18d8 = local_21dc;
                    local_18dc = local_21e0;
                    local_18e0 = local_21d8;
                    local_45c = local_21e4 - (int)local_1aa0;
                    local_458 = local_1e18;
                    local_458[local_45c] =
                         -local_19f8 *
                         *(double *)
                          (*local_1a10 +
                          ((long)(local_18d4 - (int)local_1a10[4]) +
                           (long)(local_21dc - *(int *)((long)local_1a10 + 0x24)) * local_1a10[1] +
                           (long)(local_21e0 - (int)local_1a10[5]) * local_1a10[2] +
                          (long)local_21d8 * local_1a10[3]) * 8);
                    local_46c = local_21e4 - (int)local_1aa0;
                    local_468 = local_2018;
                    local_468[local_46c] = 0.0;
                    local_18e8 = local_19e0;
                    local_18ec = local_21e4;
                    local_18f0 = local_21dc;
                    local_18f4 = local_21e0;
                    local_18f8 = local_21d8;
                    local_47c = local_21e4 - (int)local_1aa0;
                    local_478 = local_1f18;
                    local_478[local_47c] =
                         *(double *)
                          (*local_19e0 +
                          ((long)(local_21e4 - (int)local_19e0[4]) +
                           (long)(local_21dc - *(int *)((long)local_19e0 + 0x24)) * local_19e0[1] +
                           (long)(local_21e0 - (int)local_19e0[5]) * local_19e0[2] +
                          (long)local_21d8 * local_19e0[3]) * 8) + local_2230;
                    if (local_21e4 == (int)local_1aa0) {
                      local_4ac = local_21e4 - (int)local_1aa0;
                      local_4a8 = local_1c18;
                      local_4a8[local_4ac] = 0.0;
                      local_a1c = (int)local_1ae0 + -1;
                      local_a18 = local_1a28;
                      local_a20 = local_21dc;
                      local_a24 = local_21e0;
                      if (*(int *)(*local_1a28 +
                                  ((long)(local_a1c - (int)local_1a28[4]) +
                                   (long)(local_21dc - *(int *)((long)local_1a28 + 0x24)) *
                                   local_1a28[1] +
                                  (long)(local_21e0 - (int)local_1a28[5]) * local_1a28[2]) * 4) < 1)
                      {
                        local_1900 = local_1a10;
                        local_1904 = local_21e4;
                        local_1908 = local_21dc;
                        local_190c = local_21e0;
                        local_1910 = local_21d8;
                        local_1034 = local_21e4 + -1;
                        local_1030 = local_19d8;
                        local_1038 = local_21dc;
                        local_103c = local_21e0;
                        local_1040 = local_21d8;
                        local_4bc = local_21e4 - (int)local_1aa0;
                        local_4b8 = local_1f18;
                        local_4b8[local_4bc] =
                             local_19f8 *
                             *(double *)
                              (*local_1a10 +
                              ((long)(local_21e4 - (int)local_1a10[4]) +
                               (long)(local_21dc - *(int *)((long)local_1a10 + 0x24)) *
                               local_1a10[1] +
                               (long)(local_21e0 - (int)local_1a10[5]) * local_1a10[2] +
                              (long)local_21d8 * local_1a10[3]) * 8) *
                             *(double *)
                              (*local_19d8 +
                              ((long)(local_1034 - (int)local_19d8[4]) +
                               (long)(local_21dc - *(int *)((long)local_19d8 + 0x24)) *
                               local_19d8[1] +
                               (long)(local_21e0 - (int)local_19d8[5]) * local_19d8[2] +
                              (long)local_21d8 * local_19d8[3]) * 8) + local_4b8[local_4bc];
                      }
                    }
                    if (local_21e4 == (int)local_1ac0) {
                      local_48c = local_21e4 - (int)local_1aa0;
                      local_488 = local_1e18;
                      local_488[local_48c] = 0.0;
                      local_a04 = (int)local_1afc + 1;
                      local_a00 = local_1a48;
                      local_a08 = local_21dc;
                      local_a0c = local_21e0;
                      if (*(int *)(*local_1a48 +
                                  ((long)(local_a04 - (int)local_1a48[4]) +
                                   (long)(local_21dc - *(int *)((long)local_1a48 + 0x24)) *
                                   local_1a48[1] +
                                  (long)(local_21e0 - (int)local_1a48[5]) * local_1a48[2]) * 4) < 1)
                      {
                        local_191c = local_21e4 + 1;
                        local_1918 = local_1a10;
                        local_1920 = local_21dc;
                        local_1924 = local_21e0;
                        local_1928 = local_21d8;
                        local_104c = local_21e4 + 1;
                        local_1048 = local_19d8;
                        local_1050 = local_21dc;
                        local_1054 = local_21e0;
                        local_1058 = local_21d8;
                        local_49c = local_21e4 - (int)local_1aa0;
                        local_498 = local_1f18;
                        local_498[local_49c] =
                             local_19f8 *
                             *(double *)
                              (*local_1a10 +
                              ((long)(local_191c - (int)local_1a10[4]) +
                               (long)(local_21dc - *(int *)((long)local_1a10 + 0x24)) *
                               local_1a10[1] +
                               (long)(local_21e0 - (int)local_1a10[5]) * local_1a10[2] +
                              (long)local_21d8 * local_1a10[3]) * 8) *
                             *(double *)
                              (*local_19d8 +
                              ((long)(local_104c - (int)local_19d8[4]) +
                               (long)(local_21dc - *(int *)((long)local_19d8 + 0x24)) *
                               local_19d8[1] +
                               (long)(local_21e0 - (int)local_19d8[5]) * local_19d8[2] +
                              (long)local_21d8 * local_19d8[3]) * 8) + local_498[local_49c];
                      }
                    }
                    local_2220 = in_stack_ffffffffffffc850;
                    local_2218 = in_stack_ffffffffffffc858;
                    local_2210 = in_stack_ffffffffffffc860;
                  }
                  local_140 = local_1c18;
                  local_148 = local_1d18;
                  local_150 = local_1e18;
                  local_158 = local_1f18;
                  local_160 = local_2018;
                  local_168 = local_2118;
                  local_16c = local_1b18;
                  local_3c = 0;
                  local_178 = local_1d18[0];
                  local_4c = 0;
                  local_2018[0] = local_1f18[0] / local_1d18[0];
                  local_5c = 0;
                  local_58 = local_160;
                  local_48 = local_158;
                  local_38 = local_148;
                  for (local_17c = 1; local_17c <= local_16c + -1; local_17c = local_17c + 1) {
                    local_6c = local_17c + -1;
                    local_68 = local_150;
                    local_78 = local_168;
                    local_7c = local_17c;
                    *(double *)(local_168 + (long)local_17c * 8) = local_150[local_6c] / local_178;
                    local_88 = local_148;
                    local_8c = local_17c;
                    local_98 = local_140;
                    local_9c = local_17c;
                    local_a8 = local_168;
                    local_ac = local_17c;
                    local_178 = -local_140[local_17c] * *(double *)(local_168 + (long)local_17c * 8)
                                + local_148[local_17c];
                    if ((local_178 == 0.0) && (!NAN(local_178))) {
                      local_138 = ">>>TRIDIAG FAILED";
                      Abort_host((char *)in_stack_ffffffffffffc860);
                    }
                    local_b8 = local_158;
                    local_bc = local_17c;
                    local_c8 = local_140;
                    local_cc = local_17c;
                    local_d8 = local_160;
                    local_dc = local_17c + -1;
                    local_e8 = local_160;
                    local_ec = local_17c;
                    local_160[local_17c] =
                         (-local_140[local_17c] * local_160[local_dc] + local_158[local_17c]) /
                         local_178;
                  }
                  for (local_180 = local_16c + -2; -1 < local_180; local_180 = local_180 + -1) {
                    local_f8 = local_160;
                    local_fc = local_180;
                    local_108 = local_168;
                    local_10c = local_180 + 1;
                    local_118 = local_160;
                    local_11c = local_180 + 1;
                    local_128 = local_160;
                    local_12c = local_180;
                    local_160[local_180] =
                         -*(double *)(local_168 + (long)local_10c * 8) * local_160[local_11c] +
                         local_160[local_180];
                  }
                  for (local_2234 = (int)local_1aa0; local_2234 <= (int)local_1ac0;
                      local_2234 = local_2234 + 1) {
                    local_42c = local_2234 - (int)local_1aa0;
                    local_428 = local_2018;
                    local_1060 = local_19d8;
                    local_1064 = local_2234;
                    local_1068 = local_21dc;
                    local_106c = local_21e0;
                    local_1070 = local_21d8;
                    *(double *)
                     (*local_19d8 +
                     ((long)(local_2234 - (int)local_19d8[4]) +
                      (long)(local_21dc - *(int *)((long)local_19d8 + 0x24)) * local_19d8[1] +
                      (long)(local_21e0 - (int)local_19d8[5]) * local_19d8[2] +
                     (long)local_21d8 * local_19d8[3]) * 8) = local_428[local_42c];
                  }
                }
              }
            }
          }
        }
        Gpu::range_detail::range_impl<amrex::Box>::iterator::operator++(&local_3560);
      }
    }
    else {
      local_2cd0 = local_3070;
      local_688 = local_3070;
      local_68c = 0;
      local_2cc4 = *local_3070;
      local_698 = local_3070;
      local_69c = 1;
      iStack_2cc0 = local_3070[1];
      local_34d0 = *(undefined8 *)local_3070;
      local_6a8 = local_3070;
      local_6ac = 2;
      local_34c8 = local_3070[2];
      local_2c80 = local_3070;
      local_6e8 = local_3070 + 3;
      local_6ec = 0;
      local_2c74 = *local_6e8;
      local_6f8 = local_3070 + 3;
      local_6fc = 1;
      iStack_2c70 = local_3070[4];
      local_34f0 = *(undefined8 *)local_6e8;
      local_708 = local_3070 + 3;
      local_70c = 2;
      local_34e8 = local_3070[5];
      for (local_34f4 = 0; iVar2 = local_34c8, local_34dc = local_34f0, local_34d4 = local_34e8,
          local_34c0 = local_34d0, local_34b8 = local_34c8, local_2ce0 = local_34d0,
          local_2cd8 = local_34c8, local_2cbc = local_34c8, local_2c90 = local_34f0,
          local_2c88 = local_34e8, local_2c6c = local_34e8, local_34f4 < local_2e14;
          local_34f4 = local_34f4 + 1) {
        while (local_34f8 = iVar2, iVar2 = iStack_2cc0, local_34f8 <= local_34e8) {
          while (local_34fc = iVar2, iVar2 = local_2cc4, local_34fc <= iStack_2c70) {
            while (local_3500 = iVar2, local_3500 <= local_2c74) {
              local_25e0 = local_2e40;
              local_25f0 = local_2e28;
              local_25f8 = local_2e30;
              local_2600 = local_2e38;
              local_2618 = local_3228;
              local_2620 = local_2ec0;
              local_2628 = local_2f50;
              local_2630 = local_2fe0;
              local_2638 = local_2f08;
              local_2640 = local_2f98;
              local_2648 = local_3028;
              local_2650 = local_3270;
              local_2658 = local_3300;
              local_2660 = local_3390;
              local_2668 = local_32b8;
              local_2670 = local_3348;
              local_2678 = local_33d8;
              local_2680 = local_3098;
              local_25bc = local_3500;
              local_25c0 = local_34fc;
              local_25c4 = local_34f8;
              local_25c8 = local_34f4;
              local_25d0 = local_30c0;
              local_25d8 = local_3108;
              local_25e8 = local_3150;
              local_2608 = local_3198;
              local_2610 = local_31e0;
              local_2690 = 0x3ff2666666666666;
              if ((local_3500 + local_34fc + local_34f8 + local_2d24) % 2 == 0) {
                local_25a8 = local_3098;
                local_7a8 = local_3098;
                local_7ac = 0;
                local_259c = *local_3098;
                local_7b8 = local_3098;
                local_7bc = 1;
                iStack_2598 = local_3098[1];
                local_26b0 = *(undefined8 *)local_3098;
                local_7c8 = local_3098;
                local_7cc = 2;
                local_26a8 = local_3098[2];
                local_2580 = local_3098;
                local_7d8 = local_3098 + 3;
                local_7dc = 0;
                local_2574 = *local_7d8;
                local_7e8 = local_3098 + 3;
                local_7ec = 1;
                iStack_2570 = local_3098[4];
                local_26d0 = *(undefined8 *)local_7d8;
                local_7f8 = local_3098 + 3;
                local_7fc = 2;
                local_26c8 = local_3098[5];
                if (local_3500 == local_259c) {
                  local_9ec = local_259c + -1;
                  local_9e8 = local_2ec0;
                  local_9f0 = local_34fc;
                  local_9f4 = local_34f8;
                  if (*(int *)(*local_2ec0 +
                              ((long)(local_9ec - (int)local_2ec0[4]) +
                               (long)(local_34fc - *(int *)((long)local_2ec0 + 0x24)) *
                               local_2ec0[1] +
                              (long)(local_34f8 - (int)local_2ec0[5]) * local_2ec0[2]) * 4) < 1)
                  goto LAB_0155c714;
                  local_2318 = local_3270;
                  local_2320 = local_34fc;
                  local_2324 = local_34f8;
                  local_2328 = local_34f4;
                  local_36b8 = *(double *)
                                (*local_3270 +
                                ((long)(local_259c - (int)local_3270[4]) +
                                 (long)(local_34fc - *(int *)((long)local_3270 + 0x24)) *
                                 local_3270[1] +
                                 (long)(local_34f8 - (int)local_3270[5]) * local_3270[2] +
                                (long)local_34f4 * local_3270[3]) * 8);
                  local_231c = local_259c;
                }
                else {
LAB_0155c714:
                  local_36b8 = 0.0;
                }
                local_26d8 = local_36b8;
                if (local_34fc == iStack_2598) {
                  local_9d8 = iStack_2598 + -1;
                  local_9d0 = local_2f08;
                  local_9d4 = local_3500;
                  local_9dc = local_34f8;
                  if (*(int *)(*local_2f08 +
                              ((long)(local_3500 - (int)local_2f08[4]) +
                               (long)(local_9d8 - *(int *)((long)local_2f08 + 0x24)) * local_2f08[1]
                              + (long)(local_34f8 - (int)local_2f08[5]) * local_2f08[2]) * 4) < 1)
                  goto LAB_0155c87b;
                  local_2330 = local_32b8;
                  local_2334 = local_3500;
                  local_233c = local_34f8;
                  local_2340 = local_34f4;
                  local_36c0 = *(double *)
                                (*local_32b8 +
                                ((long)(local_3500 - (int)local_32b8[4]) +
                                 (long)(iStack_2598 - *(int *)((long)local_32b8 + 0x24)) *
                                 local_32b8[1] +
                                 (long)(local_34f8 - (int)local_32b8[5]) * local_32b8[2] +
                                (long)local_34f4 * local_32b8[3]) * 8);
                  local_2338 = iStack_2598;
                }
                else {
LAB_0155c87b:
                  local_36c0 = 0.0;
                }
                local_26e0 = local_36c0;
                if (local_34f8 == local_26a8) {
                  local_9c4 = local_26a8 + -1;
                  local_9b8 = local_2f50;
                  local_9bc = local_3500;
                  local_9c0 = local_34fc;
                  if (*(int *)(*local_2f50 +
                              ((long)(local_3500 - (int)local_2f50[4]) +
                               (long)(local_34fc - *(int *)((long)local_2f50 + 0x24)) *
                               local_2f50[1] +
                              (long)(local_9c4 - (int)local_2f50[5]) * local_2f50[2]) * 4) < 1)
                  goto LAB_0155c9e2;
                  local_2348 = local_3300;
                  local_234c = local_3500;
                  local_2350 = local_34fc;
                  local_2358 = local_34f4;
                  local_36c8 = *(double *)
                                (*local_3300 +
                                ((long)(local_3500 - (int)local_3300[4]) +
                                 (long)(local_34fc - *(int *)((long)local_3300 + 0x24)) *
                                 local_3300[1] +
                                 (long)(local_26a8 - (int)local_3300[5]) * local_3300[2] +
                                (long)local_34f4 * local_3300[3]) * 8);
                  local_2354 = local_26a8;
                }
                else {
LAB_0155c9e2:
                  local_36c8 = 0.0;
                }
                local_26e8 = local_36c8;
                if (local_3500 == local_2574) {
                  local_9a4 = local_2574 + 1;
                  local_9a0 = local_2f98;
                  local_9a8 = local_34fc;
                  local_9ac = local_34f8;
                  if (*(int *)(*local_2f98 +
                              ((long)(local_9a4 - (int)local_2f98[4]) +
                               (long)(local_34fc - *(int *)((long)local_2f98 + 0x24)) *
                               local_2f98[1] +
                              (long)(local_34f8 - (int)local_2f98[5]) * local_2f98[2]) * 4) < 1)
                  goto LAB_0155cb49;
                  local_2360 = local_3348;
                  local_2368 = local_34fc;
                  local_236c = local_34f8;
                  local_2370 = local_34f4;
                  local_36d0 = *(double *)
                                (*local_3348 +
                                ((long)(local_2574 - (int)local_3348[4]) +
                                 (long)(local_34fc - *(int *)((long)local_3348 + 0x24)) *
                                 local_3348[1] +
                                 (long)(local_34f8 - (int)local_3348[5]) * local_3348[2] +
                                (long)local_34f4 * local_3348[3]) * 8);
                  local_2364 = local_2574;
                }
                else {
LAB_0155cb49:
                  local_36d0 = 0.0;
                }
                local_26f0 = local_36d0;
                if (local_34fc == iStack_2570) {
                  local_990 = iStack_2570 + 1;
                  local_988 = local_2fe0;
                  local_98c = local_3500;
                  local_994 = local_34f8;
                  if (*(int *)(*local_2fe0 +
                              ((long)(local_3500 - (int)local_2fe0[4]) +
                               (long)(local_990 - *(int *)((long)local_2fe0 + 0x24)) * local_2fe0[1]
                              + (long)(local_34f8 - (int)local_2fe0[5]) * local_2fe0[2]) * 4) < 1)
                  goto LAB_0155ccb0;
                  local_2378 = local_3390;
                  local_237c = local_3500;
                  local_2384 = local_34f8;
                  local_2388 = local_34f4;
                  local_36d8 = *(double *)
                                (*local_3390 +
                                ((long)(local_3500 - (int)local_3390[4]) +
                                 (long)(iStack_2570 - *(int *)((long)local_3390 + 0x24)) *
                                 local_3390[1] +
                                 (long)(local_34f8 - (int)local_3390[5]) * local_3390[2] +
                                (long)local_34f4 * local_3390[3]) * 8);
                  local_2380 = iStack_2570;
                }
                else {
LAB_0155ccb0:
                  local_36d8 = 0.0;
                }
                local_26f8 = local_36d8;
                if (local_34f8 == local_26c8) {
                  local_97c = local_26c8 + 1;
                  local_970 = local_3028;
                  local_974 = local_3500;
                  local_978 = local_34fc;
                  if (*(int *)(*local_3028 +
                              ((long)(local_3500 - (int)local_3028[4]) +
                               (long)(local_34fc - *(int *)((long)local_3028 + 0x24)) *
                               local_3028[1] +
                              (long)(local_97c - (int)local_3028[5]) * local_3028[2]) * 4) < 1)
                  goto LAB_0155ce17;
                  local_2390 = local_33d8;
                  local_2394 = local_3500;
                  local_2398 = local_34fc;
                  local_23a0 = local_34f4;
                  local_36e0 = *(double *)
                                (*local_33d8 +
                                ((long)(local_3500 - (int)local_33d8[4]) +
                                 (long)(local_34fc - *(int *)((long)local_33d8 + 0x24)) *
                                 local_33d8[1] +
                                 (long)(local_26c8 - (int)local_33d8[5]) * local_33d8[2] +
                                (long)local_34f4 * local_33d8[3]) * 8);
                  local_239c = local_26c8;
                }
                else {
LAB_0155ce17:
                  local_36e0 = 0.0;
                }
                local_2700 = local_36e0;
                local_628 = local_3150;
                local_62c = local_3500;
                local_630 = local_34fc;
                local_634 = local_34f8;
                local_23a8 = local_3198;
                local_23ac = local_3500;
                local_23b0 = local_34fc;
                local_23b4 = local_34f8;
                local_23b8 = local_34f4;
                local_23c4 = local_3500 + 1;
                local_23c0 = local_3198;
                local_23c8 = local_34fc;
                local_23cc = local_34f8;
                local_23d0 = local_34f4;
                local_23d8 = local_31e0;
                local_23dc = local_3500;
                local_23e0 = local_34fc;
                local_23e4 = local_34f8;
                local_23e8 = local_34f4;
                local_23f8 = local_34fc + 1;
                local_23f0 = local_31e0;
                local_23f4 = local_3500;
                local_23fc = local_34f8;
                local_2400 = local_34f4;
                local_2408 = local_3228;
                local_240c = local_3500;
                local_2410 = local_34fc;
                local_2414 = local_34f8;
                local_2418 = local_34f4;
                local_242c = local_34f8 + 1;
                local_2420 = local_3228;
                local_2424 = local_3500;
                local_2428 = local_34fc;
                local_2430 = local_34f4;
                local_2708 = local_2e38 *
                             (*(double *)
                               (*local_3228 +
                               ((long)(local_3500 - (int)local_3228[4]) +
                                (long)(local_34fc - *(int *)((long)local_3228 + 0x24)) *
                                local_3228[1] +
                                (long)(local_34f8 - (int)local_3228[5]) * local_3228[2] +
                               (long)local_34f4 * local_3228[3]) * 8) +
                             *(double *)
                              (*local_3228 +
                              ((long)(local_3500 - (int)local_3228[4]) +
                               (long)(local_34fc - *(int *)((long)local_3228 + 0x24)) *
                               local_3228[1] +
                               (long)(local_242c - (int)local_3228[5]) * local_3228[2] +
                              (long)local_34f4 * local_3228[3]) * 8)) +
                             local_2e30 *
                             (*(double *)
                               (*local_31e0 +
                               ((long)(local_3500 - (int)local_31e0[4]) +
                                (long)(local_34fc - *(int *)((long)local_31e0 + 0x24)) *
                                local_31e0[1] +
                                (long)(local_34f8 - (int)local_31e0[5]) * local_31e0[2] +
                               (long)local_34f4 * local_31e0[3]) * 8) +
                             *(double *)
                              (*local_31e0 +
                              ((long)(local_3500 - (int)local_31e0[4]) +
                               (long)(local_23f8 - *(int *)((long)local_31e0 + 0x24)) *
                               local_31e0[1] +
                               (long)(local_34f8 - (int)local_31e0[5]) * local_31e0[2] +
                              (long)local_34f4 * local_31e0[3]) * 8)) +
                             local_2e40 *
                             *(double *)
                              (*local_3150 +
                              ((long)(local_3500 - (int)local_3150[4]) +
                               (long)(local_34fc - *(int *)((long)local_3150 + 0x24)) *
                               local_3150[1] +
                              (long)(local_34f8 - (int)local_3150[5]) * local_3150[2]) * 8) +
                             local_2e28 *
                             (*(double *)
                               (*local_3198 +
                               ((long)(local_3500 - (int)local_3198[4]) +
                                (long)(local_34fc - *(int *)((long)local_3198 + 0x24)) *
                                local_3198[1] +
                                (long)(local_34f8 - (int)local_3198[5]) * local_3198[2] +
                               (long)local_34f4 * local_3198[3]) * 8) +
                             *(double *)
                              (*local_3198 +
                              ((long)(local_23c4 - (int)local_3198[4]) +
                               (long)(local_34fc - *(int *)((long)local_3198 + 0x24)) *
                               local_3198[1] +
                               (long)(local_34f8 - (int)local_3198[5]) * local_3198[2] +
                              (long)local_34f4 * local_3198[3]) * 8));
                local_2438 = local_3198;
                local_243c = local_3500;
                local_2440 = local_34fc;
                local_2444 = local_34f8;
                local_2448 = local_34f4;
                local_2454 = local_3500 + 1;
                local_2450 = local_3198;
                local_2458 = local_34fc;
                local_245c = local_34f8;
                local_2460 = local_34f4;
                local_2468 = local_31e0;
                local_246c = local_3500;
                local_2470 = local_34fc;
                local_2474 = local_34f8;
                local_2478 = local_34f4;
                local_2488 = local_34fc + 1;
                local_2480 = local_31e0;
                local_2484 = local_3500;
                local_248c = local_34f8;
                local_2490 = local_34f4;
                local_2498 = local_3228;
                local_249c = local_3500;
                local_24a0 = local_34fc;
                local_24a4 = local_34f8;
                local_24a8 = local_34f4;
                local_24bc = local_34f8 + 1;
                local_24b0 = local_3228;
                local_24b4 = local_3500;
                local_24b8 = local_34fc;
                local_24c0 = local_34f4;
                local_2710 = local_2708 -
                             (local_2e38 *
                              (*(double *)
                                (*local_3228 +
                                ((long)(local_3500 - (int)local_3228[4]) +
                                 (long)(local_34fc - *(int *)((long)local_3228 + 0x24)) *
                                 local_3228[1] +
                                 (long)(local_34f8 - (int)local_3228[5]) * local_3228[2] +
                                (long)local_34f4 * local_3228[3]) * 8) * local_36c8 +
                              *(double *)
                               (*local_3228 +
                               ((long)(local_3500 - (int)local_3228[4]) +
                                (long)(local_34fc - *(int *)((long)local_3228 + 0x24)) *
                                local_3228[1] +
                                (long)(local_24bc - (int)local_3228[5]) * local_3228[2] +
                               (long)local_34f4 * local_3228[3]) * 8) * local_36e0) +
                             local_2e28 *
                             (*(double *)
                               (*local_3198 +
                               ((long)(local_3500 - (int)local_3198[4]) +
                                (long)(local_34fc - *(int *)((long)local_3198 + 0x24)) *
                                local_3198[1] +
                                (long)(local_34f8 - (int)local_3198[5]) * local_3198[2] +
                               (long)local_34f4 * local_3198[3]) * 8) * local_36b8 +
                             *(double *)
                              (*local_3198 +
                              ((long)(local_2454 - (int)local_3198[4]) +
                               (long)(local_34fc - *(int *)((long)local_3198 + 0x24)) *
                               local_3198[1] +
                               (long)(local_34f8 - (int)local_3198[5]) * local_3198[2] +
                              (long)local_34f4 * local_3198[3]) * 8) * local_36d0) +
                             local_2e30 *
                             (*(double *)
                               (*local_31e0 +
                               ((long)(local_3500 - (int)local_31e0[4]) +
                                (long)(local_34fc - *(int *)((long)local_31e0 + 0x24)) *
                                local_31e0[1] +
                                (long)(local_34f8 - (int)local_31e0[5]) * local_31e0[2] +
                               (long)local_34f4 * local_31e0[3]) * 8) * local_36c0 +
                             *(double *)
                              (*local_31e0 +
                              ((long)(local_3500 - (int)local_31e0[4]) +
                               (long)(local_2488 - *(int *)((long)local_31e0 + 0x24)) *
                               local_31e0[1] +
                               (long)(local_34f8 - (int)local_31e0[5]) * local_31e0[2] +
                              (long)local_34f4 * local_31e0[3]) * 8) * local_36d8));
                local_24c8 = local_3198;
                local_24cc = local_3500;
                local_24d0 = local_34fc;
                local_24d4 = local_34f8;
                local_24d8 = local_34f4;
                local_2244 = local_3500 + -1;
                local_2240 = local_30c0;
                local_2248 = local_34fc;
                local_224c = local_34f8;
                local_2250 = local_34f4;
                local_24e4 = local_3500 + 1;
                local_24e0 = local_3198;
                local_24e8 = local_34fc;
                local_24ec = local_34f8;
                local_24f0 = local_34f4;
                local_225c = local_3500 + 1;
                local_2258 = local_30c0;
                local_2260 = local_34fc;
                local_2264 = local_34f8;
                local_2268 = local_34f4;
                local_24f8 = local_31e0;
                local_24fc = local_3500;
                local_2500 = local_34fc;
                local_2504 = local_34f8;
                local_2508 = local_34f4;
                local_2278 = local_34fc + -1;
                local_2270 = local_30c0;
                local_2274 = local_3500;
                local_227c = local_34f8;
                local_2280 = local_34f4;
                local_2518 = local_34fc + 1;
                local_2510 = local_31e0;
                local_2514 = local_3500;
                local_251c = local_34f8;
                local_2520 = local_34f4;
                local_2290 = local_34fc + 1;
                local_2288 = local_30c0;
                local_228c = local_3500;
                local_2294 = local_34f8;
                local_2298 = local_34f4;
                local_2528 = local_3228;
                local_252c = local_3500;
                local_2530 = local_34fc;
                local_2534 = local_34f8;
                local_2538 = local_34f4;
                local_22ac = local_34f8 + -1;
                local_22a0 = local_30c0;
                local_22a4 = local_3500;
                local_22a8 = local_34fc;
                local_22b0 = local_34f4;
                local_254c = local_34f8 + 1;
                local_2540 = local_3228;
                local_2544 = local_3500;
                local_2548 = local_34fc;
                local_2550 = local_34f4;
                local_22c4 = local_34f8 + 1;
                local_22b8 = local_30c0;
                local_22bc = local_3500;
                local_22c0 = local_34fc;
                local_22c8 = local_34f4;
                local_2718 = local_2e38 *
                             (*(double *)
                               (*local_3228 +
                               ((long)(local_3500 - (int)local_3228[4]) +
                                (long)(local_34fc - *(int *)((long)local_3228 + 0x24)) *
                                local_3228[1] +
                                (long)(local_34f8 - (int)local_3228[5]) * local_3228[2] +
                               (long)local_34f4 * local_3228[3]) * 8) *
                              *(double *)
                               (*local_30c0 +
                               ((long)(local_3500 - (int)local_30c0[4]) +
                                (long)(local_34fc - *(int *)((long)local_30c0 + 0x24)) *
                                local_30c0[1] +
                                (long)(local_22ac - (int)local_30c0[5]) * local_30c0[2] +
                               (long)local_34f4 * local_30c0[3]) * 8) +
                             *(double *)
                              (*local_3228 +
                              ((long)(local_3500 - (int)local_3228[4]) +
                               (long)(local_34fc - *(int *)((long)local_3228 + 0x24)) *
                               local_3228[1] +
                               (long)(local_254c - (int)local_3228[5]) * local_3228[2] +
                              (long)local_34f4 * local_3228[3]) * 8) *
                             *(double *)
                              (*local_30c0 +
                              ((long)(local_3500 - (int)local_30c0[4]) +
                               (long)(local_34fc - *(int *)((long)local_30c0 + 0x24)) *
                               local_30c0[1] +
                               (long)(local_22c4 - (int)local_30c0[5]) * local_30c0[2] +
                              (long)local_34f4 * local_30c0[3]) * 8)) +
                             local_2e28 *
                             (*(double *)
                               (*local_3198 +
                               ((long)(local_3500 - (int)local_3198[4]) +
                                (long)(local_34fc - *(int *)((long)local_3198 + 0x24)) *
                                local_3198[1] +
                                (long)(local_34f8 - (int)local_3198[5]) * local_3198[2] +
                               (long)local_34f4 * local_3198[3]) * 8) *
                              *(double *)
                               (*local_30c0 +
                               ((long)(local_2244 - (int)local_30c0[4]) +
                                (long)(local_34fc - *(int *)((long)local_30c0 + 0x24)) *
                                local_30c0[1] +
                                (long)(local_34f8 - (int)local_30c0[5]) * local_30c0[2] +
                               (long)local_34f4 * local_30c0[3]) * 8) +
                             *(double *)
                              (*local_3198 +
                              ((long)(local_24e4 - (int)local_3198[4]) +
                               (long)(local_34fc - *(int *)((long)local_3198 + 0x24)) *
                               local_3198[1] +
                               (long)(local_34f8 - (int)local_3198[5]) * local_3198[2] +
                              (long)local_34f4 * local_3198[3]) * 8) *
                             *(double *)
                              (*local_30c0 +
                              ((long)(local_225c - (int)local_30c0[4]) +
                               (long)(local_34fc - *(int *)((long)local_30c0 + 0x24)) *
                               local_30c0[1] +
                               (long)(local_34f8 - (int)local_30c0[5]) * local_30c0[2] +
                              (long)local_34f4 * local_30c0[3]) * 8)) +
                             local_2e30 *
                             (*(double *)
                               (*local_31e0 +
                               ((long)(local_3500 - (int)local_31e0[4]) +
                                (long)(local_34fc - *(int *)((long)local_31e0 + 0x24)) *
                                local_31e0[1] +
                                (long)(local_34f8 - (int)local_31e0[5]) * local_31e0[2] +
                               (long)local_34f4 * local_31e0[3]) * 8) *
                              *(double *)
                               (*local_30c0 +
                               ((long)(local_3500 - (int)local_30c0[4]) +
                                (long)(local_2278 - *(int *)((long)local_30c0 + 0x24)) *
                                local_30c0[1] +
                                (long)(local_34f8 - (int)local_30c0[5]) * local_30c0[2] +
                               (long)local_34f4 * local_30c0[3]) * 8) +
                             *(double *)
                              (*local_31e0 +
                              ((long)(local_3500 - (int)local_31e0[4]) +
                               (long)(local_2518 - *(int *)((long)local_31e0 + 0x24)) *
                               local_31e0[1] +
                               (long)(local_34f8 - (int)local_31e0[5]) * local_31e0[2] +
                              (long)local_34f4 * local_31e0[3]) * 8) *
                             *(double *)
                              (*local_30c0 +
                              ((long)(local_3500 - (int)local_30c0[4]) +
                               (long)(local_2290 - *(int *)((long)local_30c0 + 0x24)) *
                               local_30c0[1] +
                               (long)(local_34f8 - (int)local_30c0[5]) * local_30c0[2] +
                              (long)local_34f4 * local_30c0[3]) * 8));
                local_2558 = local_3108;
                local_255c = local_3500;
                local_2560 = local_34fc;
                local_2564 = local_34f8;
                local_2568 = local_34f4;
                local_22d0 = local_30c0;
                local_22d4 = local_3500;
                local_22d8 = local_34fc;
                local_22dc = local_34f8;
                local_22e0 = local_34f4;
                local_2720 = *(double *)
                              (*local_3108 +
                              ((long)(local_3500 - (int)local_3108[4]) +
                               (long)(local_34fc - *(int *)((long)local_3108 + 0x24)) *
                               local_3108[1] +
                               (long)(local_34f8 - (int)local_3108[5]) * local_3108[2] +
                              (long)local_34f4 * local_3108[3]) * 8) -
                             (local_2708 *
                              *(double *)
                               (*local_30c0 +
                               ((long)(local_3500 - (int)local_30c0[4]) +
                                (long)(local_34fc - *(int *)((long)local_30c0 + 0x24)) *
                                local_30c0[1] +
                                (long)(local_34f8 - (int)local_30c0[5]) * local_30c0[2] +
                               (long)local_34f4 * local_30c0[3]) * 8) + -local_2718);
                local_22e8 = local_30c0;
                local_22ec = local_3500;
                local_22f0 = local_34fc;
                local_22f4 = local_34f8;
                local_22f8 = local_34f4;
                local_2300 = local_30c0;
                local_2304 = local_3500;
                local_2308 = local_34fc;
                local_230c = local_34f8;
                local_2310 = local_34f4;
                *(double *)
                 (*local_30c0 +
                 ((long)(local_3500 - (int)local_30c0[4]) +
                  (long)(local_34fc - *(int *)((long)local_30c0 + 0x24)) * local_30c0[1] +
                  (long)(local_34f8 - (int)local_30c0[5]) * local_30c0[2] +
                 (long)local_34f4 * local_30c0[3]) * 8) =
                     (1.15 / local_2710) * local_2720 +
                     *(double *)
                      (*local_30c0 +
                      ((long)(local_3500 - (int)local_30c0[4]) +
                       (long)(local_34fc - *(int *)((long)local_30c0 + 0x24)) * local_30c0[1] +
                       (long)(local_34f8 - (int)local_30c0[5]) * local_30c0[2] +
                      (long)local_34f4 * local_30c0[3]) * 8);
                local_26bc = local_26d0;
                local_26b4 = local_26c8;
                local_26a0 = local_26b0;
                local_2698 = local_26a8;
                local_25b8 = local_26b0;
                local_25b0 = local_26a8;
                local_2594 = local_26a8;
                local_2590 = local_26d0;
                local_2588 = local_26c8;
                local_256c = local_26c8;
              }
              iVar2 = local_3500 + 1;
            }
            iVar2 = local_34fc + 1;
          }
          iVar2 = local_34f8 + 1;
        }
      }
    }
    MFIter::operator++(&local_2eb8);
  } while( true );
}

Assistant:

void
MLABecLaplacian::Fsmooth (int amrlev, int mglev, MultiFab& sol, const MultiFab& rhs, int redblack) const
{
    BL_PROFILE("MLABecLaplacian::Fsmooth()");

    bool regular_coarsening = true;
    if (amrlev == 0 && mglev > 0) {
        regular_coarsening = mg_coarsen_ratio_vec[mglev-1] == mg_coarsen_ratio;
    }

    const MultiFab& acoef = m_a_coeffs[amrlev][mglev];
    AMREX_ALWAYS_ASSERT(acoef.nGrowVect() == 0);
    AMREX_D_TERM(const MultiFab& bxcoef = m_b_coeffs[amrlev][mglev][0];,
                 const MultiFab& bycoef = m_b_coeffs[amrlev][mglev][1];,
                 const MultiFab& bzcoef = m_b_coeffs[amrlev][mglev][2];);
    const auto& undrrelxr = m_undrrelxr[amrlev][mglev];
    const auto& maskvals  = m_maskvals [amrlev][mglev];

    OrientationIter oitr;

    const FabSet& f0 = undrrelxr[oitr()]; ++oitr;
    const FabSet& f1 = undrrelxr[oitr()]; ++oitr;
#if (AMREX_SPACEDIM > 1)
    const FabSet& f2 = undrrelxr[oitr()]; ++oitr;
    const FabSet& f3 = undrrelxr[oitr()]; ++oitr;
#if (AMREX_SPACEDIM > 2)
    const FabSet& f4 = undrrelxr[oitr()]; ++oitr;
    const FabSet& f5 = undrrelxr[oitr()]; ++oitr;
#endif
#endif

    const MultiMask& mm0 = maskvals[0];
    const MultiMask& mm1 = maskvals[1];
#if (AMREX_SPACEDIM > 1)
    const MultiMask& mm2 = maskvals[2];
    const MultiMask& mm3 = maskvals[3];
#if (AMREX_SPACEDIM > 2)
    const MultiMask& mm4 = maskvals[4];
    const MultiMask& mm5 = maskvals[5];
#endif
#endif

    const int nc = getNComp();
    const Real* h = m_geom[amrlev][mglev].CellSize();
    AMREX_D_TERM(const Real dhx = m_b_scalar/(h[0]*h[0]);,
                 const Real dhy = m_b_scalar/(h[1]*h[1]);,
                 const Real dhz = m_b_scalar/(h[2]*h[2]));
    const Real alpha = m_a_scalar;

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion() && sol.isFusingCandidate()
        && (m_overset_mask[amrlev][mglev] || regular_coarsening))
    {
        const auto& m0ma = mm0.const_arrays();
        const auto& m1ma = mm1.const_arrays();
#if (AMREX_SPACEDIM > 1)
        const auto& m2ma = mm2.const_arrays();
        const auto& m3ma = mm3.const_arrays();
#if (AMREX_SPACEDIM > 2)
        const auto& m4ma = mm4.const_arrays();
        const auto& m5ma = mm5.const_arrays();
#endif
#endif

        const auto& solnma = sol.arrays();
        const auto& rhsma = rhs.const_arrays();
        const auto& ama = acoef.const_arrays();

        AMREX_D_TERM(const auto& bxma = bxcoef.const_arrays();,
                     const auto& byma = bycoef.const_arrays();,
                     const auto& bzma = bzcoef.const_arrays(););

        const auto& f0ma = f0.const_arrays();
        const auto& f1ma = f1.const_arrays();
#if (AMREX_SPACEDIM > 1)
        const auto& f2ma = f2.const_arrays();
        const auto& f3ma = f3.const_arrays();
#if (AMREX_SPACEDIM > 2)
        const auto& f4ma = f4.const_arrays();
        const auto& f5ma = f5.const_arrays();
#endif
#endif

        if (m_overset_mask[amrlev][mglev]) {
            const auto& osmma = m_overset_mask[amrlev][mglev]->const_arrays();
            ParallelFor(sol, IntVect(0), nc,
            [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
            {
                Box vbx(ama[box_no]);
                abec_gsrb_os(i,j,k,n, solnma[box_no], rhsma[box_no], alpha, ama[box_no],
                             AMREX_D_DECL(dhx, dhy, dhz),
                             AMREX_D_DECL(bxma[box_no],byma[box_no],bzma[box_no]),
                             AMREX_D_DECL(m0ma[box_no],m2ma[box_no],m4ma[box_no]),
                             AMREX_D_DECL(m1ma[box_no],m3ma[box_no],m5ma[box_no]),
                             AMREX_D_DECL(f0ma[box_no],f2ma[box_no],f4ma[box_no]),
                             AMREX_D_DECL(f1ma[box_no],f3ma[box_no],f5ma[box_no]),
                             osmma[box_no], vbx, redblack);
            });
        } else if (regular_coarsening) {
            ParallelFor(sol, IntVect(0), nc,
            [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
            {
                Box vbx(ama[box_no]);
                abec_gsrb(i,j,k,n, solnma[box_no], rhsma[box_no], alpha, ama[box_no],
                          AMREX_D_DECL(dhx, dhy, dhz),
                          AMREX_D_DECL(bxma[box_no],byma[box_no],bzma[box_no]),
                          AMREX_D_DECL(m0ma[box_no],m2ma[box_no],m4ma[box_no]),
                          AMREX_D_DECL(m1ma[box_no],m3ma[box_no],m5ma[box_no]),
                          AMREX_D_DECL(f0ma[box_no],f2ma[box_no],f4ma[box_no]),
                          AMREX_D_DECL(f1ma[box_no],f3ma[box_no],f5ma[box_no]),
                          vbx, redblack);
            });
        }
        Gpu::streamSynchronize();
    } else
#endif
    {
        MFItInfo mfi_info;
        if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(sol,mfi_info); mfi.isValid(); ++mfi)
        {
            const auto& m0 = mm0.array(mfi);
            const auto& m1 = mm1.array(mfi);
#if (AMREX_SPACEDIM > 1)
            const auto& m2 = mm2.array(mfi);
            const auto& m3 = mm3.array(mfi);
#if (AMREX_SPACEDIM > 2)
            const auto& m4 = mm4.array(mfi);
            const auto& m5 = mm5.array(mfi);
#endif
#endif

            const Box& tbx = mfi.tilebox();
            const Box& vbx = mfi.validbox();
            const auto& solnfab = sol.array(mfi);
            const auto& rhsfab  = rhs.const_array(mfi);
            const auto& afab    = acoef.const_array(mfi);

            AMREX_D_TERM(const auto& bxfab = bxcoef.const_array(mfi);,
                         const auto& byfab = bycoef.const_array(mfi);,
                         const auto& bzfab = bzcoef.const_array(mfi););

            const auto& f0fab = f0.const_array(mfi);
            const auto& f1fab = f1.const_array(mfi);
#if (AMREX_SPACEDIM > 1)
            const auto& f2fab = f2.const_array(mfi);
            const auto& f3fab = f3.const_array(mfi);
#if (AMREX_SPACEDIM > 2)
            const auto& f4fab = f4.const_array(mfi);
            const auto& f5fab = f5.const_array(mfi);
#endif
#endif

            if (m_overset_mask[amrlev][mglev]) {
                const auto& osm = m_overset_mask[amrlev][mglev]->const_array(mfi);
                AMREX_HOST_DEVICE_PARALLEL_FOR_4D(tbx, nc, i, j, k, n,
                {
                    abec_gsrb_os(i,j,k,n, solnfab, rhsfab, alpha, afab,
                                 AMREX_D_DECL(dhx, dhy, dhz),
                                 AMREX_D_DECL(bxfab, byfab, bzfab),
                                 AMREX_D_DECL(m0,m2,m4),
                                 AMREX_D_DECL(m1,m3,m5),
                                 AMREX_D_DECL(f0fab,f2fab,f4fab),
                                 AMREX_D_DECL(f1fab,f3fab,f5fab),
                                 osm, vbx, redblack);
                });
            } else if (regular_coarsening) {
                AMREX_HOST_DEVICE_PARALLEL_FOR_4D(tbx, nc, i, j, k, n,
                {
                    abec_gsrb(i,j,k,n, solnfab, rhsfab, alpha, afab,
                              AMREX_D_DECL(dhx, dhy, dhz),
                              AMREX_D_DECL(bxfab, byfab, bzfab),
                              AMREX_D_DECL(m0,m2,m4),
                              AMREX_D_DECL(m1,m3,m5),
                              AMREX_D_DECL(f0fab,f2fab,f4fab),
                              AMREX_D_DECL(f1fab,f3fab,f5fab),
                              vbx, redblack);
                });
            } else {
                Gpu::LaunchSafeGuard lsg(false); // xxxxx gpu todo
                // line solve does not with with GPU
                AMREX_LAUNCH_HOST_DEVICE_LAMBDA ( tbx, thread_box,
                {
                    abec_gsrb_with_line_solve(thread_box, solnfab, rhsfab, alpha, afab,
                                              AMREX_D_DECL(dhx, dhy, dhz),
                                              AMREX_D_DECL(bxfab, byfab, bzfab),
                                              AMREX_D_DECL(m0,m2,m4),
                                              AMREX_D_DECL(m1,m3,m5),
                                              AMREX_D_DECL(f0fab,f2fab,f4fab),
                                              AMREX_D_DECL(f1fab,f3fab,f5fab),
                                              vbx, redblack, nc);
                });
            }
        }
    }
}